

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx::CurveNvIntersectorK<4,8>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [28];
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  uint uVar9;
  Primitive PVar10;
  uint uVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [28];
  undefined1 auVar102 [28];
  undefined1 auVar103 [28];
  undefined1 auVar104 [28];
  ulong uVar105;
  RTCIntersectArguments *pRVar106;
  RTCIntersectArguments *pRVar107;
  ulong uVar108;
  long lVar109;
  uint uVar110;
  ulong uVar111;
  ulong uVar112;
  undefined4 uVar113;
  long lVar114;
  long lVar115;
  float fVar116;
  float fVar117;
  float fVar131;
  float fVar134;
  vint4 bi_1;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar132;
  float fVar135;
  float fVar137;
  float fVar138;
  float fVar140;
  float fVar141;
  float fVar143;
  float fVar144;
  float fVar146;
  float fVar148;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar133;
  float fVar136;
  float fVar139;
  float fVar142;
  float fVar145;
  float fVar147;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar149;
  float fVar164;
  vint4 bi_2;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar170;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar165;
  float fVar166;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar163 [64];
  vint4 ai;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar185;
  float fVar199;
  float fVar201;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar186;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar203;
  undefined1 auVar190 [16];
  float fVar200;
  float fVar202;
  float fVar204;
  float fVar206;
  float fVar207;
  float fVar208;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar205;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [64];
  float fVar209;
  float fVar221;
  float fVar222;
  vint4 bi;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar223;
  float fVar224;
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar225;
  float fVar234;
  float fVar235;
  vint4 ai_2;
  float fVar236;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar237;
  float fVar245;
  float fVar246;
  vint4 ai_1;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar247;
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar248;
  undefined1 auVar244 [32];
  float fVar249;
  float fVar256;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar253 [32];
  float fVar260;
  undefined1 auVar254 [32];
  undefined1 auVar255 [64];
  float fVar261;
  float fVar262;
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar263 [16];
  float fVar273;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  undefined1 auVar266 [32];
  float fVar272;
  undefined1 auVar267 [32];
  undefined1 auVar268 [64];
  float fVar278;
  float fVar286;
  float fVar287;
  undefined1 auVar279 [16];
  float fVar288;
  float fVar289;
  float fVar290;
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  float fVar293;
  float fVar294;
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  float fVar297;
  float fVar298;
  float fVar299;
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  float fVar308;
  float fVar309;
  undefined1 auVar300 [16];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  float fVar310;
  float fVar315;
  float fVar316;
  undefined1 auVar311 [16];
  float fVar317;
  float fVar319;
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  float fVar318;
  undefined1 auVar314 [64];
  float fVar320;
  float fVar322;
  float fVar323;
  float fVar324;
  undefined1 auVar321 [32];
  float fVar325;
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  float fVar329;
  float fVar330;
  float fVar331;
  undefined1 auVar328 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  float local_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined4 local_900;
  undefined4 uStack_8fc;
  ulong local_8a0;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [8];
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined1 (*local_750) [16];
  undefined1 (*local_748) [16];
  undefined1 (*local_740) [32];
  Precalculations *local_738;
  RTCFilterFunctionNArguments local_730;
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  undefined8 uStack_698;
  undefined1 local_690 [8];
  undefined8 uStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined1 auStack_670 [8];
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  long local_5d0;
  ulong local_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [8];
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_450 [16];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  uint local_3e0;
  uint local_3dc;
  float local_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined1 local_380 [32];
  float local_360 [4];
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [32];
  RTCHitN local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar154 [24];
  undefined1 auVar285 [64];
  undefined1 auVar307 [64];
  
  PVar10 = prim[1];
  uVar105 = (ulong)(byte)PVar10;
  fVar261 = *(float *)(prim + uVar105 * 0x19 + 0x12);
  auVar191 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar191 = vinsertps_avx(auVar191,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar174 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar174 = vinsertps_avx(auVar174,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar191 = vsubps_avx(auVar191,*(undefined1 (*) [16])(prim + uVar105 * 0x19 + 6));
  auVar150._0_4_ = fVar261 * auVar191._0_4_;
  auVar150._4_4_ = fVar261 * auVar191._4_4_;
  auVar150._8_4_ = fVar261 * auVar191._8_4_;
  auVar150._12_4_ = fVar261 * auVar191._12_4_;
  auVar250._0_4_ = fVar261 * auVar174._0_4_;
  auVar250._4_4_ = fVar261 * auVar174._4_4_;
  auVar250._8_4_ = fVar261 * auVar174._8_4_;
  auVar250._12_4_ = fVar261 * auVar174._12_4_;
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 4 + 6)));
  auVar191 = vcvtdq2ps_avx(auVar191);
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 5 + 6)));
  auVar174 = vcvtdq2ps_avx(auVar174);
  auVar192 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 6 + 6)));
  auVar192 = vcvtdq2ps_avx(auVar192);
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0xb + 6)));
  auVar177 = vcvtdq2ps_avx(auVar177);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0xc + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar265 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0xd + 6)));
  auVar265 = vcvtdq2ps_avx(auVar265);
  auVar119 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x12 + 6)));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar120 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x13 + 6)));
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar152 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x14 + 6)));
  auVar152 = vcvtdq2ps_avx(auVar152);
  auVar118 = vshufps_avx(auVar250,auVar250,0);
  auVar151 = vshufps_avx(auVar250,auVar250,0x55);
  auVar171 = vshufps_avx(auVar250,auVar250,0xaa);
  fVar261 = auVar171._0_4_;
  fVar225 = auVar171._4_4_;
  fVar185 = auVar171._8_4_;
  fVar269 = auVar171._12_4_;
  fVar201 = auVar151._0_4_;
  fVar273 = auVar151._4_4_;
  fVar236 = auVar151._8_4_;
  fVar203 = auVar151._12_4_;
  fVar234 = auVar118._0_4_;
  fVar199 = auVar118._4_4_;
  fVar271 = auVar118._8_4_;
  fVar235 = auVar118._12_4_;
  auVar300._0_4_ = fVar234 * auVar191._0_4_ + fVar201 * auVar174._0_4_ + fVar261 * auVar192._0_4_;
  auVar300._4_4_ = fVar199 * auVar191._4_4_ + fVar273 * auVar174._4_4_ + fVar225 * auVar192._4_4_;
  auVar300._8_4_ = fVar271 * auVar191._8_4_ + fVar236 * auVar174._8_4_ + fVar185 * auVar192._8_4_;
  auVar300._12_4_ =
       fVar235 * auVar191._12_4_ + fVar203 * auVar174._12_4_ + fVar269 * auVar192._12_4_;
  auVar307 = ZEXT1664(auVar300);
  auVar311._0_4_ = fVar234 * auVar177._0_4_ + fVar201 * auVar15._0_4_ + auVar265._0_4_ * fVar261;
  auVar311._4_4_ = fVar199 * auVar177._4_4_ + fVar273 * auVar15._4_4_ + auVar265._4_4_ * fVar225;
  auVar311._8_4_ = fVar271 * auVar177._8_4_ + fVar236 * auVar15._8_4_ + auVar265._8_4_ * fVar185;
  auVar311._12_4_ = fVar235 * auVar177._12_4_ + fVar203 * auVar15._12_4_ + auVar265._12_4_ * fVar269
  ;
  auVar251._0_4_ = fVar234 * auVar119._0_4_ + fVar201 * auVar120._0_4_ + auVar152._0_4_ * fVar261;
  auVar251._4_4_ = fVar199 * auVar119._4_4_ + fVar273 * auVar120._4_4_ + auVar152._4_4_ * fVar225;
  auVar251._8_4_ = fVar271 * auVar119._8_4_ + fVar236 * auVar120._8_4_ + auVar152._8_4_ * fVar185;
  auVar251._12_4_ =
       fVar235 * auVar119._12_4_ + fVar203 * auVar120._12_4_ + auVar152._12_4_ * fVar269;
  auVar118 = vshufps_avx(auVar150,auVar150,0);
  auVar151 = vshufps_avx(auVar150,auVar150,0x55);
  auVar171 = vshufps_avx(auVar150,auVar150,0xaa);
  fVar261 = auVar171._0_4_;
  fVar225 = auVar171._4_4_;
  fVar185 = auVar171._8_4_;
  fVar269 = auVar171._12_4_;
  fVar201 = auVar151._0_4_;
  fVar273 = auVar151._4_4_;
  fVar236 = auVar151._8_4_;
  fVar203 = auVar151._12_4_;
  fVar234 = auVar118._0_4_;
  fVar199 = auVar118._4_4_;
  fVar271 = auVar118._8_4_;
  fVar235 = auVar118._12_4_;
  auVar238._0_4_ = fVar234 * auVar191._0_4_ + fVar201 * auVar174._0_4_ + fVar261 * auVar192._0_4_;
  auVar238._4_4_ = fVar199 * auVar191._4_4_ + fVar273 * auVar174._4_4_ + fVar225 * auVar192._4_4_;
  auVar238._8_4_ = fVar271 * auVar191._8_4_ + fVar236 * auVar174._8_4_ + fVar185 * auVar192._8_4_;
  auVar238._12_4_ =
       fVar235 * auVar191._12_4_ + fVar203 * auVar174._12_4_ + fVar269 * auVar192._12_4_;
  auVar118._0_4_ = fVar234 * auVar177._0_4_ + auVar265._0_4_ * fVar261 + fVar201 * auVar15._0_4_;
  auVar118._4_4_ = fVar199 * auVar177._4_4_ + auVar265._4_4_ * fVar225 + fVar273 * auVar15._4_4_;
  auVar118._8_4_ = fVar271 * auVar177._8_4_ + auVar265._8_4_ * fVar185 + fVar236 * auVar15._8_4_;
  auVar118._12_4_ = fVar235 * auVar177._12_4_ + auVar265._12_4_ * fVar269 + fVar203 * auVar15._12_4_
  ;
  auVar263._8_4_ = 0x7fffffff;
  auVar263._0_8_ = 0x7fffffff7fffffff;
  auVar263._12_4_ = 0x7fffffff;
  auVar191 = vandps_avx(auVar300,auVar263);
  auVar210._8_4_ = 0x219392ef;
  auVar210._0_8_ = 0x219392ef219392ef;
  auVar210._12_4_ = 0x219392ef;
  auVar191 = vcmpps_avx(auVar191,auVar210,1);
  auVar174 = vblendvps_avx(auVar300,auVar210,auVar191);
  auVar191 = vandps_avx(auVar311,auVar263);
  auVar191 = vcmpps_avx(auVar191,auVar210,1);
  auVar192 = vblendvps_avx(auVar311,auVar210,auVar191);
  auVar191 = vandps_avx(auVar263,auVar251);
  auVar191 = vcmpps_avx(auVar191,auVar210,1);
  auVar191 = vblendvps_avx(auVar251,auVar210,auVar191);
  auVar151._0_4_ = fVar234 * auVar119._0_4_ + fVar201 * auVar120._0_4_ + auVar152._0_4_ * fVar261;
  auVar151._4_4_ = fVar199 * auVar119._4_4_ + fVar273 * auVar120._4_4_ + auVar152._4_4_ * fVar225;
  auVar151._8_4_ = fVar271 * auVar119._8_4_ + fVar236 * auVar120._8_4_ + auVar152._8_4_ * fVar185;
  auVar151._12_4_ =
       fVar235 * auVar119._12_4_ + fVar203 * auVar120._12_4_ + auVar152._12_4_ * fVar269;
  auVar177 = vrcpps_avx(auVar174);
  fVar261 = auVar177._0_4_;
  auVar187._0_4_ = fVar261 * auVar174._0_4_;
  fVar269 = auVar177._4_4_;
  auVar187._4_4_ = fVar269 * auVar174._4_4_;
  fVar271 = auVar177._8_4_;
  auVar187._8_4_ = fVar271 * auVar174._8_4_;
  fVar273 = auVar177._12_4_;
  auVar187._12_4_ = fVar273 * auVar174._12_4_;
  auVar252._8_4_ = 0x3f800000;
  auVar252._0_8_ = 0x3f8000003f800000;
  auVar252._12_4_ = 0x3f800000;
  auVar174 = vsubps_avx(auVar252,auVar187);
  fVar261 = fVar261 + fVar261 * auVar174._0_4_;
  fVar269 = fVar269 + fVar269 * auVar174._4_4_;
  fVar271 = fVar271 + fVar271 * auVar174._8_4_;
  fVar273 = fVar273 + fVar273 * auVar174._12_4_;
  auVar174 = vrcpps_avx(auVar192);
  fVar225 = auVar174._0_4_;
  auVar188._0_4_ = fVar225 * auVar192._0_4_;
  fVar234 = auVar174._4_4_;
  auVar188._4_4_ = fVar234 * auVar192._4_4_;
  fVar235 = auVar174._8_4_;
  auVar188._8_4_ = fVar235 * auVar192._8_4_;
  fVar236 = auVar174._12_4_;
  auVar188._12_4_ = fVar236 * auVar192._12_4_;
  auVar174 = vsubps_avx(auVar252,auVar188);
  fVar225 = fVar225 + fVar225 * auVar174._0_4_;
  fVar234 = fVar234 + fVar234 * auVar174._4_4_;
  fVar235 = fVar235 + fVar235 * auVar174._8_4_;
  fVar236 = fVar236 + fVar236 * auVar174._12_4_;
  auVar174 = vrcpps_avx(auVar191);
  fVar185 = auVar174._0_4_;
  auVar189._0_4_ = fVar185 * auVar191._0_4_;
  fVar199 = auVar174._4_4_;
  auVar189._4_4_ = fVar199 * auVar191._4_4_;
  fVar201 = auVar174._8_4_;
  auVar189._8_4_ = fVar201 * auVar191._8_4_;
  fVar203 = auVar174._12_4_;
  auVar189._12_4_ = fVar203 * auVar191._12_4_;
  auVar191 = vsubps_avx(auVar252,auVar189);
  fVar185 = fVar185 + fVar185 * auVar191._0_4_;
  fVar199 = fVar199 + fVar199 * auVar191._4_4_;
  fVar201 = fVar201 + fVar201 * auVar191._8_4_;
  fVar203 = fVar203 + fVar203 * auVar191._12_4_;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = *(ulong *)(prim + uVar105 * 7 + 6);
  auVar191 = vpmovsxwd_avx(auVar191);
  auVar191 = vcvtdq2ps_avx(auVar191);
  auVar191 = vsubps_avx(auVar191,auVar238);
  auVar171._0_4_ = fVar261 * auVar191._0_4_;
  auVar171._4_4_ = fVar269 * auVar191._4_4_;
  auVar171._8_4_ = fVar271 * auVar191._8_4_;
  auVar171._12_4_ = fVar273 * auVar191._12_4_;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = *(ulong *)(prim + uVar105 * 9 + 6);
  auVar191 = vpmovsxwd_avx(auVar174);
  auVar191 = vcvtdq2ps_avx(auVar191);
  auVar191 = vsubps_avx(auVar191,auVar238);
  auVar211._0_4_ = fVar261 * auVar191._0_4_;
  auVar211._4_4_ = fVar269 * auVar191._4_4_;
  auVar211._8_4_ = fVar271 * auVar191._8_4_;
  auVar211._12_4_ = fVar273 * auVar191._12_4_;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = *(ulong *)(prim + uVar105 * 0xe + 6);
  auVar191 = vpmovsxwd_avx(auVar192);
  auVar191 = vcvtdq2ps_avx(auVar191);
  auVar191 = vsubps_avx(auVar191,auVar118);
  auVar239._0_4_ = auVar191._0_4_ * fVar225;
  auVar239._4_4_ = auVar191._4_4_ * fVar234;
  auVar239._8_4_ = auVar191._8_4_ * fVar235;
  auVar239._12_4_ = auVar191._12_4_ * fVar236;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  auVar191 = vpmovsxwd_avx(auVar177);
  auVar191 = vcvtdq2ps_avx(auVar191);
  auVar191 = vsubps_avx(auVar191,auVar118);
  auVar119._0_4_ = fVar225 * auVar191._0_4_;
  auVar119._4_4_ = fVar234 * auVar191._4_4_;
  auVar119._8_4_ = fVar235 * auVar191._8_4_;
  auVar119._12_4_ = fVar236 * auVar191._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar105 * 0x15 + 6);
  auVar191 = vpmovsxwd_avx(auVar15);
  auVar191 = vcvtdq2ps_avx(auVar191);
  auVar191 = vsubps_avx(auVar191,auVar151);
  auVar226._0_4_ = auVar191._0_4_ * fVar185;
  auVar226._4_4_ = auVar191._4_4_ * fVar199;
  auVar226._8_4_ = auVar191._8_4_ * fVar201;
  auVar226._12_4_ = auVar191._12_4_ * fVar203;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = *(ulong *)(prim + uVar105 * 0x17 + 6);
  auVar191 = vpmovsxwd_avx(auVar265);
  auVar191 = vcvtdq2ps_avx(auVar191);
  auVar191 = vsubps_avx(auVar191,auVar151);
  auVar152._0_4_ = auVar191._0_4_ * fVar185;
  auVar152._4_4_ = auVar191._4_4_ * fVar199;
  auVar152._8_4_ = auVar191._8_4_ * fVar201;
  auVar152._12_4_ = auVar191._12_4_ * fVar203;
  auVar191 = vpminsd_avx(auVar171,auVar211);
  auVar174 = vpminsd_avx(auVar239,auVar119);
  auVar191 = vmaxps_avx(auVar191,auVar174);
  auVar174 = vpminsd_avx(auVar226,auVar152);
  uVar113 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar279._4_4_ = uVar113;
  auVar279._0_4_ = uVar113;
  auVar279._8_4_ = uVar113;
  auVar279._12_4_ = uVar113;
  auVar285 = ZEXT1664(auVar279);
  auVar174 = vmaxps_avx(auVar174,auVar279);
  auVar191 = vmaxps_avx(auVar191,auVar174);
  local_450._0_4_ = auVar191._0_4_ * 0.99999964;
  local_450._4_4_ = auVar191._4_4_ * 0.99999964;
  local_450._8_4_ = auVar191._8_4_ * 0.99999964;
  local_450._12_4_ = auVar191._12_4_ * 0.99999964;
  auVar191 = vpmaxsd_avx(auVar171,auVar211);
  auVar174 = vpmaxsd_avx(auVar239,auVar119);
  auVar191 = vminps_avx(auVar191,auVar174);
  auVar174 = vpmaxsd_avx(auVar226,auVar152);
  uVar113 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar172._4_4_ = uVar113;
  auVar172._0_4_ = uVar113;
  auVar172._8_4_ = uVar113;
  auVar172._12_4_ = uVar113;
  auVar174 = vminps_avx(auVar174,auVar172);
  auVar191 = vminps_avx(auVar191,auVar174);
  auVar120._0_4_ = auVar191._0_4_ * 1.0000004;
  auVar120._4_4_ = auVar191._4_4_ * 1.0000004;
  auVar120._8_4_ = auVar191._8_4_ * 1.0000004;
  auVar120._12_4_ = auVar191._12_4_ * 1.0000004;
  auVar191 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar174 = vpcmpgtd_avx(auVar191,_DAT_01f4ad30);
  auVar191 = vcmpps_avx(local_450,auVar120,2);
  auVar191 = vandps_avx(auVar191,auVar174);
  uVar113 = vmovmskps_avx(auVar191);
  local_5c0 = mm_lookupmask_ps._16_8_;
  uStack_5b8 = mm_lookupmask_ps._24_8_;
  uStack_5b0 = mm_lookupmask_ps._16_8_;
  uStack_5a8 = mm_lookupmask_ps._24_8_;
  local_740 = (undefined1 (*) [32])&local_180;
  uVar110 = 1 << ((byte)k & 0x1f);
  local_748 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar110 & 0xf) << 4));
  local_750 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar110 >> 4) * 0x10);
  local_5c8 = CONCAT44((int)((ulong)ray >> 0x20),uVar113);
  local_738 = pre;
  while (local_5c8 != 0) {
    auVar218 = auVar285._0_32_;
    auVar161 = auVar307._0_32_;
    lVar114 = 0;
    if (local_5c8 != 0) {
      for (; (local_5c8 >> lVar114 & 1) == 0; lVar114 = lVar114 + 1) {
      }
    }
    uVar112 = local_5c8 - 1 & local_5c8;
    lVar109 = lVar114 * 0x40;
    lVar115 = 0;
    if (uVar112 != 0) {
      for (; (uVar112 >> lVar115 & 1) == 0; lVar115 = lVar115 + 1) {
      }
    }
    uVar110 = *(uint *)(prim + 2);
    pGVar12 = (context->scene->geometries).items[uVar110].ptr;
    auVar191 = *(undefined1 (*) [16])(prim + lVar109 + uVar105 * 0x19 + 0x16);
    if (((uVar112 != 0) && (uVar111 = uVar112 - 1 & uVar112, uVar111 != 0)) &&
       (lVar115 = 0, uVar111 != 0)) {
      for (; (uVar111 >> lVar115 & 1) == 0; lVar115 = lVar115 + 1) {
      }
    }
    _local_760 = *(undefined1 (*) [16])(prim + lVar109 + uVar105 * 0x19 + 0x26);
    _local_690 = *(undefined1 (*) [16])(prim + lVar109 + uVar105 * 0x19 + 0x36);
    _local_6a0 = *(undefined1 (*) [16])(prim + lVar109 + uVar105 * 0x19 + 0x46);
    auVar174 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                             0x1c);
    uVar11 = (uint)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar15 = vinsertps_avx(auVar174,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar177 = vsubps_avx(auVar191,auVar15);
    auVar174 = vshufps_avx(auVar177,auVar177,0);
    auVar192 = vshufps_avx(auVar177,auVar177,0x55);
    auVar177 = vshufps_avx(auVar177,auVar177,0xaa);
    fVar261 = pre->ray_space[k].vx.field_0.m128[0];
    fVar225 = pre->ray_space[k].vx.field_0.m128[1];
    fVar185 = pre->ray_space[k].vx.field_0.m128[2];
    fVar269 = pre->ray_space[k].vx.field_0.m128[3];
    fVar234 = pre->ray_space[k].vy.field_0.m128[0];
    fVar199 = pre->ray_space[k].vy.field_0.m128[1];
    fVar271 = pre->ray_space[k].vy.field_0.m128[2];
    fVar235 = pre->ray_space[k].vy.field_0.m128[3];
    fVar201 = pre->ray_space[k].vz.field_0.m128[0];
    fVar273 = pre->ray_space[k].vz.field_0.m128[1];
    fVar236 = pre->ray_space[k].vz.field_0.m128[2];
    fVar203 = pre->ray_space[k].vz.field_0.m128[3];
    auVar212._0_8_ =
         CONCAT44(auVar174._4_4_ * fVar225 + auVar192._4_4_ * fVar199 + fVar273 * auVar177._4_4_,
                  auVar174._0_4_ * fVar261 + auVar192._0_4_ * fVar234 + fVar201 * auVar177._0_4_);
    auVar212._8_4_ = auVar174._8_4_ * fVar185 + auVar192._8_4_ * fVar271 + fVar236 * auVar177._8_4_;
    auVar212._12_4_ =
         auVar174._12_4_ * fVar269 + auVar192._12_4_ * fVar235 + fVar203 * auVar177._12_4_;
    auVar174 = vblendps_avx(auVar212,auVar191,8);
    auVar265 = vsubps_avx(_local_760,auVar15);
    auVar192 = vshufps_avx(auVar265,auVar265,0);
    auVar177 = vshufps_avx(auVar265,auVar265,0x55);
    auVar265 = vshufps_avx(auVar265,auVar265,0xaa);
    auVar227._0_4_ = auVar192._0_4_ * fVar261 + auVar177._0_4_ * fVar234 + fVar201 * auVar265._0_4_;
    auVar227._4_4_ = auVar192._4_4_ * fVar225 + auVar177._4_4_ * fVar199 + fVar273 * auVar265._4_4_;
    auVar227._8_4_ = auVar192._8_4_ * fVar185 + auVar177._8_4_ * fVar271 + fVar236 * auVar265._8_4_;
    auVar227._12_4_ =
         auVar192._12_4_ * fVar269 + auVar177._12_4_ * fVar235 + fVar203 * auVar265._12_4_;
    auVar192 = vblendps_avx(auVar227,_local_760,8);
    auVar119 = vsubps_avx(_local_690,auVar15);
    auVar177 = vshufps_avx(auVar119,auVar119,0);
    auVar265 = vshufps_avx(auVar119,auVar119,0x55);
    auVar119 = vshufps_avx(auVar119,auVar119,0xaa);
    auVar213._0_4_ = auVar177._0_4_ * fVar261 + auVar265._0_4_ * fVar234 + auVar119._0_4_ * fVar201;
    auVar213._4_4_ = auVar177._4_4_ * fVar225 + auVar265._4_4_ * fVar199 + auVar119._4_4_ * fVar273;
    auVar213._8_4_ = auVar177._8_4_ * fVar185 + auVar265._8_4_ * fVar271 + auVar119._8_4_ * fVar236;
    auVar213._12_4_ =
         auVar177._12_4_ * fVar269 + auVar265._12_4_ * fVar235 + auVar119._12_4_ * fVar203;
    auVar177 = vblendps_avx(auVar213,_local_690,8);
    auVar119 = vsubps_avx(_local_6a0,auVar15);
    auVar15 = vshufps_avx(auVar119,auVar119,0);
    auVar265 = vshufps_avx(auVar119,auVar119,0x55);
    auVar119 = vshufps_avx(auVar119,auVar119,0xaa);
    auVar264._0_4_ = auVar15._0_4_ * fVar261 + auVar265._0_4_ * fVar234 + fVar201 * auVar119._0_4_;
    auVar264._4_4_ = auVar15._4_4_ * fVar225 + auVar265._4_4_ * fVar199 + fVar273 * auVar119._4_4_;
    auVar264._8_4_ = auVar15._8_4_ * fVar185 + auVar265._8_4_ * fVar271 + fVar236 * auVar119._8_4_;
    auVar264._12_4_ =
         auVar15._12_4_ * fVar269 + auVar265._12_4_ * fVar235 + fVar203 * auVar119._12_4_;
    auVar15 = vblendps_avx(auVar264,_local_6a0,8);
    auVar190._8_4_ = 0x7fffffff;
    auVar190._0_8_ = 0x7fffffff7fffffff;
    auVar190._12_4_ = 0x7fffffff;
    auVar174 = vandps_avx(auVar174,auVar190);
    auVar192 = vandps_avx(auVar192,auVar190);
    auVar265 = vmaxps_avx(auVar174,auVar192);
    auVar174 = vandps_avx(auVar177,auVar190);
    auVar192 = vandps_avx(auVar15,auVar190);
    auVar174 = vmaxps_avx(auVar174,auVar192);
    auVar174 = vmaxps_avx(auVar265,auVar174);
    auVar192 = vmovshdup_avx(auVar174);
    auVar192 = vmaxss_avx(auVar192,auVar174);
    auVar174 = vshufpd_avx(auVar174,auVar174,1);
    auVar174 = vmaxss_avx(auVar174,auVar192);
    local_5d0 = (long)(int)uVar11;
    lVar115 = local_5d0 * 0x44;
    fVar261 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar115 + 0x908);
    fVar225 = *(float *)(bezier_basis0 + lVar115 + 0x90c);
    fVar185 = *(float *)(bezier_basis0 + lVar115 + 0x910);
    fVar269 = *(float *)(bezier_basis0 + lVar115 + 0x914);
    fVar234 = *(float *)(bezier_basis0 + lVar115 + 0x918);
    fVar199 = *(float *)(bezier_basis0 + lVar115 + 0x91c);
    fVar271 = *(float *)(bezier_basis0 + lVar115 + 0x920);
    auVar101 = *(undefined1 (*) [28])(bezier_basis0 + lVar115 + 0x908);
    auVar192 = vshufps_avx(auVar213,auVar213,0);
    register0x00001250 = auVar192;
    _local_520 = auVar192;
    auVar177 = vshufps_avx(auVar213,auVar213,0x55);
    auVar215._16_16_ = auVar177;
    auVar215._0_16_ = auVar177;
    fVar262 = *(float *)(bezier_basis0 + lVar115 + 0xd8c);
    fVar205 = *(float *)(bezier_basis0 + lVar115 + 0xd90);
    fVar257 = *(float *)(bezier_basis0 + lVar115 + 0xd94);
    fVar270 = *(float *)(bezier_basis0 + lVar115 + 0xd98);
    fVar272 = *(float *)(bezier_basis0 + lVar115 + 0xd9c);
    fVar206 = *(float *)(bezier_basis0 + lVar115 + 0xda0);
    fVar258 = *(float *)(bezier_basis0 + lVar115 + 0xda4);
    auVar15 = vshufps_avx(auVar264,auVar264,0);
    register0x00001550 = auVar15;
    _local_540 = auVar15;
    auVar265 = vshufps_avx(auVar264,auVar264,0x55);
    register0x00001390 = auVar265;
    _local_6e0 = auVar265;
    fVar310 = auVar15._0_4_;
    fVar315 = auVar15._4_4_;
    fVar316 = auVar15._8_4_;
    fVar318 = auVar15._12_4_;
    fVar149 = auVar192._0_4_;
    fVar260 = auVar192._4_4_;
    fVar164 = auVar192._8_4_;
    fVar165 = auVar192._12_4_;
    fVar237 = auVar265._0_4_;
    fVar245 = auVar265._4_4_;
    fVar246 = auVar265._8_4_;
    fVar247 = auVar265._12_4_;
    fVar209 = auVar177._0_4_;
    fVar221 = auVar177._4_4_;
    fVar222 = auVar177._8_4_;
    fVar223 = auVar177._12_4_;
    auVar192 = vshufps_avx(_local_690,_local_690,0xff);
    register0x00001510 = auVar192;
    _local_80 = auVar192;
    auVar177 = vshufps_avx(_local_6a0,_local_6a0,0xff);
    register0x000013d0 = auVar177;
    _local_2a0 = auVar177;
    fVar249 = auVar177._0_4_;
    fVar256 = auVar177._4_4_;
    fVar169 = auVar177._8_4_;
    fVar248 = auVar177._12_4_;
    fVar297 = auVar192._0_4_;
    fVar308 = auVar192._4_4_;
    fVar309 = auVar192._8_4_;
    auVar177 = vshufps_avx(auVar227,auVar227,0);
    local_280._16_16_ = auVar177;
    local_280._0_16_ = auVar177;
    pauVar2 = (undefined1 (*) [32])(bezier_basis0 + lVar115 + 0x484);
    fVar235 = *(float *)*pauVar2;
    fVar201 = *(float *)(bezier_basis0 + lVar115 + 0x488);
    fVar273 = *(float *)(bezier_basis0 + lVar115 + 0x48c);
    fVar236 = *(float *)(bezier_basis0 + lVar115 + 0x490);
    fVar203 = *(float *)(bezier_basis0 + lVar115 + 0x494);
    fVar299 = *(float *)(bezier_basis0 + lVar115 + 0x498);
    fVar298 = *(float *)(bezier_basis0 + lVar115 + 0x49c);
    auVar102 = *(undefined1 (*) [28])*pauVar2;
    _auStack_670 = SUB3216(*pauVar2,0x10);
    fVar325 = auVar177._0_4_;
    fVar329 = auVar177._4_4_;
    fVar330 = auVar177._8_4_;
    fVar331 = auVar177._12_4_;
    auVar177 = vshufps_avx(auVar227,auVar227,0x55);
    register0x00001490 = auVar177;
    _local_7a0 = auVar177;
    fVar288 = auVar177._0_4_;
    fVar289 = auVar177._4_4_;
    fVar293 = auVar177._8_4_;
    fVar294 = auVar177._12_4_;
    auVar15 = vpermilps_avx(_local_760,0xff);
    register0x00001590 = auVar15;
    _local_a0 = auVar15;
    fVar317 = auVar15._0_4_;
    fVar319 = auVar15._4_4_;
    fVar320 = auVar15._8_4_;
    fVar322 = auVar15._12_4_;
    auVar96._8_4_ = auVar212._8_4_;
    auVar96._0_8_ = auVar212._0_8_;
    auVar96._12_4_ = auVar212._12_4_;
    auVar15 = vshufps_avx(auVar96,auVar96,0);
    register0x00001310 = auVar15;
    _local_4a0 = auVar15;
    fVar274 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar115);
    fVar275 = *(float *)(bezier_basis0 + lVar115 + 4);
    fVar207 = *(float *)(bezier_basis0 + lVar115 + 8);
    fVar259 = *(float *)(bezier_basis0 + lVar115 + 0xc);
    fVar276 = *(float *)(bezier_basis0 + lVar115 + 0x10);
    fVar277 = *(float *)(bezier_basis0 + lVar115 + 0x14);
    fVar208 = *(float *)(bezier_basis0 + lVar115 + 0x18);
    auVar103 = *(undefined1 (*) [28])(bezier_basis0 + lVar115);
    fVar166 = auVar15._0_4_;
    fVar167 = auVar15._4_4_;
    fVar168 = auVar15._8_4_;
    fVar224 = auVar15._12_4_;
    auVar295._0_4_ = fVar166 * fVar274 + fVar325 * fVar235 + fVar149 * fVar261 + fVar310 * fVar262;
    auVar295._4_4_ = fVar167 * fVar275 + fVar329 * fVar201 + fVar260 * fVar225 + fVar315 * fVar205;
    auVar295._8_4_ = fVar168 * fVar207 + fVar330 * fVar273 + fVar164 * fVar185 + fVar316 * fVar257;
    auVar295._12_4_ = fVar224 * fVar259 + fVar331 * fVar236 + fVar165 * fVar269 + fVar318 * fVar270;
    auVar295._16_4_ = fVar166 * fVar276 + fVar325 * fVar203 + fVar149 * fVar234 + fVar310 * fVar272;
    auVar295._20_4_ = fVar167 * fVar277 + fVar329 * fVar299 + fVar260 * fVar199 + fVar315 * fVar206;
    auVar295._24_4_ = fVar168 * fVar208 + fVar330 * fVar298 + fVar164 * fVar271 + fVar316 * fVar258;
    auVar295._28_4_ = fVar247 + fVar165 + 0.0 + 0.0;
    auVar15 = vshufps_avx(auVar96,auVar96,0x55);
    fVar186 = auVar15._0_4_;
    fVar200 = auVar15._4_4_;
    fVar202 = auVar15._8_4_;
    fVar204 = auVar15._12_4_;
    auVar266._0_4_ = fVar186 * fVar274 + fVar288 * fVar235 + fVar209 * fVar261 + fVar237 * fVar262;
    auVar266._4_4_ = fVar200 * fVar275 + fVar289 * fVar201 + fVar221 * fVar225 + fVar245 * fVar205;
    auVar266._8_4_ = fVar202 * fVar207 + fVar293 * fVar273 + fVar222 * fVar185 + fVar246 * fVar257;
    auVar266._12_4_ = fVar204 * fVar259 + fVar294 * fVar236 + fVar223 * fVar269 + fVar247 * fVar270;
    auVar266._16_4_ = fVar186 * fVar276 + fVar288 * fVar203 + fVar209 * fVar234 + fVar237 * fVar272;
    auVar266._20_4_ = fVar200 * fVar277 + fVar289 * fVar299 + fVar221 * fVar199 + fVar245 * fVar206;
    auVar266._24_4_ = fVar202 * fVar208 + fVar293 * fVar298 + fVar222 * fVar271 + fVar246 * fVar258;
    auVar266._28_4_ = fVar204 + fVar165 + 0.0 + 0.0;
    auVar15 = vpermilps_avx(auVar191,0xff);
    register0x00001450 = auVar15;
    _local_c0 = auVar15;
    fVar278 = auVar15._0_4_;
    fVar286 = auVar15._4_4_;
    fVar287 = auVar15._8_4_;
    fVar116 = fVar278 * fVar274 + fVar317 * fVar235 + fVar297 * fVar261 + fVar249 * fVar262;
    fVar131 = fVar286 * fVar275 + fVar319 * fVar201 + fVar308 * fVar225 + fVar256 * fVar205;
    fVar134 = fVar287 * fVar207 + fVar320 * fVar273 + fVar309 * fVar185 + fVar169 * fVar257;
    fVar137 = auVar15._12_4_ * fVar259 +
              fVar322 * fVar236 + auVar192._12_4_ * fVar269 + fVar248 * fVar270;
    fVar140 = fVar278 * fVar276 + fVar317 * fVar203 + fVar297 * fVar234 + fVar249 * fVar272;
    fVar143 = fVar286 * fVar277 + fVar319 * fVar299 + fVar308 * fVar199 + fVar256 * fVar206;
    fVar146 = fVar287 * fVar208 + fVar320 * fVar298 + fVar309 * fVar271 + fVar169 * fVar258;
    fVar148 = *(float *)(bezier_basis0 + lVar115 + 0x924) + 0.0 + 0.0 + 0.0;
    fVar274 = *(float *)(bezier_basis1 + lVar115 + 0x908);
    fVar275 = *(float *)(bezier_basis1 + lVar115 + 0x90c);
    fVar207 = *(float *)(bezier_basis1 + lVar115 + 0x910);
    fVar259 = *(float *)(bezier_basis1 + lVar115 + 0x914);
    fVar276 = *(float *)(bezier_basis1 + lVar115 + 0x918);
    fVar277 = *(float *)(bezier_basis1 + lVar115 + 0x91c);
    fVar208 = *(float *)(bezier_basis1 + lVar115 + 0x920);
    fVar261 = *(float *)*(undefined1 (*) [28])(bezier_basis1 + lVar115 + 0xd8c);
    fVar225 = *(float *)(bezier_basis1 + lVar115 + 0xd90);
    fVar185 = *(float *)(bezier_basis1 + lVar115 + 0xd94);
    fVar269 = *(float *)(bezier_basis1 + lVar115 + 0xd98);
    fVar234 = *(float *)(bezier_basis1 + lVar115 + 0xd9c);
    fVar199 = *(float *)(bezier_basis1 + lVar115 + 0xda0);
    fVar271 = *(float *)(bezier_basis1 + lVar115 + 0xda4);
    auVar104 = *(undefined1 (*) [28])(bezier_basis1 + lVar115 + 0xd8c);
    fVar170 = *(float *)(bezier_basis1 + lVar115 + 0x484);
    fVar290 = *(float *)(bezier_basis1 + lVar115 + 0x488);
    fVar132 = *(float *)(bezier_basis1 + lVar115 + 0x48c);
    fVar135 = *(float *)(bezier_basis1 + lVar115 + 0x490);
    fVar138 = *(float *)(bezier_basis1 + lVar115 + 0x494);
    fVar141 = *(float *)(bezier_basis1 + lVar115 + 0x498);
    fVar144 = *(float *)(bezier_basis1 + lVar115 + 0x49c);
    fVar235 = fVar318 + fVar204 + fVar247;
    fVar117 = *(float *)(bezier_basis1 + lVar115);
    fVar133 = *(float *)(bezier_basis1 + lVar115 + 4);
    fVar136 = *(float *)(bezier_basis1 + lVar115 + 8);
    fVar139 = *(float *)(bezier_basis1 + lVar115 + 0xc);
    fVar142 = *(float *)(bezier_basis1 + lVar115 + 0x10);
    fVar145 = *(float *)(bezier_basis1 + lVar115 + 0x14);
    fVar147 = *(float *)(bezier_basis1 + lVar115 + 0x18);
    auVar301._0_4_ = fVar166 * fVar117 + fVar325 * fVar170 + fVar274 * fVar149 + fVar310 * fVar261;
    auVar301._4_4_ = fVar167 * fVar133 + fVar329 * fVar290 + fVar275 * fVar260 + fVar315 * fVar225;
    auVar301._8_4_ = fVar168 * fVar136 + fVar330 * fVar132 + fVar207 * fVar164 + fVar316 * fVar185;
    auVar301._12_4_ = fVar224 * fVar139 + fVar331 * fVar135 + fVar259 * fVar165 + fVar318 * fVar269;
    auVar301._16_4_ = fVar166 * fVar142 + fVar325 * fVar138 + fVar276 * fVar149 + fVar310 * fVar234;
    auVar301._20_4_ = fVar167 * fVar145 + fVar329 * fVar141 + fVar277 * fVar260 + fVar315 * fVar199;
    auVar301._24_4_ = fVar168 * fVar147 + fVar330 * fVar144 + fVar208 * fVar164 + fVar316 * fVar271;
    auVar301._28_4_ = fVar322 + fVar235;
    auVar193._0_4_ = fVar186 * fVar117 + fVar288 * fVar170 + fVar274 * fVar209 + fVar261 * fVar237;
    auVar193._4_4_ = fVar200 * fVar133 + fVar289 * fVar290 + fVar275 * fVar221 + fVar225 * fVar245;
    auVar193._8_4_ = fVar202 * fVar136 + fVar293 * fVar132 + fVar207 * fVar222 + fVar185 * fVar246;
    auVar193._12_4_ = fVar204 * fVar139 + fVar294 * fVar135 + fVar259 * fVar223 + fVar269 * fVar247;
    auVar193._16_4_ = fVar186 * fVar142 + fVar288 * fVar138 + fVar276 * fVar209 + fVar234 * fVar237;
    auVar193._20_4_ = fVar200 * fVar145 + fVar289 * fVar141 + fVar277 * fVar221 + fVar199 * fVar245;
    auVar193._24_4_ = fVar202 * fVar147 + fVar293 * fVar144 + fVar208 * fVar222 + fVar271 * fVar246;
    auVar193._28_4_ = fVar235 + fVar318 + fVar247 + fVar204;
    auVar228._0_4_ = fVar317 * fVar170 + fVar297 * fVar274 + fVar249 * fVar261 + fVar278 * fVar117;
    auVar228._4_4_ = fVar319 * fVar290 + fVar308 * fVar275 + fVar256 * fVar225 + fVar286 * fVar133;
    auVar228._8_4_ = fVar320 * fVar132 + fVar309 * fVar207 + fVar169 * fVar185 + fVar287 * fVar136;
    auVar228._12_4_ =
         fVar322 * fVar135 + auVar192._12_4_ * fVar259 + fVar248 * fVar269 +
         auVar15._12_4_ * fVar139;
    auVar228._16_4_ = fVar317 * fVar138 + fVar297 * fVar276 + fVar249 * fVar234 + fVar278 * fVar142;
    auVar228._20_4_ = fVar319 * fVar141 + fVar308 * fVar277 + fVar256 * fVar199 + fVar286 * fVar145;
    auVar228._24_4_ = fVar320 * fVar144 + fVar309 * fVar208 + fVar169 * fVar271 + fVar287 * fVar147;
    auVar228._28_4_ = fVar318 + fVar248 + fVar247 + fVar235;
    auVar16 = vsubps_avx(auVar301,auVar295);
    auVar17 = vsubps_avx(auVar193,auVar266);
    fVar261 = auVar16._0_4_;
    fVar185 = auVar16._4_4_;
    auVar282._4_4_ = auVar266._4_4_ * fVar185;
    auVar282._0_4_ = auVar266._0_4_ * fVar261;
    fVar234 = auVar16._8_4_;
    auVar282._8_4_ = auVar266._8_4_ * fVar234;
    fVar271 = auVar16._12_4_;
    auVar282._12_4_ = auVar266._12_4_ * fVar271;
    fVar201 = auVar16._16_4_;
    auVar282._16_4_ = auVar266._16_4_ * fVar201;
    fVar236 = auVar16._20_4_;
    auVar282._20_4_ = auVar266._20_4_ * fVar236;
    fVar299 = auVar16._24_4_;
    auVar282._24_4_ = auVar266._24_4_ * fVar299;
    auVar282._28_4_ = fVar235;
    fVar225 = auVar17._0_4_;
    fVar269 = auVar17._4_4_;
    auVar18._4_4_ = auVar295._4_4_ * fVar269;
    auVar18._0_4_ = auVar295._0_4_ * fVar225;
    fVar199 = auVar17._8_4_;
    auVar18._8_4_ = auVar295._8_4_ * fVar199;
    fVar235 = auVar17._12_4_;
    auVar18._12_4_ = auVar295._12_4_ * fVar235;
    fVar273 = auVar17._16_4_;
    auVar18._16_4_ = auVar295._16_4_ * fVar273;
    fVar203 = auVar17._20_4_;
    auVar18._20_4_ = auVar295._20_4_ * fVar203;
    fVar298 = auVar17._24_4_;
    auVar18._24_4_ = auVar295._24_4_ * fVar298;
    auVar18._28_4_ = auVar193._28_4_;
    auVar18 = vsubps_avx(auVar282,auVar18);
    auVar21._4_4_ = fVar131;
    auVar21._0_4_ = fVar116;
    auVar21._8_4_ = fVar134;
    auVar21._12_4_ = fVar137;
    auVar21._16_4_ = fVar140;
    auVar21._20_4_ = fVar143;
    auVar21._24_4_ = fVar146;
    auVar21._28_4_ = fVar148;
    auVar282 = vmaxps_avx(auVar21,auVar228);
    auVar23._4_4_ = auVar282._4_4_ * auVar282._4_4_ * (fVar185 * fVar185 + fVar269 * fVar269);
    auVar23._0_4_ = auVar282._0_4_ * auVar282._0_4_ * (fVar261 * fVar261 + fVar225 * fVar225);
    auVar23._8_4_ = auVar282._8_4_ * auVar282._8_4_ * (fVar234 * fVar234 + fVar199 * fVar199);
    auVar23._12_4_ = auVar282._12_4_ * auVar282._12_4_ * (fVar271 * fVar271 + fVar235 * fVar235);
    auVar23._16_4_ = auVar282._16_4_ * auVar282._16_4_ * (fVar201 * fVar201 + fVar273 * fVar273);
    auVar23._20_4_ = auVar282._20_4_ * auVar282._20_4_ * (fVar236 * fVar236 + fVar203 * fVar203);
    auVar23._24_4_ = auVar282._24_4_ * auVar282._24_4_ * (fVar299 * fVar299 + fVar298 * fVar298);
    auVar23._28_4_ = auVar17._28_4_ + auVar193._28_4_;
    auVar14._4_4_ = auVar18._4_4_ * auVar18._4_4_;
    auVar14._0_4_ = auVar18._0_4_ * auVar18._0_4_;
    auVar14._8_4_ = auVar18._8_4_ * auVar18._8_4_;
    auVar14._12_4_ = auVar18._12_4_ * auVar18._12_4_;
    auVar14._16_4_ = auVar18._16_4_ * auVar18._16_4_;
    auVar14._20_4_ = auVar18._20_4_ * auVar18._20_4_;
    auVar14._24_4_ = auVar18._24_4_ * auVar18._24_4_;
    auVar14._28_4_ = auVar18._28_4_;
    auVar214._0_4_ = (float)(int)uVar11;
    auVar214._4_12_ = auVar177._4_12_;
    auVar282 = vcmpps_avx(auVar14,auVar23,2);
    fVar261 = auVar174._0_4_ * 4.7683716e-07;
    auVar268 = ZEXT464((uint)fVar261);
    local_560._0_16_ = auVar214;
    auVar174 = vshufps_avx(auVar214,auVar214,0);
    auVar194._16_16_ = auVar174;
    auVar194._0_16_ = auVar174;
    auVar18 = vcmpps_avx(_DAT_01f7b060,auVar194,1);
    auVar198 = ZEXT3264(auVar18);
    auVar97._8_4_ = auVar212._8_4_;
    auVar97._0_8_ = auVar212._0_8_;
    auVar97._12_4_ = auVar212._12_4_;
    auVar174 = vpermilps_avx(auVar97,0xaa);
    register0x00001450 = auVar174;
    _local_2c0 = auVar174;
    auVar192 = vpermilps_avx(auVar227,0xaa);
    register0x00001550 = auVar192;
    _local_e0 = auVar192;
    auVar177 = vpermilps_avx(auVar213,0xaa);
    register0x00001590 = auVar177;
    _local_480 = auVar177;
    auVar15 = vpermilps_avx(auVar264,0xaa);
    auVar296._16_16_ = auVar15;
    auVar296._0_16_ = auVar15;
    auVar23 = auVar18 & auVar282;
    uVar9 = *(uint *)(ray + k * 4 + 0x60);
    local_700._0_16_ = ZEXT416(*(uint *)(prim + lVar114 * 4 + 6));
    auVar265 = ZEXT416((uint)fVar261);
    local_930 = auVar191._0_4_;
    fStack_92c = auVar191._4_4_;
    fStack_928 = auVar191._8_4_;
    fStack_924 = auVar191._12_4_;
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar23 >> 0x7f,0) == '\0') &&
          (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar23 >> 0xbf,0) == '\0') &&
        (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar23[0x1f]) {
      pRVar106 = (RTCIntersectArguments *)0x0;
      auVar307 = ZEXT3264(auVar161);
      auVar285 = ZEXT3264(auVar218);
      auVar314 = ZEXT3264(_local_7a0);
    }
    else {
      local_4c0 = vandps_avx(auVar282,auVar18);
      fVar249 = auVar174._0_4_;
      fVar256 = auVar174._4_4_;
      fVar169 = auVar174._8_4_;
      fVar248 = auVar174._12_4_;
      fVar308 = auVar192._0_4_;
      fVar309 = auVar192._4_4_;
      fVar317 = auVar192._8_4_;
      fVar319 = auVar192._12_4_;
      fVar320 = auVar177._0_4_;
      fVar322 = auVar177._4_4_;
      fVar323 = auVar177._8_4_;
      fVar324 = auVar177._12_4_;
      local_5a0._0_4_ = auVar104._0_4_;
      local_5a0._4_4_ = auVar104._4_4_;
      fStack_598 = auVar104._8_4_;
      fStack_594 = auVar104._12_4_;
      fStack_590 = auVar104._16_4_;
      fStack_58c = auVar104._20_4_;
      fStack_588 = auVar104._24_4_;
      fVar278 = auVar15._0_4_;
      fVar286 = auVar15._4_4_;
      fVar287 = auVar15._8_4_;
      fVar297 = auVar15._12_4_;
      local_5a0._0_4_ =
           fVar249 * fVar117 +
           fVar308 * fVar170 + fVar320 * fVar274 + fVar278 * (float)local_5a0._0_4_;
      local_5a0._4_4_ =
           fVar256 * fVar133 +
           fVar309 * fVar290 + fVar322 * fVar275 + fVar286 * (float)local_5a0._4_4_;
      fStack_598 = fVar169 * fVar136 + fVar317 * fVar132 + fVar323 * fVar207 + fVar287 * fStack_598;
      fStack_594 = fVar248 * fVar139 + fVar319 * fVar135 + fVar324 * fVar259 + fVar297 * fStack_594;
      fStack_590 = fVar249 * fVar142 + fVar308 * fVar138 + fVar320 * fVar276 + fVar278 * fStack_590;
      fStack_58c = fVar256 * fVar145 + fVar309 * fVar141 + fVar322 * fVar277 + fVar286 * fStack_58c;
      fStack_588 = fVar169 * fVar147 + fVar317 * fVar144 + fVar323 * fVar208 + fVar287 * fStack_588;
      fStack_584 = local_4c0._28_4_ +
                   auVar18._28_4_ + *(float *)(bezier_basis1 + lVar115 + 0x924) + 0.0;
      local_580._0_4_ = auVar103._0_4_;
      local_580._4_4_ = auVar103._4_4_;
      fStack_578 = auVar103._8_4_;
      fStack_574 = auVar103._12_4_;
      fStack_570 = auVar103._16_4_;
      fStack_56c = auVar103._20_4_;
      fStack_568 = auVar103._24_4_;
      local_680._0_4_ = auVar102._0_4_;
      local_680._4_4_ = auVar102._4_4_;
      fStack_678 = auVar102._8_4_;
      fStack_674 = auVar102._12_4_;
      auStack_670._0_4_ = auVar102._16_4_;
      auStack_670._4_4_ = auVar102._20_4_;
      fStack_668 = auVar102._24_4_;
      local_620._0_4_ = auVar101._0_4_;
      local_620._4_4_ = auVar101._4_4_;
      fStack_618 = auVar101._8_4_;
      fStack_614 = auVar101._12_4_;
      fStack_610 = auVar101._16_4_;
      fStack_60c = auVar101._20_4_;
      fStack_608 = auVar101._24_4_;
      local_640 = fVar249 * (float)local_580._0_4_ +
                  fVar308 * (float)local_680._0_4_ +
                  fVar320 * (float)local_620._0_4_ + fVar278 * fVar262;
      fStack_63c = fVar256 * (float)local_580._4_4_ +
                   fVar309 * (float)local_680._4_4_ +
                   fVar322 * (float)local_620._4_4_ + fVar286 * fVar205;
      fStack_638 = fVar169 * fStack_578 +
                   fVar317 * fStack_678 + fVar323 * fStack_618 + fVar287 * fVar257;
      fStack_634 = fVar248 * fStack_574 +
                   fVar319 * fStack_674 + fVar324 * fStack_614 + fVar297 * fVar270;
      fStack_630 = fVar249 * fStack_570 +
                   fVar308 * (float)auStack_670._0_4_ + fVar320 * fStack_610 + fVar278 * fVar272;
      fStack_62c = fVar256 * fStack_56c +
                   fVar309 * (float)auStack_670._4_4_ + fVar322 * fStack_60c + fVar286 * fVar206;
      fStack_628 = fVar169 * fStack_568 +
                   fVar317 * fStack_668 + fVar323 * fStack_608 + fVar287 * fVar258;
      fStack_624 = fVar204 + fStack_584 + local_4c0._28_4_ + auVar18._28_4_;
      fVar261 = *(float *)(bezier_basis0 + lVar115 + 0x1210);
      fVar225 = *(float *)(bezier_basis0 + lVar115 + 0x1214);
      fVar185 = *(float *)(bezier_basis0 + lVar115 + 0x1218);
      fVar269 = *(float *)(bezier_basis0 + lVar115 + 0x121c);
      fVar234 = *(float *)(bezier_basis0 + lVar115 + 0x1220);
      fVar199 = *(float *)(bezier_basis0 + lVar115 + 0x1224);
      fVar271 = *(float *)(bezier_basis0 + lVar115 + 0x1228);
      fVar235 = *(float *)(bezier_basis0 + lVar115 + 0x1694);
      fVar201 = *(float *)(bezier_basis0 + lVar115 + 0x1698);
      fVar273 = *(float *)(bezier_basis0 + lVar115 + 0x169c);
      fVar236 = *(float *)(bezier_basis0 + lVar115 + 0x16a0);
      fVar203 = *(float *)(bezier_basis0 + lVar115 + 0x16a4);
      fVar299 = *(float *)(bezier_basis0 + lVar115 + 0x16a8);
      fVar298 = *(float *)(bezier_basis0 + lVar115 + 0x16ac);
      fVar262 = *(float *)(bezier_basis0 + lVar115 + 0x1b18);
      fVar205 = *(float *)(bezier_basis0 + lVar115 + 0x1b1c);
      fVar257 = *(float *)(bezier_basis0 + lVar115 + 0x1b20);
      fVar270 = *(float *)(bezier_basis0 + lVar115 + 0x1b24);
      fVar272 = *(float *)(bezier_basis0 + lVar115 + 0x1b28);
      fVar206 = *(float *)(bezier_basis0 + lVar115 + 0x1b2c);
      fVar258 = *(float *)(bezier_basis0 + lVar115 + 0x1b30);
      fVar274 = *(float *)(bezier_basis0 + lVar115 + 0x1f9c);
      fVar275 = *(float *)(bezier_basis0 + lVar115 + 0x1fa0);
      fVar207 = *(float *)(bezier_basis0 + lVar115 + 0x1fa4);
      fVar259 = *(float *)(bezier_basis0 + lVar115 + 0x1fa8);
      fVar276 = *(float *)(bezier_basis0 + lVar115 + 0x1fac);
      fVar277 = *(float *)(bezier_basis0 + lVar115 + 0x1fb0);
      fVar208 = *(float *)(bezier_basis0 + lVar115 + 0x1fb4);
      fVar170 = *(float *)(bezier_basis0 + lVar115 + 0x1b34) +
                *(float *)(bezier_basis0 + lVar115 + 0x1fb8);
      fVar290 = *(float *)(bezier_basis0 + lVar115 + 0x16b0) + fVar170;
      local_580._4_4_ =
           fVar167 * fVar225 + fVar329 * fVar201 + fVar260 * fVar205 + fVar315 * fVar275;
      local_580._0_4_ =
           fVar166 * fVar261 + fVar325 * fVar235 + fVar149 * fVar262 + fVar310 * fVar274;
      fStack_578 = fVar168 * fVar185 + fVar330 * fVar273 + fVar164 * fVar257 + fVar316 * fVar207;
      fStack_574 = fVar224 * fVar269 + fVar331 * fVar236 + fVar165 * fVar270 + fVar318 * fVar259;
      fStack_570 = fVar166 * fVar234 + fVar325 * fVar203 + fVar149 * fVar272 + fVar310 * fVar276;
      fStack_56c = fVar167 * fVar199 + fVar329 * fVar299 + fVar260 * fVar206 + fVar315 * fVar277;
      fStack_568 = fVar168 * fVar271 + fVar330 * fVar298 + fVar164 * fVar258 + fVar316 * fVar208;
      fStack_564 = *(float *)(bezier_basis0 + lVar115 + 0x16b0) +
                   *(float *)(bezier_basis0 + lVar115 + 0x1fb8) +
                   fVar248 + *(float *)(bezier_basis1 + lVar115 + 0x4a0);
      auVar155._0_4_ = fVar186 * fVar261 + fVar288 * fVar235 + fVar209 * fVar262 + fVar237 * fVar274
      ;
      auVar155._4_4_ = fVar200 * fVar225 + fVar289 * fVar201 + fVar221 * fVar205 + fVar245 * fVar275
      ;
      auVar155._8_4_ = fVar202 * fVar185 + fVar293 * fVar273 + fVar222 * fVar257 + fVar246 * fVar207
      ;
      auVar155._12_4_ =
           fVar204 * fVar269 + fVar294 * fVar236 + fVar223 * fVar270 + fVar247 * fVar259;
      auVar155._16_4_ =
           fVar186 * fVar234 + fVar288 * fVar203 + fVar209 * fVar272 + fVar237 * fVar276;
      auVar155._20_4_ =
           fVar200 * fVar199 + fVar289 * fVar299 + fVar221 * fVar206 + fVar245 * fVar277;
      auVar155._24_4_ =
           fVar202 * fVar271 + fVar293 * fVar298 + fVar222 * fVar258 + fVar246 * fVar208;
      auVar155._28_4_ =
           fVar170 + fVar248 + *(float *)(bezier_basis1 + lVar115 + 0x4a0) +
                     fVar248 + *(float *)(bezier_basis1 + lVar115 + 0x1c);
      auVar240._0_4_ = fVar308 * fVar235 + fVar320 * fVar262 + fVar278 * fVar274 + fVar249 * fVar261
      ;
      auVar240._4_4_ = fVar309 * fVar201 + fVar322 * fVar205 + fVar286 * fVar275 + fVar256 * fVar225
      ;
      auVar240._8_4_ = fVar317 * fVar273 + fVar323 * fVar257 + fVar287 * fVar207 + fVar169 * fVar185
      ;
      auVar240._12_4_ =
           fVar319 * fVar236 + fVar324 * fVar270 + fVar297 * fVar259 + fVar248 * fVar269;
      auVar240._16_4_ =
           fVar308 * fVar203 + fVar320 * fVar272 + fVar278 * fVar276 + fVar249 * fVar234;
      auVar240._20_4_ =
           fVar309 * fVar299 + fVar322 * fVar206 + fVar286 * fVar277 + fVar256 * fVar199;
      auVar240._24_4_ =
           fVar317 * fVar298 + fVar323 * fVar258 + fVar287 * fVar208 + fVar169 * fVar271;
      auVar240._28_4_ = fVar290 + *(float *)(bezier_basis0 + lVar115 + 0x122c);
      fVar261 = *(float *)(bezier_basis1 + lVar115 + 0x1b18);
      fVar225 = *(float *)(bezier_basis1 + lVar115 + 0x1b1c);
      fVar185 = *(float *)(bezier_basis1 + lVar115 + 0x1b20);
      fVar269 = *(float *)(bezier_basis1 + lVar115 + 0x1b24);
      fVar234 = *(float *)(bezier_basis1 + lVar115 + 0x1b28);
      fVar199 = *(float *)(bezier_basis1 + lVar115 + 0x1b2c);
      fVar271 = *(float *)(bezier_basis1 + lVar115 + 0x1b30);
      fVar235 = *(float *)(bezier_basis1 + lVar115 + 0x1f9c);
      fVar201 = *(float *)(bezier_basis1 + lVar115 + 0x1fa0);
      fVar273 = *(float *)(bezier_basis1 + lVar115 + 0x1fa4);
      fVar236 = *(float *)(bezier_basis1 + lVar115 + 0x1fa8);
      fVar203 = *(float *)(bezier_basis1 + lVar115 + 0x1fac);
      fVar299 = *(float *)(bezier_basis1 + lVar115 + 0x1fb0);
      fVar298 = *(float *)(bezier_basis1 + lVar115 + 0x1fb4);
      fVar262 = *(float *)(bezier_basis1 + lVar115 + 0x1694);
      fVar205 = *(float *)(bezier_basis1 + lVar115 + 0x1698);
      fVar257 = *(float *)(bezier_basis1 + lVar115 + 0x169c);
      fVar270 = *(float *)(bezier_basis1 + lVar115 + 0x16a0);
      fVar272 = *(float *)(bezier_basis1 + lVar115 + 0x16a4);
      fVar206 = *(float *)(bezier_basis1 + lVar115 + 0x16a8);
      fVar258 = *(float *)(bezier_basis1 + lVar115 + 0x16ac);
      fVar274 = *(float *)(bezier_basis1 + lVar115 + 0x1210);
      fVar275 = *(float *)(bezier_basis1 + lVar115 + 0x1214);
      fVar207 = *(float *)(bezier_basis1 + lVar115 + 0x1218);
      fVar259 = *(float *)(bezier_basis1 + lVar115 + 0x121c);
      fVar276 = *(float *)(bezier_basis1 + lVar115 + 0x1220);
      fVar277 = *(float *)(bezier_basis1 + lVar115 + 0x1224);
      fVar208 = *(float *)(bezier_basis1 + lVar115 + 0x1228);
      auVar253._0_4_ = fVar166 * fVar274 + fVar325 * fVar262 + fVar149 * fVar261 + fVar310 * fVar235
      ;
      auVar253._4_4_ = fVar167 * fVar275 + fVar329 * fVar205 + fVar260 * fVar225 + fVar315 * fVar201
      ;
      auVar253._8_4_ = fVar168 * fVar207 + fVar330 * fVar257 + fVar164 * fVar185 + fVar316 * fVar273
      ;
      auVar253._12_4_ =
           fVar224 * fVar259 + fVar331 * fVar270 + fVar165 * fVar269 + fVar318 * fVar236;
      auVar253._16_4_ =
           fVar166 * fVar276 + fVar325 * fVar272 + fVar149 * fVar234 + fVar310 * fVar203;
      auVar253._20_4_ =
           fVar167 * fVar277 + fVar329 * fVar206 + fVar260 * fVar199 + fVar315 * fVar299;
      auVar253._24_4_ =
           fVar168 * fVar208 + fVar330 * fVar258 + fVar164 * fVar271 + fVar316 * fVar298;
      auVar253._28_4_ = fVar223 + fVar223 + fVar290 + fVar318;
      auVar280._0_4_ = fVar186 * fVar274 + fVar288 * fVar262 + fVar209 * fVar261 + fVar237 * fVar235
      ;
      auVar280._4_4_ = fVar200 * fVar275 + fVar289 * fVar205 + fVar221 * fVar225 + fVar245 * fVar201
      ;
      auVar280._8_4_ = fVar202 * fVar207 + fVar293 * fVar257 + fVar222 * fVar185 + fVar246 * fVar273
      ;
      auVar280._12_4_ =
           fVar204 * fVar259 + fVar294 * fVar270 + fVar223 * fVar269 + fVar247 * fVar236;
      auVar280._16_4_ =
           fVar186 * fVar276 + fVar288 * fVar272 + fVar209 * fVar234 + fVar237 * fVar203;
      auVar280._20_4_ =
           fVar200 * fVar277 + fVar289 * fVar206 + fVar221 * fVar199 + fVar245 * fVar299;
      auVar280._24_4_ =
           fVar202 * fVar208 + fVar293 * fVar258 + fVar222 * fVar271 + fVar246 * fVar298;
      auVar280._28_4_ = fVar223 + fVar223 + fVar223 + fVar290;
      auVar179._0_4_ = fVar249 * fVar274 + fVar308 * fVar262 + fVar320 * fVar261 + fVar235 * fVar278
      ;
      auVar179._4_4_ = fVar256 * fVar275 + fVar309 * fVar205 + fVar322 * fVar225 + fVar201 * fVar286
      ;
      auVar179._8_4_ = fVar169 * fVar207 + fVar317 * fVar257 + fVar323 * fVar185 + fVar273 * fVar287
      ;
      auVar179._12_4_ =
           fVar248 * fVar259 + fVar319 * fVar270 + fVar324 * fVar269 + fVar236 * fVar297;
      auVar179._16_4_ =
           fVar249 * fVar276 + fVar308 * fVar272 + fVar320 * fVar234 + fVar203 * fVar278;
      auVar179._20_4_ =
           fVar256 * fVar277 + fVar309 * fVar206 + fVar322 * fVar199 + fVar299 * fVar286;
      auVar179._24_4_ =
           fVar169 * fVar208 + fVar317 * fVar258 + fVar323 * fVar271 + fVar298 * fVar287;
      auVar179._28_4_ =
           *(float *)(bezier_basis1 + lVar115 + 0x122c) +
           *(float *)(bezier_basis1 + lVar115 + 0x16b0) +
           *(float *)(bezier_basis1 + lVar115 + 0x1b34) +
           *(float *)(bezier_basis1 + lVar115 + 0x1fb8);
      auVar216._8_4_ = 0x7fffffff;
      auVar216._0_8_ = 0x7fffffff7fffffff;
      auVar216._12_4_ = 0x7fffffff;
      auVar216._16_4_ = 0x7fffffff;
      auVar216._20_4_ = 0x7fffffff;
      auVar216._24_4_ = 0x7fffffff;
      auVar216._28_4_ = 0x7fffffff;
      auVar282 = vandps_avx(_local_580,auVar216);
      auVar18 = vandps_avx(auVar155,auVar216);
      auVar18 = vmaxps_avx(auVar282,auVar18);
      auVar282 = vandps_avx(auVar240,auVar216);
      auVar282 = vmaxps_avx(auVar18,auVar282);
      auVar191 = vpermilps_avx(auVar265,0);
      auVar241._16_16_ = auVar191;
      auVar241._0_16_ = auVar191;
      auVar282 = vcmpps_avx(auVar282,auVar241,1);
      auVar23 = vblendvps_avx(_local_580,auVar16,auVar282);
      auVar14 = vblendvps_avx(auVar155,auVar17,auVar282);
      auVar282 = vandps_avx(auVar253,auVar216);
      auVar18 = vandps_avx(auVar280,auVar216);
      auVar21 = vmaxps_avx(auVar282,auVar18);
      auVar282 = vandps_avx(auVar179,auVar216);
      auVar282 = vmaxps_avx(auVar21,auVar282);
      auVar21 = vcmpps_avx(auVar282,auVar241,1);
      auVar282 = vblendvps_avx(auVar253,auVar16,auVar21);
      auVar16 = vblendvps_avx(auVar280,auVar17,auVar21);
      fVar290 = auVar23._0_4_;
      fVar132 = auVar23._4_4_;
      fVar135 = auVar23._8_4_;
      fVar138 = auVar23._12_4_;
      fVar141 = auVar23._16_4_;
      fVar144 = auVar23._20_4_;
      fVar117 = auVar23._24_4_;
      fVar133 = auVar282._0_4_;
      fVar136 = auVar282._4_4_;
      fVar139 = auVar282._8_4_;
      fVar142 = auVar282._12_4_;
      fVar145 = auVar282._16_4_;
      fVar147 = auVar282._20_4_;
      fVar149 = auVar282._24_4_;
      fVar260 = -auVar282._28_4_;
      fVar261 = auVar14._0_4_;
      fVar234 = auVar14._4_4_;
      fVar201 = auVar14._8_4_;
      fVar299 = auVar14._12_4_;
      fVar257 = auVar14._16_4_;
      fVar258 = auVar14._20_4_;
      fVar259 = auVar14._24_4_;
      auVar123._0_4_ = fVar261 * fVar261 + fVar290 * fVar290;
      auVar123._4_4_ = fVar234 * fVar234 + fVar132 * fVar132;
      auVar123._8_4_ = fVar201 * fVar201 + fVar135 * fVar135;
      auVar123._12_4_ = fVar299 * fVar299 + fVar138 * fVar138;
      auVar123._16_4_ = fVar257 * fVar257 + fVar141 * fVar141;
      auVar123._20_4_ = fVar258 * fVar258 + fVar144 * fVar144;
      auVar123._24_4_ = fVar259 * fVar259 + fVar117 * fVar117;
      auVar123._28_4_ = auVar280._28_4_ + auVar23._28_4_;
      auVar17 = vrsqrtps_avx(auVar123);
      fVar225 = auVar17._0_4_;
      fVar185 = auVar17._4_4_;
      auVar22._4_4_ = fVar185 * 1.5;
      auVar22._0_4_ = fVar225 * 1.5;
      fVar269 = auVar17._8_4_;
      auVar22._8_4_ = fVar269 * 1.5;
      fVar199 = auVar17._12_4_;
      auVar22._12_4_ = fVar199 * 1.5;
      fVar271 = auVar17._16_4_;
      auVar22._16_4_ = fVar271 * 1.5;
      fVar235 = auVar17._20_4_;
      auVar22._20_4_ = fVar235 * 1.5;
      fVar273 = auVar17._24_4_;
      fVar170 = auVar18._28_4_;
      auVar22._24_4_ = fVar273 * 1.5;
      auVar22._28_4_ = fVar170;
      auVar17._4_4_ = fVar185 * fVar185 * fVar185 * auVar123._4_4_ * 0.5;
      auVar17._0_4_ = fVar225 * fVar225 * fVar225 * auVar123._0_4_ * 0.5;
      auVar17._8_4_ = fVar269 * fVar269 * fVar269 * auVar123._8_4_ * 0.5;
      auVar17._12_4_ = fVar199 * fVar199 * fVar199 * auVar123._12_4_ * 0.5;
      auVar17._16_4_ = fVar271 * fVar271 * fVar271 * auVar123._16_4_ * 0.5;
      auVar17._20_4_ = fVar235 * fVar235 * fVar235 * auVar123._20_4_ * 0.5;
      auVar17._24_4_ = fVar273 * fVar273 * fVar273 * auVar123._24_4_ * 0.5;
      auVar17._28_4_ = auVar123._28_4_;
      auVar18 = vsubps_avx(auVar22,auVar17);
      fVar225 = auVar18._0_4_;
      fVar199 = auVar18._4_4_;
      fVar273 = auVar18._8_4_;
      fVar298 = auVar18._12_4_;
      fVar270 = auVar18._16_4_;
      fVar274 = auVar18._20_4_;
      fVar276 = auVar18._24_4_;
      fVar185 = auVar16._0_4_;
      fVar271 = auVar16._4_4_;
      fVar236 = auVar16._8_4_;
      fVar262 = auVar16._12_4_;
      fVar272 = auVar16._16_4_;
      fVar275 = auVar16._20_4_;
      fVar277 = auVar16._24_4_;
      auVar124._0_4_ = fVar185 * fVar185 + fVar133 * fVar133;
      auVar124._4_4_ = fVar271 * fVar271 + fVar136 * fVar136;
      auVar124._8_4_ = fVar236 * fVar236 + fVar139 * fVar139;
      auVar124._12_4_ = fVar262 * fVar262 + fVar142 * fVar142;
      auVar124._16_4_ = fVar272 * fVar272 + fVar145 * fVar145;
      auVar124._20_4_ = fVar275 * fVar275 + fVar147 * fVar147;
      auVar124._24_4_ = fVar277 * fVar277 + fVar149 * fVar149;
      auVar124._28_4_ = auVar282._28_4_ + auVar18._28_4_;
      auVar282 = vrsqrtps_avx(auVar124);
      fVar269 = auVar282._0_4_;
      fVar235 = auVar282._4_4_;
      auVar19._4_4_ = fVar235 * 1.5;
      auVar19._0_4_ = fVar269 * 1.5;
      fVar203 = auVar282._8_4_;
      auVar19._8_4_ = fVar203 * 1.5;
      fVar205 = auVar282._12_4_;
      auVar19._12_4_ = fVar205 * 1.5;
      fVar206 = auVar282._16_4_;
      auVar19._16_4_ = fVar206 * 1.5;
      fVar207 = auVar282._20_4_;
      auVar19._20_4_ = fVar207 * 1.5;
      fVar208 = auVar282._24_4_;
      auVar19._24_4_ = fVar208 * 1.5;
      auVar19._28_4_ = fVar170;
      auVar20._4_4_ = fVar235 * fVar235 * fVar235 * auVar124._4_4_ * 0.5;
      auVar20._0_4_ = fVar269 * fVar269 * fVar269 * auVar124._0_4_ * 0.5;
      auVar20._8_4_ = fVar203 * fVar203 * fVar203 * auVar124._8_4_ * 0.5;
      auVar20._12_4_ = fVar205 * fVar205 * fVar205 * auVar124._12_4_ * 0.5;
      auVar20._16_4_ = fVar206 * fVar206 * fVar206 * auVar124._16_4_ * 0.5;
      auVar20._20_4_ = fVar207 * fVar207 * fVar207 * auVar124._20_4_ * 0.5;
      auVar20._24_4_ = fVar208 * fVar208 * fVar208 * auVar124._24_4_ * 0.5;
      auVar20._28_4_ = auVar124._28_4_;
      auVar282 = vsubps_avx(auVar19,auVar20);
      fVar269 = auVar282._0_4_;
      fVar235 = auVar282._4_4_;
      fVar203 = auVar282._8_4_;
      fVar205 = auVar282._12_4_;
      fVar206 = auVar282._16_4_;
      fVar207 = auVar282._20_4_;
      fVar208 = auVar282._24_4_;
      fVar261 = fVar116 * fVar261 * fVar225;
      fVar234 = fVar131 * fVar234 * fVar199;
      auVar24._4_4_ = fVar234;
      auVar24._0_4_ = fVar261;
      fVar201 = fVar134 * fVar201 * fVar273;
      auVar24._8_4_ = fVar201;
      fVar299 = fVar137 * fVar299 * fVar298;
      auVar24._12_4_ = fVar299;
      fVar257 = fVar140 * fVar257 * fVar270;
      auVar24._16_4_ = fVar257;
      fVar258 = fVar143 * fVar258 * fVar274;
      auVar24._20_4_ = fVar258;
      fVar259 = fVar146 * fVar259 * fVar276;
      auVar24._24_4_ = fVar259;
      auVar24._28_4_ = fVar260;
      local_660._4_4_ = auVar295._4_4_ + fVar234;
      local_660._0_4_ = auVar295._0_4_ + fVar261;
      fStack_658 = auVar295._8_4_ + fVar201;
      fStack_654 = auVar295._12_4_ + fVar299;
      fStack_650 = auVar295._16_4_ + fVar257;
      fStack_64c = auVar295._20_4_ + fVar258;
      fStack_648 = auVar295._24_4_ + fVar259;
      fStack_644 = auVar295._28_4_ + fVar260;
      fVar261 = fVar116 * fVar225 * -fVar290;
      fVar234 = fVar131 * fVar199 * -fVar132;
      auVar25._4_4_ = fVar234;
      auVar25._0_4_ = fVar261;
      fVar201 = fVar134 * fVar273 * -fVar135;
      auVar25._8_4_ = fVar201;
      fVar299 = fVar137 * fVar298 * -fVar138;
      auVar25._12_4_ = fVar299;
      fVar257 = fVar140 * fVar270 * -fVar141;
      auVar25._16_4_ = fVar257;
      fVar258 = fVar143 * fVar274 * -fVar144;
      auVar25._20_4_ = fVar258;
      fVar259 = fVar146 * fVar276 * -fVar117;
      auVar25._24_4_ = fVar259;
      auVar25._28_4_ = fVar170;
      local_680._4_4_ = fVar234 + auVar266._4_4_;
      local_680._0_4_ = fVar261 + auVar266._0_4_;
      fStack_678 = fVar201 + auVar266._8_4_;
      fStack_674 = fVar299 + auVar266._12_4_;
      auStack_670._0_4_ = fVar257 + auVar266._16_4_;
      auStack_670._4_4_ = fVar258 + auVar266._20_4_;
      fStack_668 = fVar259 + auVar266._24_4_;
      fStack_664 = fVar170 + auVar266._28_4_;
      fVar261 = fVar116 * fVar225 * 0.0;
      fVar225 = fVar131 * fVar199 * 0.0;
      auVar26._4_4_ = fVar225;
      auVar26._0_4_ = fVar261;
      fVar234 = fVar134 * fVar273 * 0.0;
      auVar26._8_4_ = fVar234;
      fVar199 = fVar137 * fVar298 * 0.0;
      auVar26._12_4_ = fVar199;
      fVar201 = fVar140 * fVar270 * 0.0;
      auVar26._16_4_ = fVar201;
      fVar273 = fVar143 * fVar274 * 0.0;
      auVar26._20_4_ = fVar273;
      fVar299 = fVar146 * fVar276 * 0.0;
      auVar26._24_4_ = fVar299;
      auVar26._28_4_ = fVar294;
      auVar99._4_4_ = fStack_63c;
      auVar99._0_4_ = local_640;
      auVar99._8_4_ = fStack_638;
      auVar99._12_4_ = fStack_634;
      auVar99._16_4_ = fStack_630;
      auVar99._20_4_ = fStack_62c;
      auVar99._24_4_ = fStack_628;
      auVar99._28_4_ = fStack_624;
      auVar242._0_4_ = fVar261 + local_640;
      auVar242._4_4_ = fVar225 + fStack_63c;
      auVar242._8_4_ = fVar234 + fStack_638;
      auVar242._12_4_ = fVar199 + fStack_634;
      auVar242._16_4_ = fVar201 + fStack_630;
      auVar242._20_4_ = fVar273 + fStack_62c;
      auVar242._24_4_ = fVar299 + fStack_628;
      auVar242._28_4_ = fVar294 + fStack_624;
      fVar261 = auVar228._0_4_ * fVar185 * fVar269;
      fVar225 = auVar228._4_4_ * fVar271 * fVar235;
      auVar27._4_4_ = fVar225;
      auVar27._0_4_ = fVar261;
      fVar185 = auVar228._8_4_ * fVar236 * fVar203;
      auVar27._8_4_ = fVar185;
      fVar234 = auVar228._12_4_ * fVar262 * fVar205;
      auVar27._12_4_ = fVar234;
      fVar199 = auVar228._16_4_ * fVar272 * fVar206;
      auVar27._16_4_ = fVar199;
      fVar271 = auVar228._20_4_ * fVar275 * fVar207;
      auVar27._20_4_ = fVar271;
      fVar201 = auVar228._24_4_ * fVar277 * fVar208;
      auVar27._24_4_ = fVar201;
      auVar27._28_4_ = auVar16._28_4_;
      auVar21 = vsubps_avx(auVar295,auVar24);
      auVar281._0_4_ = auVar301._0_4_ + fVar261;
      auVar281._4_4_ = auVar301._4_4_ + fVar225;
      auVar281._8_4_ = auVar301._8_4_ + fVar185;
      auVar281._12_4_ = auVar301._12_4_ + fVar234;
      auVar281._16_4_ = auVar301._16_4_ + fVar199;
      auVar281._20_4_ = auVar301._20_4_ + fVar271;
      auVar281._24_4_ = auVar301._24_4_ + fVar201;
      auVar281._28_4_ = auVar301._28_4_ + auVar16._28_4_;
      fVar261 = auVar228._0_4_ * fVar269 * -fVar133;
      fVar225 = auVar228._4_4_ * fVar235 * -fVar136;
      auVar16._4_4_ = fVar225;
      auVar16._0_4_ = fVar261;
      fVar185 = auVar228._8_4_ * fVar203 * -fVar139;
      auVar16._8_4_ = fVar185;
      fVar234 = auVar228._12_4_ * fVar205 * -fVar142;
      auVar16._12_4_ = fVar234;
      fVar199 = auVar228._16_4_ * fVar206 * -fVar145;
      auVar16._16_4_ = fVar199;
      fVar271 = auVar228._20_4_ * fVar207 * -fVar147;
      auVar16._20_4_ = fVar271;
      fVar201 = auVar228._24_4_ * fVar208 * -fVar149;
      auVar16._24_4_ = fVar201;
      auVar16._28_4_ = fVar319;
      auVar194 = vsubps_avx(auVar266,auVar25);
      auVar291._0_4_ = fVar261 + auVar193._0_4_;
      auVar291._4_4_ = fVar225 + auVar193._4_4_;
      auVar291._8_4_ = fVar185 + auVar193._8_4_;
      auVar291._12_4_ = fVar234 + auVar193._12_4_;
      auVar291._16_4_ = fVar199 + auVar193._16_4_;
      auVar291._20_4_ = fVar271 + auVar193._20_4_;
      auVar291._24_4_ = fVar201 + auVar193._24_4_;
      auVar291._28_4_ = fVar319 + auVar193._28_4_;
      fVar261 = auVar228._0_4_ * fVar269 * 0.0;
      fVar225 = auVar228._4_4_ * fVar235 * 0.0;
      auVar28._4_4_ = fVar225;
      auVar28._0_4_ = fVar261;
      fVar185 = auVar228._8_4_ * fVar203 * 0.0;
      auVar28._8_4_ = fVar185;
      fVar269 = auVar228._12_4_ * fVar205 * 0.0;
      auVar28._12_4_ = fVar269;
      fVar234 = auVar228._16_4_ * fVar206 * 0.0;
      auVar28._16_4_ = fVar234;
      fVar199 = auVar228._20_4_ * fVar207 * 0.0;
      auVar28._20_4_ = fVar199;
      fVar271 = auVar228._24_4_ * fVar208 * 0.0;
      auVar28._24_4_ = fVar271;
      auVar28._28_4_ = 0x3f000000;
      auVar295 = vsubps_avx(auVar99,auVar26);
      auVar321._0_4_ = fVar261 + (float)local_5a0._0_4_;
      auVar321._4_4_ = fVar225 + (float)local_5a0._4_4_;
      auVar321._8_4_ = fVar185 + fStack_598;
      auVar321._12_4_ = fVar269 + fStack_594;
      auVar321._16_4_ = fVar234 + fStack_590;
      auVar321._20_4_ = fVar199 + fStack_58c;
      auVar321._24_4_ = fVar271 + fStack_588;
      auVar321._28_4_ = fStack_584 + 0.5;
      auVar282 = vsubps_avx(auVar301,auVar27);
      auVar18 = vsubps_avx(auVar193,auVar16);
      auVar22 = vsubps_avx(_local_5a0,auVar28);
      auVar16 = vsubps_avx(auVar291,auVar194);
      auVar17 = vsubps_avx(auVar321,auVar295);
      auVar29._4_4_ = auVar295._4_4_ * auVar16._4_4_;
      auVar29._0_4_ = auVar295._0_4_ * auVar16._0_4_;
      auVar29._8_4_ = auVar295._8_4_ * auVar16._8_4_;
      auVar29._12_4_ = auVar295._12_4_ * auVar16._12_4_;
      auVar29._16_4_ = auVar295._16_4_ * auVar16._16_4_;
      auVar29._20_4_ = auVar295._20_4_ * auVar16._20_4_;
      auVar29._24_4_ = auVar295._24_4_ * auVar16._24_4_;
      auVar29._28_4_ = auVar301._28_4_;
      auVar30._4_4_ = auVar194._4_4_ * auVar17._4_4_;
      auVar30._0_4_ = auVar194._0_4_ * auVar17._0_4_;
      auVar30._8_4_ = auVar194._8_4_ * auVar17._8_4_;
      auVar30._12_4_ = auVar194._12_4_ * auVar17._12_4_;
      auVar30._16_4_ = auVar194._16_4_ * auVar17._16_4_;
      auVar30._20_4_ = auVar194._20_4_ * auVar17._20_4_;
      auVar30._24_4_ = auVar194._24_4_ * auVar17._24_4_;
      auVar30._28_4_ = fStack_584;
      auVar23 = vsubps_avx(auVar30,auVar29);
      auVar31._4_4_ = auVar21._4_4_ * auVar17._4_4_;
      auVar31._0_4_ = auVar21._0_4_ * auVar17._0_4_;
      auVar31._8_4_ = auVar21._8_4_ * auVar17._8_4_;
      auVar31._12_4_ = auVar21._12_4_ * auVar17._12_4_;
      auVar31._16_4_ = auVar21._16_4_ * auVar17._16_4_;
      auVar31._20_4_ = auVar21._20_4_ * auVar17._20_4_;
      auVar31._24_4_ = auVar21._24_4_ * auVar17._24_4_;
      auVar31._28_4_ = auVar17._28_4_;
      auVar14 = vsubps_avx(auVar281,auVar21);
      auVar32._4_4_ = auVar295._4_4_ * auVar14._4_4_;
      auVar32._0_4_ = auVar295._0_4_ * auVar14._0_4_;
      auVar32._8_4_ = auVar295._8_4_ * auVar14._8_4_;
      auVar32._12_4_ = auVar295._12_4_ * auVar14._12_4_;
      auVar32._16_4_ = auVar295._16_4_ * auVar14._16_4_;
      auVar32._20_4_ = auVar295._20_4_ * auVar14._20_4_;
      auVar32._24_4_ = auVar295._24_4_ * auVar14._24_4_;
      auVar32._28_4_ = auVar193._28_4_;
      auVar193 = vsubps_avx(auVar32,auVar31);
      auVar33._4_4_ = auVar14._4_4_ * auVar194._4_4_;
      auVar33._0_4_ = auVar14._0_4_ * auVar194._0_4_;
      auVar33._8_4_ = auVar14._8_4_ * auVar194._8_4_;
      auVar33._12_4_ = auVar14._12_4_ * auVar194._12_4_;
      auVar33._16_4_ = auVar14._16_4_ * auVar194._16_4_;
      auVar33._20_4_ = auVar14._20_4_ * auVar194._20_4_;
      auVar33._24_4_ = auVar14._24_4_ * auVar194._24_4_;
      auVar33._28_4_ = auVar17._28_4_;
      auVar34._4_4_ = auVar21._4_4_ * auVar16._4_4_;
      auVar34._0_4_ = auVar21._0_4_ * auVar16._0_4_;
      auVar34._8_4_ = auVar21._8_4_ * auVar16._8_4_;
      auVar34._12_4_ = auVar21._12_4_ * auVar16._12_4_;
      auVar34._16_4_ = auVar21._16_4_ * auVar16._16_4_;
      auVar34._20_4_ = auVar21._20_4_ * auVar16._20_4_;
      auVar34._24_4_ = auVar21._24_4_ * auVar16._24_4_;
      auVar34._28_4_ = auVar16._28_4_;
      auVar16 = vsubps_avx(auVar34,auVar33);
      auVar125._0_4_ = auVar23._0_4_ * 0.0 + auVar16._0_4_ + auVar193._0_4_ * 0.0;
      auVar125._4_4_ = auVar23._4_4_ * 0.0 + auVar16._4_4_ + auVar193._4_4_ * 0.0;
      auVar125._8_4_ = auVar23._8_4_ * 0.0 + auVar16._8_4_ + auVar193._8_4_ * 0.0;
      auVar125._12_4_ = auVar23._12_4_ * 0.0 + auVar16._12_4_ + auVar193._12_4_ * 0.0;
      auVar125._16_4_ = auVar23._16_4_ * 0.0 + auVar16._16_4_ + auVar193._16_4_ * 0.0;
      auVar125._20_4_ = auVar23._20_4_ * 0.0 + auVar16._20_4_ + auVar193._20_4_ * 0.0;
      auVar125._24_4_ = auVar23._24_4_ * 0.0 + auVar16._24_4_ + auVar193._24_4_ * 0.0;
      auVar125._28_4_ = auVar16._28_4_ + auVar16._28_4_ + auVar193._28_4_;
      auVar266 = vcmpps_avx(auVar125,ZEXT432(0) << 0x20,2);
      auVar282 = vblendvps_avx(auVar282,_local_660,auVar266);
      auVar18 = vblendvps_avx(auVar18,_local_680,auVar266);
      auVar16 = vblendvps_avx(auVar22,auVar242,auVar266);
      auVar17 = vblendvps_avx(auVar21,auVar281,auVar266);
      auVar23 = vblendvps_avx(auVar194,auVar291,auVar266);
      auVar14 = vblendvps_avx(auVar295,auVar321,auVar266);
      auVar21 = vblendvps_avx(auVar281,auVar21,auVar266);
      auVar193 = vblendvps_avx(auVar291,auVar194,auVar266);
      auVar191 = vpackssdw_avx(local_4c0._0_16_,local_4c0._16_16_);
      auVar194 = vblendvps_avx(auVar321,auVar295,auVar266);
      auVar21 = vsubps_avx(auVar21,auVar282);
      auVar295 = vsubps_avx(auVar193,auVar18);
      auVar194 = vsubps_avx(auVar194,auVar16);
      auVar19 = vsubps_avx(auVar18,auVar23);
      fVar261 = auVar295._0_4_;
      fVar117 = auVar16._0_4_;
      fVar199 = auVar295._4_4_;
      fVar133 = auVar16._4_4_;
      auVar35._4_4_ = fVar133 * fVar199;
      auVar35._0_4_ = fVar117 * fVar261;
      fVar236 = auVar295._8_4_;
      fVar136 = auVar16._8_4_;
      auVar35._8_4_ = fVar136 * fVar236;
      fVar205 = auVar295._12_4_;
      fVar139 = auVar16._12_4_;
      auVar35._12_4_ = fVar139 * fVar205;
      fVar258 = auVar295._16_4_;
      fVar142 = auVar16._16_4_;
      auVar35._16_4_ = fVar142 * fVar258;
      fVar276 = auVar295._20_4_;
      fVar145 = auVar16._20_4_;
      auVar35._20_4_ = fVar145 * fVar276;
      fVar132 = auVar295._24_4_;
      fVar147 = auVar16._24_4_;
      auVar35._24_4_ = fVar147 * fVar132;
      auVar35._28_4_ = auVar193._28_4_;
      fVar225 = auVar18._0_4_;
      fVar224 = auVar194._0_4_;
      fVar271 = auVar18._4_4_;
      fVar237 = auVar194._4_4_;
      auVar36._4_4_ = fVar237 * fVar271;
      auVar36._0_4_ = fVar224 * fVar225;
      fVar203 = auVar18._8_4_;
      fVar245 = auVar194._8_4_;
      auVar36._8_4_ = fVar245 * fVar203;
      fVar257 = auVar18._12_4_;
      fVar246 = auVar194._12_4_;
      auVar36._12_4_ = fVar246 * fVar257;
      fVar274 = auVar18._16_4_;
      fVar247 = auVar194._16_4_;
      auVar36._16_4_ = fVar247 * fVar274;
      fVar277 = auVar18._20_4_;
      fVar249 = auVar194._20_4_;
      auVar36._20_4_ = fVar249 * fVar277;
      fVar135 = auVar18._24_4_;
      fVar256 = auVar194._24_4_;
      uVar113 = auVar22._28_4_;
      auVar36._24_4_ = fVar256 * fVar135;
      auVar36._28_4_ = uVar113;
      auVar18 = vsubps_avx(auVar36,auVar35);
      fVar185 = auVar282._0_4_;
      fVar235 = auVar282._4_4_;
      auVar37._4_4_ = fVar237 * fVar235;
      auVar37._0_4_ = fVar224 * fVar185;
      fVar299 = auVar282._8_4_;
      auVar37._8_4_ = fVar245 * fVar299;
      fVar270 = auVar282._12_4_;
      auVar37._12_4_ = fVar246 * fVar270;
      fVar275 = auVar282._16_4_;
      auVar37._16_4_ = fVar247 * fVar275;
      fVar208 = auVar282._20_4_;
      auVar37._20_4_ = fVar249 * fVar208;
      fVar138 = auVar282._24_4_;
      auVar37._24_4_ = fVar256 * fVar138;
      auVar37._28_4_ = uVar113;
      fVar269 = auVar21._0_4_;
      fVar201 = auVar21._4_4_;
      auVar38._4_4_ = fVar133 * fVar201;
      auVar38._0_4_ = fVar117 * fVar269;
      fVar298 = auVar21._8_4_;
      auVar38._8_4_ = fVar136 * fVar298;
      fVar272 = auVar21._12_4_;
      auVar38._12_4_ = fVar139 * fVar272;
      fVar207 = auVar21._16_4_;
      auVar38._16_4_ = fVar142 * fVar207;
      fVar170 = auVar21._20_4_;
      auVar38._20_4_ = fVar145 * fVar170;
      fVar141 = auVar21._24_4_;
      auVar38._24_4_ = fVar147 * fVar141;
      auVar38._28_4_ = auVar321._28_4_;
      auVar193 = vsubps_avx(auVar38,auVar37);
      auVar39._4_4_ = fVar271 * fVar201;
      auVar39._0_4_ = fVar225 * fVar269;
      auVar39._8_4_ = fVar203 * fVar298;
      auVar39._12_4_ = fVar257 * fVar272;
      auVar39._16_4_ = fVar274 * fVar207;
      auVar39._20_4_ = fVar277 * fVar170;
      auVar39._24_4_ = fVar135 * fVar141;
      auVar39._28_4_ = uVar113;
      auVar326._0_4_ = fVar185 * fVar261;
      auVar326._4_4_ = fVar235 * fVar199;
      auVar326._8_4_ = fVar299 * fVar236;
      auVar326._12_4_ = fVar270 * fVar205;
      auVar326._16_4_ = fVar275 * fVar258;
      auVar326._20_4_ = fVar208 * fVar276;
      auVar326._24_4_ = fVar138 * fVar132;
      auVar326._28_4_ = 0;
      auVar22 = vsubps_avx(auVar326,auVar39);
      auVar20 = vsubps_avx(auVar16,auVar14);
      fVar234 = auVar22._28_4_ + auVar193._28_4_;
      auVar156._0_4_ = auVar22._0_4_ + auVar193._0_4_ * 0.0 + auVar18._0_4_ * 0.0;
      auVar156._4_4_ = auVar22._4_4_ + auVar193._4_4_ * 0.0 + auVar18._4_4_ * 0.0;
      auVar156._8_4_ = auVar22._8_4_ + auVar193._8_4_ * 0.0 + auVar18._8_4_ * 0.0;
      auVar156._12_4_ = auVar22._12_4_ + auVar193._12_4_ * 0.0 + auVar18._12_4_ * 0.0;
      auVar156._16_4_ = auVar22._16_4_ + auVar193._16_4_ * 0.0 + auVar18._16_4_ * 0.0;
      auVar156._20_4_ = auVar22._20_4_ + auVar193._20_4_ * 0.0 + auVar18._20_4_ * 0.0;
      auVar156._24_4_ = auVar22._24_4_ + auVar193._24_4_ * 0.0 + auVar18._24_4_ * 0.0;
      auVar156._28_4_ = fVar234 + auVar18._28_4_;
      fVar149 = auVar19._0_4_;
      fVar260 = auVar19._4_4_;
      auVar40._4_4_ = fVar260 * auVar14._4_4_;
      auVar40._0_4_ = fVar149 * auVar14._0_4_;
      fVar164 = auVar19._8_4_;
      auVar40._8_4_ = fVar164 * auVar14._8_4_;
      fVar165 = auVar19._12_4_;
      auVar40._12_4_ = fVar165 * auVar14._12_4_;
      fVar166 = auVar19._16_4_;
      auVar40._16_4_ = fVar166 * auVar14._16_4_;
      fVar167 = auVar19._20_4_;
      auVar40._20_4_ = fVar167 * auVar14._20_4_;
      fVar168 = auVar19._24_4_;
      auVar40._24_4_ = fVar168 * auVar14._24_4_;
      auVar40._28_4_ = fVar234;
      fVar234 = auVar20._0_4_;
      fVar273 = auVar20._4_4_;
      auVar41._4_4_ = auVar23._4_4_ * fVar273;
      auVar41._0_4_ = auVar23._0_4_ * fVar234;
      fVar262 = auVar20._8_4_;
      auVar41._8_4_ = auVar23._8_4_ * fVar262;
      fVar206 = auVar20._12_4_;
      auVar41._12_4_ = auVar23._12_4_ * fVar206;
      fVar259 = auVar20._16_4_;
      auVar41._16_4_ = auVar23._16_4_ * fVar259;
      fVar290 = auVar20._20_4_;
      auVar41._20_4_ = auVar23._20_4_ * fVar290;
      fVar144 = auVar20._24_4_;
      auVar41._24_4_ = auVar23._24_4_ * fVar144;
      auVar41._28_4_ = auVar22._28_4_;
      auVar193 = vsubps_avx(auVar41,auVar40);
      auVar22 = vsubps_avx(auVar282,auVar17);
      fVar169 = auVar22._0_4_;
      fVar248 = auVar22._4_4_;
      auVar42._4_4_ = fVar248 * auVar14._4_4_;
      auVar42._0_4_ = fVar169 * auVar14._0_4_;
      fVar278 = auVar22._8_4_;
      auVar42._8_4_ = fVar278 * auVar14._8_4_;
      fVar286 = auVar22._12_4_;
      auVar42._12_4_ = fVar286 * auVar14._12_4_;
      fVar287 = auVar22._16_4_;
      auVar42._16_4_ = fVar287 * auVar14._16_4_;
      fVar288 = auVar22._20_4_;
      auVar42._20_4_ = fVar288 * auVar14._20_4_;
      fVar289 = auVar22._24_4_;
      auVar42._24_4_ = fVar289 * auVar14._24_4_;
      auVar42._28_4_ = auVar14._28_4_;
      auVar43._4_4_ = auVar17._4_4_ * fVar273;
      auVar43._0_4_ = auVar17._0_4_ * fVar234;
      auVar43._8_4_ = auVar17._8_4_ * fVar262;
      auVar43._12_4_ = auVar17._12_4_ * fVar206;
      auVar43._16_4_ = auVar17._16_4_ * fVar259;
      auVar43._20_4_ = auVar17._20_4_ * fVar290;
      auVar43._24_4_ = auVar17._24_4_ * fVar144;
      auVar43._28_4_ = auVar18._28_4_;
      auVar18 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = auVar23._4_4_ * fVar248;
      auVar44._0_4_ = auVar23._0_4_ * fVar169;
      auVar44._8_4_ = auVar23._8_4_ * fVar278;
      auVar44._12_4_ = auVar23._12_4_ * fVar286;
      auVar44._16_4_ = auVar23._16_4_ * fVar287;
      auVar44._20_4_ = auVar23._20_4_ * fVar288;
      auVar44._24_4_ = auVar23._24_4_ * fVar289;
      auVar44._28_4_ = auVar14._28_4_;
      auVar45._4_4_ = auVar17._4_4_ * fVar260;
      auVar45._0_4_ = auVar17._0_4_ * fVar149;
      auVar45._8_4_ = auVar17._8_4_ * fVar164;
      auVar45._12_4_ = auVar17._12_4_ * fVar165;
      auVar45._16_4_ = auVar17._16_4_ * fVar166;
      auVar45._20_4_ = auVar17._20_4_ * fVar167;
      auVar45._24_4_ = auVar17._24_4_ * fVar168;
      auVar45._28_4_ = auVar17._28_4_;
      auVar17 = vsubps_avx(auVar45,auVar44);
      auVar217._0_4_ = auVar193._0_4_ * 0.0 + auVar17._0_4_ + auVar18._0_4_ * 0.0;
      auVar217._4_4_ = auVar193._4_4_ * 0.0 + auVar17._4_4_ + auVar18._4_4_ * 0.0;
      auVar217._8_4_ = auVar193._8_4_ * 0.0 + auVar17._8_4_ + auVar18._8_4_ * 0.0;
      auVar217._12_4_ = auVar193._12_4_ * 0.0 + auVar17._12_4_ + auVar18._12_4_ * 0.0;
      auVar217._16_4_ = auVar193._16_4_ * 0.0 + auVar17._16_4_ + auVar18._16_4_ * 0.0;
      auVar217._20_4_ = auVar193._20_4_ * 0.0 + auVar17._20_4_ + auVar18._20_4_ * 0.0;
      auVar217._24_4_ = auVar193._24_4_ * 0.0 + auVar17._24_4_ + auVar18._24_4_ * 0.0;
      auVar217._28_4_ = auVar17._28_4_ + auVar17._28_4_ + auVar18._28_4_;
      auVar18 = vmaxps_avx(auVar156,auVar217);
      auVar18 = vcmpps_avx(auVar18,ZEXT832(0) << 0x20,2);
      auVar174 = vpackssdw_avx(auVar18._0_16_,auVar18._16_16_);
      auVar191 = vpand_avx(auVar174,auVar191);
      auVar174 = vpmovsxwd_avx(auVar191);
      auVar192 = vpunpckhwd_avx(auVar191,auVar191);
      auVar195._16_16_ = auVar192;
      auVar195._0_16_ = auVar174;
      if ((((((((auVar195 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar195 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar195 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar195 >> 0x7f,0) == '\0') &&
            (auVar195 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar192 >> 0x3f,0) == '\0') &&
          (auVar195 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar192[0xf]
         ) {
LAB_0079b39e:
        auVar198 = ZEXT3264(auVar195);
        auVar231._8_8_ = uStack_5b8;
        auVar231._0_8_ = local_5c0;
        auVar231._16_8_ = uStack_5b0;
        auVar231._24_8_ = uStack_5a8;
        auVar307 = ZEXT3264(auVar161);
        auVar285 = ZEXT3264(auVar218);
        auVar268 = ZEXT3264(CONCAT428(fVar148,CONCAT424(fVar146,CONCAT420(fVar143,CONCAT416(fVar140,
                                                  CONCAT412(fVar137,CONCAT48(fVar134,CONCAT44(
                                                  fVar131,fVar116))))))));
      }
      else {
        auVar46._4_4_ = fVar273 * fVar199;
        auVar46._0_4_ = fVar234 * fVar261;
        auVar46._8_4_ = fVar262 * fVar236;
        auVar46._12_4_ = fVar206 * fVar205;
        auVar46._16_4_ = fVar259 * fVar258;
        auVar46._20_4_ = fVar290 * fVar276;
        auVar46._24_4_ = fVar144 * fVar132;
        auVar46._28_4_ = auVar192._12_4_;
        auVar302._0_4_ = fVar149 * fVar224;
        auVar302._4_4_ = fVar260 * fVar237;
        auVar302._8_4_ = fVar164 * fVar245;
        auVar302._12_4_ = fVar165 * fVar246;
        auVar302._16_4_ = fVar166 * fVar247;
        auVar302._20_4_ = fVar167 * fVar249;
        auVar302._24_4_ = fVar168 * fVar256;
        auVar302._28_4_ = 0;
        auVar18 = vsubps_avx(auVar302,auVar46);
        auVar47._4_4_ = fVar248 * fVar237;
        auVar47._0_4_ = fVar169 * fVar224;
        auVar47._8_4_ = fVar278 * fVar245;
        auVar47._12_4_ = fVar286 * fVar246;
        auVar47._16_4_ = fVar287 * fVar247;
        auVar47._20_4_ = fVar288 * fVar249;
        auVar47._24_4_ = fVar289 * fVar256;
        auVar47._28_4_ = auVar194._28_4_;
        auVar48._4_4_ = fVar273 * fVar201;
        auVar48._0_4_ = fVar234 * fVar269;
        auVar48._8_4_ = fVar262 * fVar298;
        auVar48._12_4_ = fVar206 * fVar272;
        auVar48._16_4_ = fVar259 * fVar207;
        auVar48._20_4_ = fVar290 * fVar170;
        auVar48._24_4_ = fVar144 * fVar141;
        auVar48._28_4_ = auVar20._28_4_;
        auVar23 = vsubps_avx(auVar48,auVar47);
        auVar49._4_4_ = fVar260 * fVar201;
        auVar49._0_4_ = fVar149 * fVar269;
        auVar49._8_4_ = fVar164 * fVar298;
        auVar49._12_4_ = fVar165 * fVar272;
        auVar49._16_4_ = fVar166 * fVar207;
        auVar49._20_4_ = fVar167 * fVar170;
        auVar49._24_4_ = fVar168 * fVar141;
        auVar49._28_4_ = auVar156._28_4_;
        auVar50._4_4_ = fVar248 * fVar199;
        auVar50._0_4_ = fVar169 * fVar261;
        auVar50._8_4_ = fVar278 * fVar236;
        auVar50._12_4_ = fVar286 * fVar205;
        auVar50._16_4_ = fVar287 * fVar258;
        auVar50._20_4_ = fVar288 * fVar276;
        auVar50._24_4_ = fVar289 * fVar132;
        auVar50._28_4_ = auVar295._28_4_;
        auVar14 = vsubps_avx(auVar50,auVar49);
        auVar254._0_4_ = auVar18._0_4_ * 0.0 + auVar14._0_4_ + auVar23._0_4_ * 0.0;
        auVar254._4_4_ = auVar18._4_4_ * 0.0 + auVar14._4_4_ + auVar23._4_4_ * 0.0;
        auVar254._8_4_ = auVar18._8_4_ * 0.0 + auVar14._8_4_ + auVar23._8_4_ * 0.0;
        auVar254._12_4_ = auVar18._12_4_ * 0.0 + auVar14._12_4_ + auVar23._12_4_ * 0.0;
        auVar254._16_4_ = auVar18._16_4_ * 0.0 + auVar14._16_4_ + auVar23._16_4_ * 0.0;
        auVar254._20_4_ = auVar18._20_4_ * 0.0 + auVar14._20_4_ + auVar23._20_4_ * 0.0;
        auVar254._24_4_ = auVar18._24_4_ * 0.0 + auVar14._24_4_ + auVar23._24_4_ * 0.0;
        auVar254._28_4_ = auVar295._28_4_ + auVar14._28_4_ + auVar156._28_4_;
        auVar17 = vrcpps_avx(auVar254);
        fVar261 = auVar17._0_4_;
        fVar269 = auVar17._4_4_;
        auVar51._4_4_ = auVar254._4_4_ * fVar269;
        auVar51._0_4_ = auVar254._0_4_ * fVar261;
        fVar234 = auVar17._8_4_;
        auVar51._8_4_ = auVar254._8_4_ * fVar234;
        fVar199 = auVar17._12_4_;
        auVar51._12_4_ = auVar254._12_4_ * fVar199;
        fVar201 = auVar17._16_4_;
        auVar51._16_4_ = auVar254._16_4_ * fVar201;
        fVar273 = auVar17._20_4_;
        auVar51._20_4_ = auVar254._20_4_ * fVar273;
        fVar236 = auVar17._24_4_;
        auVar51._24_4_ = auVar254._24_4_ * fVar236;
        auVar51._28_4_ = auVar20._28_4_;
        auVar303._8_4_ = 0x3f800000;
        auVar303._0_8_ = 0x3f8000003f800000;
        auVar303._12_4_ = 0x3f800000;
        auVar303._16_4_ = 0x3f800000;
        auVar303._20_4_ = 0x3f800000;
        auVar303._24_4_ = 0x3f800000;
        auVar303._28_4_ = 0x3f800000;
        auVar193 = vsubps_avx(auVar303,auVar51);
        fVar261 = auVar193._0_4_ * fVar261 + fVar261;
        fVar269 = auVar193._4_4_ * fVar269 + fVar269;
        fVar234 = auVar193._8_4_ * fVar234 + fVar234;
        fVar199 = auVar193._12_4_ * fVar199 + fVar199;
        fVar201 = auVar193._16_4_ * fVar201 + fVar201;
        fVar273 = auVar193._20_4_ * fVar273 + fVar273;
        fVar236 = auVar193._24_4_ * fVar236 + fVar236;
        auVar52._4_4_ =
             (auVar18._4_4_ * fVar235 + auVar23._4_4_ * fVar271 + auVar14._4_4_ * fVar133) * fVar269
        ;
        auVar52._0_4_ =
             (auVar18._0_4_ * fVar185 + auVar23._0_4_ * fVar225 + auVar14._0_4_ * fVar117) * fVar261
        ;
        auVar52._8_4_ =
             (auVar18._8_4_ * fVar299 + auVar23._8_4_ * fVar203 + auVar14._8_4_ * fVar136) * fVar234
        ;
        auVar52._12_4_ =
             (auVar18._12_4_ * fVar270 + auVar23._12_4_ * fVar257 + auVar14._12_4_ * fVar139) *
             fVar199;
        auVar52._16_4_ =
             (auVar18._16_4_ * fVar275 + auVar23._16_4_ * fVar274 + auVar14._16_4_ * fVar142) *
             fVar201;
        auVar52._20_4_ =
             (auVar18._20_4_ * fVar208 + auVar23._20_4_ * fVar277 + auVar14._20_4_ * fVar145) *
             fVar273;
        auVar52._24_4_ =
             (auVar18._24_4_ * fVar138 + auVar23._24_4_ * fVar135 + auVar14._24_4_ * fVar147) *
             fVar236;
        auVar52._28_4_ = auVar282._28_4_ + auVar21._28_4_ + auVar16._28_4_;
        auVar174 = vpermilps_avx(ZEXT416(uVar9),0);
        auVar196._16_16_ = auVar174;
        auVar196._0_16_ = auVar174;
        auVar282 = vcmpps_avx(auVar196,auVar52,2);
        uVar113 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar229._4_4_ = uVar113;
        auVar229._0_4_ = uVar113;
        auVar229._8_4_ = uVar113;
        auVar229._12_4_ = uVar113;
        auVar229._16_4_ = uVar113;
        auVar229._20_4_ = uVar113;
        auVar229._24_4_ = uVar113;
        auVar229._28_4_ = uVar113;
        auVar18 = vcmpps_avx(auVar52,auVar229,2);
        auVar282 = vandps_avx(auVar18,auVar282);
        auVar174 = vpackssdw_avx(auVar282._0_16_,auVar282._16_16_);
        auVar191 = vpand_avx(auVar191,auVar174);
        auVar174 = vpmovsxwd_avx(auVar191);
        auVar192 = vpshufd_avx(auVar191,0xee);
        auVar192 = vpmovsxwd_avx(auVar192);
        auVar195._16_16_ = auVar192;
        auVar195._0_16_ = auVar174;
        if ((((((((auVar195 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar195 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar195 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar195 >> 0x7f,0) == '\0') &&
              (auVar195 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar192 >> 0x3f,0) == '\0') &&
            (auVar195 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar192[0xf]) goto LAB_0079b39e;
        auVar282 = vcmpps_avx(ZEXT832(0) << 0x20,auVar254,4);
        auVar174 = vpackssdw_avx(auVar282._0_16_,auVar282._16_16_);
        auVar191 = vpand_avx(auVar191,auVar174);
        auVar174 = vpmovsxwd_avx(auVar191);
        auVar191 = vpunpckhwd_avx(auVar191,auVar191);
        auVar198 = ZEXT1664(auVar191);
        auVar243._16_16_ = auVar191;
        auVar243._0_16_ = auVar174;
        auVar231._8_8_ = uStack_5b8;
        auVar231._0_8_ = local_5c0;
        auVar231._16_8_ = uStack_5b0;
        auVar231._24_8_ = uStack_5a8;
        auVar307 = ZEXT3264(auVar161);
        auVar285 = ZEXT3264(auVar218);
        auVar268 = ZEXT3264(CONCAT428(fVar148,CONCAT424(fVar146,CONCAT420(fVar143,CONCAT416(fVar140,
                                                  CONCAT412(fVar137,CONCAT48(fVar134,CONCAT44(
                                                  fVar131,fVar116))))))));
        if ((((((((auVar243 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar243 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar243 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar243 >> 0x7f,0) != '\0') ||
              (auVar243 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar191 >> 0x3f,0) != '\0') ||
            (auVar243 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar191[0xf] < '\0') {
          auVar197._0_4_ = fVar261 * auVar156._0_4_;
          auVar197._4_4_ = fVar269 * auVar156._4_4_;
          auVar197._8_4_ = fVar234 * auVar156._8_4_;
          auVar197._12_4_ = fVar199 * auVar156._12_4_;
          auVar197._16_4_ = fVar201 * auVar156._16_4_;
          auVar197._20_4_ = fVar273 * auVar156._20_4_;
          auVar197._24_4_ = fVar236 * auVar156._24_4_;
          auVar197._28_4_ = 0;
          auVar161._4_4_ = auVar217._4_4_ * fVar269;
          auVar161._0_4_ = auVar217._0_4_ * fVar261;
          auVar161._8_4_ = auVar217._8_4_ * fVar234;
          auVar161._12_4_ = auVar217._12_4_ * fVar199;
          auVar161._16_4_ = auVar217._16_4_ * fVar201;
          auVar161._20_4_ = auVar217._20_4_ * fVar273;
          auVar161._24_4_ = auVar217._24_4_ * fVar236;
          auVar161._28_4_ = auVar193._28_4_ + auVar17._28_4_;
          auVar230._8_4_ = 0x3f800000;
          auVar230._0_8_ = 0x3f8000003f800000;
          auVar230._12_4_ = 0x3f800000;
          auVar230._16_4_ = 0x3f800000;
          auVar230._20_4_ = 0x3f800000;
          auVar230._24_4_ = 0x3f800000;
          auVar230._28_4_ = 0x3f800000;
          auVar218 = vsubps_avx(auVar230,auVar197);
          auVar218 = vblendvps_avx(auVar218,auVar197,auVar266);
          auVar307 = ZEXT3264(auVar218);
          auVar218 = vsubps_avx(auVar230,auVar161);
          auVar198 = ZEXT3264(auVar218);
          _local_4e0 = vblendvps_avx(auVar218,auVar161,auVar266);
          auVar285 = ZEXT3264(auVar52);
          auVar231 = auVar243;
        }
      }
      auVar314 = ZEXT3264(_local_7a0);
      if ((((((((auVar231 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar231 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar231 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar231 >> 0x7f,0) == '\0') &&
            (auVar231 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar231 >> 0xbf,0) == '\0') &&
          (auVar231 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar231[0x1f]) {
        pRVar106 = (RTCIntersectArguments *)0x0;
      }
      else {
        auVar218 = vsubps_avx(auVar228,auVar268._0_32_);
        fVar225 = auVar268._0_4_ + auVar307._0_4_ * auVar218._0_4_;
        fVar185 = auVar268._4_4_ + auVar307._4_4_ * auVar218._4_4_;
        fVar269 = auVar268._8_4_ + auVar307._8_4_ * auVar218._8_4_;
        fVar234 = auVar268._12_4_ + auVar307._12_4_ * auVar218._12_4_;
        fVar199 = auVar268._16_4_ + auVar307._16_4_ * auVar218._16_4_;
        fVar271 = auVar268._20_4_ + auVar307._20_4_ * auVar218._20_4_;
        fVar235 = auVar268._24_4_ + auVar307._24_4_ * auVar218._24_4_;
        fVar201 = auVar268._28_4_ + auVar218._28_4_;
        fVar261 = *(float *)((long)local_738->ray_space + k * 4 + -0x20);
        auVar218._4_4_ = (fVar185 + fVar185) * fVar261;
        auVar218._0_4_ = (fVar225 + fVar225) * fVar261;
        auVar218._8_4_ = (fVar269 + fVar269) * fVar261;
        auVar218._12_4_ = (fVar234 + fVar234) * fVar261;
        auVar218._16_4_ = (fVar199 + fVar199) * fVar261;
        auVar218._20_4_ = (fVar271 + fVar271) * fVar261;
        auVar218._24_4_ = (fVar235 + fVar235) * fVar261;
        auVar218._28_4_ = fVar201 + fVar201;
        auVar282 = auVar285._0_32_;
        auVar218 = vcmpps_avx(auVar282,auVar218,6);
        auVar161 = auVar231 & auVar218;
        auVar163 = ZEXT3264(auVar296);
        if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar161 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar161 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar161 >> 0x7f,0) == '\0') &&
              (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar161 >> 0xbf,0) == '\0') &&
            (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar161[0x1f]) {
          pRVar106 = (RTCIntersectArguments *)0x0;
        }
        else {
          local_380 = vandps_avx(auVar218,auVar231);
          local_420._0_4_ = (float)local_4e0._0_4_ + (float)local_4e0._0_4_ + -1.0;
          local_420._4_4_ = (float)local_4e0._4_4_ + (float)local_4e0._4_4_ + -1.0;
          fStack_418 = (float)uStack_4d8 + (float)uStack_4d8 + -1.0;
          fStack_414 = uStack_4d8._4_4_ + uStack_4d8._4_4_ + -1.0;
          fStack_410 = (float)uStack_4d0 + (float)uStack_4d0 + -1.0;
          fStack_40c = uStack_4d0._4_4_ + uStack_4d0._4_4_ + -1.0;
          fStack_408 = (float)uStack_4c8 + (float)uStack_4c8 + -1.0;
          fStack_404 = uStack_4c8._4_4_ + uStack_4c8._4_4_ + -1.0;
          local_6c0 = auVar307._0_32_;
          local_3e0 = 0;
          local_3d0 = local_930;
          fStack_3cc = fStack_92c;
          fStack_3c8 = fStack_928;
          fStack_3c4 = fStack_924;
          local_3c0 = local_760;
          uStack_3b8 = uStack_758;
          local_3b0 = local_690;
          uStack_3a8 = uStack_688;
          local_3a0 = local_6a0;
          uStack_398 = uStack_698;
          local_4e0._4_4_ = local_420._4_4_;
          local_4e0._0_4_ = local_420._0_4_;
          uStack_4d8._0_4_ = fStack_418;
          uStack_4d8._4_4_ = fStack_414;
          uStack_4d0._0_4_ = fStack_410;
          uStack_4d0._4_4_ = fStack_40c;
          auVar154 = _local_4e0;
          uStack_4c8._0_4_ = fStack_408;
          uStack_4c8._4_4_ = fStack_404;
          auVar218 = _local_4e0;
          if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
            pRVar106 = (RTCIntersectArguments *)0x0;
          }
          else {
            pRVar106 = context->args;
            if ((pRVar106->filter != (RTCFilterFunctionN)0x0) ||
               (pRVar106 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar106 >> 8),1),
               pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar173._0_4_ = 1.0 / auVar214._0_4_;
              auVar173._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar191 = vshufps_avx(auVar173,auVar173,0);
              local_360[0] = auVar191._0_4_ * (auVar307._0_4_ + 0.0);
              local_360[1] = auVar191._4_4_ * (auVar307._4_4_ + 1.0);
              local_360[2] = auVar191._8_4_ * (auVar307._8_4_ + 2.0);
              local_360[3] = auVar191._12_4_ * (auVar307._12_4_ + 3.0);
              fStack_350 = auVar191._0_4_ * (auVar307._16_4_ + 4.0);
              fStack_34c = auVar191._4_4_ * (auVar307._20_4_ + 5.0);
              fStack_348 = auVar191._8_4_ * (auVar307._24_4_ + 6.0);
              fStack_344 = auVar307._28_4_ + 7.0;
              uStack_4d0 = auVar154._16_8_;
              uStack_4c8 = auVar218._24_8_;
              local_340 = local_4e0;
              uStack_338 = uStack_4d8;
              uStack_330 = uStack_4d0;
              uStack_328 = uStack_4c8;
              local_320 = auVar282;
              uStack_8fc = (undefined4)((ulong)pRVar106 >> 0x20);
              local_900 = vmovmskps_avx(local_380);
              local_8a0 = 0;
              if (CONCAT44(uStack_8fc,local_900) != 0) {
                for (; (CONCAT44(uStack_8fc,local_900) >> local_8a0 & 1) == 0;
                    local_8a0 = local_8a0 + 1) {
                }
              }
              auVar191 = vpshufd_avx(ZEXT416(uVar110),0);
              local_600._16_16_ = auVar191;
              local_600._0_16_ = auVar191;
              auVar191 = vpermilps_avx(ZEXT416(*(uint *)(prim + lVar114 * 4 + 6)),0);
              register0x00001210 = auVar191;
              _local_780 = auVar191;
              _local_7c0 = auVar296;
              _local_620 = auVar301;
              _local_4e0 = auVar218;
              local_440 = local_6c0;
              local_400 = auVar282;
              local_3dc = uVar11;
              while( true ) {
                auVar296 = auVar163._0_32_;
                if (CONCAT44(uStack_8fc,local_900) == 0) break;
                uVar113 = *(undefined4 *)(ray + k * 4 + 0x100);
                local_200 = local_360[local_8a0];
                local_1e0 = *(undefined4 *)((long)&local_340 + local_8a0 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + local_8a0 * 4);
                fVar225 = 1.0 - local_200;
                fVar261 = local_200 * fVar225 + local_200 * fVar225;
                auVar191 = ZEXT416((uint)(local_200 * local_200 * 3.0));
                auVar191 = vshufps_avx(auVar191,auVar191,0);
                auVar174 = ZEXT416((uint)((fVar261 - local_200 * local_200) * 3.0));
                auVar174 = vshufps_avx(auVar174,auVar174,0);
                fVar185 = auVar191._0_4_ * (float)local_6a0._0_4_ +
                          auVar174._0_4_ * (float)local_690._0_4_;
                fVar269 = auVar191._4_4_ * (float)local_6a0._4_4_ +
                          auVar174._4_4_ * (float)local_690._4_4_;
                fVar234 = auVar191._8_4_ * (float)uStack_698 + auVar174._8_4_ * (float)uStack_688;
                fVar199 = auVar191._12_4_ * uStack_698._4_4_ + auVar174._12_4_ * uStack_688._4_4_;
                auVar191 = ZEXT416((uint)((fVar225 * fVar225 - fVar261) * 3.0));
                auVar191 = vshufps_avx(auVar191,auVar191,0);
                local_730.context = context->user;
                auVar174 = ZEXT416((uint)(fVar225 * fVar225 * -3.0));
                auVar174 = vshufps_avx(auVar174,auVar174,0);
                auVar175._0_4_ =
                     local_930 * auVar174._0_4_ + auVar191._0_4_ * (float)local_760._0_4_ + fVar185;
                auVar175._4_4_ =
                     fStack_92c * auVar174._4_4_ + auVar191._4_4_ * (float)local_760._4_4_ + fVar269
                ;
                auVar175._8_4_ =
                     fStack_928 * auVar174._8_4_ + auVar191._8_4_ * (float)uStack_758 + fVar234;
                auVar175._12_4_ =
                     fStack_924 * auVar174._12_4_ + auVar191._12_4_ * uStack_758._4_4_ + fVar199;
                local_250 = vshufps_avx(auVar175,auVar175,0);
                local_260[0] = (RTCHitN)local_250[0];
                local_260[1] = (RTCHitN)local_250[1];
                local_260[2] = (RTCHitN)local_250[2];
                local_260[3] = (RTCHitN)local_250[3];
                local_260[4] = (RTCHitN)local_250[4];
                local_260[5] = (RTCHitN)local_250[5];
                local_260[6] = (RTCHitN)local_250[6];
                local_260[7] = (RTCHitN)local_250[7];
                local_260[8] = (RTCHitN)local_250[8];
                local_260[9] = (RTCHitN)local_250[9];
                local_260[10] = (RTCHitN)local_250[10];
                local_260[0xb] = (RTCHitN)local_250[0xb];
                local_260[0xc] = (RTCHitN)local_250[0xc];
                local_260[0xd] = (RTCHitN)local_250[0xd];
                local_260[0xe] = (RTCHitN)local_250[0xe];
                local_260[0xf] = (RTCHitN)local_250[0xf];
                local_230 = vshufps_avx(auVar175,auVar175,0x55);
                local_240 = local_230;
                local_210 = vshufps_avx(auVar175,auVar175,0xaa);
                local_220 = local_210;
                fStack_1fc = local_200;
                fStack_1f8 = local_200;
                fStack_1f4 = local_200;
                fStack_1f0 = local_200;
                fStack_1ec = local_200;
                fStack_1e8 = local_200;
                fStack_1e4 = local_200;
                uStack_1dc = local_1e0;
                uStack_1d8 = local_1e0;
                uStack_1d4 = local_1e0;
                uStack_1d0 = local_1e0;
                uStack_1cc = local_1e0;
                uStack_1c8 = local_1e0;
                uStack_1c4 = local_1e0;
                local_1c0 = local_780;
                uStack_1b8 = uStack_778;
                uStack_1b0 = uStack_770;
                uStack_1a8 = uStack_768;
                local_1a0 = local_600._0_8_;
                uStack_198 = local_600._8_8_;
                uStack_190 = local_600._16_8_;
                uStack_188 = local_600._24_8_;
                auVar218 = ZEXT1632(CONCAT412(fVar199,CONCAT48(fVar234,CONCAT44(fVar269,fVar185))));
                auVar218 = vcmpps_avx(auVar218,auVar218,0xf);
                local_740[1] = auVar218;
                *local_740 = auVar218;
                local_180 = (local_730.context)->instID[0];
                uStack_17c = local_180;
                uStack_178 = local_180;
                uStack_174 = local_180;
                uStack_170 = local_180;
                uStack_16c = local_180;
                uStack_168 = local_180;
                uStack_164 = local_180;
                local_160 = (local_730.context)->instPrimID[0];
                uStack_15c = local_160;
                uStack_158 = local_160;
                uStack_154 = local_160;
                uStack_150 = local_160;
                uStack_14c = local_160;
                uStack_148 = local_160;
                uStack_144 = local_160;
                local_7e0 = *local_748;
                local_7d0 = *local_750;
                local_730.valid = (int *)local_7e0;
                local_730.geometryUserPtr = pGVar12->userPtr;
                local_730.hit = local_260;
                local_730.N = 8;
                local_730.ray = (RTCRayN *)ray;
                if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar218 = ZEXT1632(auVar218._0_16_);
                  auVar268 = ZEXT1664(auVar268._0_16_);
                  (*pGVar12->occlusionFilterN)(&local_730);
                  auVar314 = ZEXT3264(_local_7a0);
                  auVar285 = ZEXT3264(auVar282);
                  auVar307 = ZEXT3264(local_6c0);
                  auVar218 = vcmpps_avx(auVar218,auVar218,0xf);
                }
                auVar191 = vpcmpeqd_avx(local_7e0,ZEXT816(0) << 0x40);
                auVar174 = vpcmpeqd_avx(local_7d0,ZEXT816(0) << 0x40);
                auVar198 = ZEXT1664(auVar174);
                auVar180._16_16_ = auVar174;
                auVar180._0_16_ = auVar191;
                auVar161 = auVar218 & ~auVar180;
                if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar161 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar161 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar161 >> 0x7f,0) == '\0') &&
                      (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar161 >> 0xbf,0) == '\0') &&
                    (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar161[0x1f]) {
                  auVar126._0_4_ = auVar191._0_4_ ^ auVar218._0_4_;
                  auVar126._4_4_ = auVar191._4_4_ ^ auVar218._4_4_;
                  auVar126._8_4_ = auVar191._8_4_ ^ auVar218._8_4_;
                  auVar126._12_4_ = auVar191._12_4_ ^ auVar218._12_4_;
                  auVar126._16_4_ = auVar174._0_4_ ^ auVar218._16_4_;
                  auVar126._20_4_ = auVar174._4_4_ ^ auVar218._20_4_;
                  auVar126._24_4_ = auVar174._8_4_ ^ auVar218._24_4_;
                  auVar126._28_4_ = auVar174._12_4_ ^ auVar218._28_4_;
                  auVar163 = ZEXT3264(_local_7c0);
                }
                else {
                  auVar218 = vcmpps_avx(ZEXT1632(auVar174),ZEXT1632(auVar174),0xf);
                  auVar198 = ZEXT3264(auVar218);
                  p_Var13 = context->args->filter;
                  if (p_Var13 == (RTCFilterFunctionN)0x0) {
                    auVar163 = ZEXT3264(_local_7c0);
                  }
                  else {
                    auVar163 = ZEXT3264(_local_7c0);
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
                      auVar218 = ZEXT1632(auVar218._0_16_);
                      auVar268 = ZEXT1664(auVar268._0_16_);
                      (*p_Var13)(&local_730);
                      auVar163 = ZEXT3264(_local_7c0);
                      auVar314 = ZEXT3264(_local_7a0);
                      auVar285 = ZEXT3264(auVar282);
                      auVar307 = ZEXT3264(local_6c0);
                      auVar218 = vcmpps_avx(auVar218,auVar218,0xf);
                      auVar198 = ZEXT3264(auVar218);
                    }
                  }
                  auVar191 = vpcmpeqd_avx(local_7e0,ZEXT816(0) << 0x40);
                  auVar174 = vpcmpeqd_avx(local_7d0,ZEXT816(0) << 0x40);
                  auVar157._16_16_ = auVar174;
                  auVar157._0_16_ = auVar191;
                  auVar126._0_4_ = auVar191._0_4_ ^ auVar198._0_4_;
                  auVar126._4_4_ = auVar191._4_4_ ^ auVar198._4_4_;
                  auVar126._8_4_ = auVar191._8_4_ ^ auVar198._8_4_;
                  auVar126._12_4_ = auVar191._12_4_ ^ auVar198._12_4_;
                  auVar126._16_4_ = auVar174._0_4_ ^ auVar198._16_4_;
                  auVar126._20_4_ = auVar174._4_4_ ^ auVar198._20_4_;
                  auVar126._24_4_ = auVar174._8_4_ ^ auVar198._24_4_;
                  auVar126._28_4_ = auVar174._12_4_ ^ auVar198._28_4_;
                  auVar181._8_4_ = 0xff800000;
                  auVar181._0_8_ = 0xff800000ff800000;
                  auVar181._12_4_ = 0xff800000;
                  auVar181._16_4_ = 0xff800000;
                  auVar181._20_4_ = 0xff800000;
                  auVar181._24_4_ = 0xff800000;
                  auVar181._28_4_ = 0xff800000;
                  auVar218 = vblendvps_avx(auVar181,*(undefined1 (*) [32])(local_730.ray + 0x100),
                                           auVar157);
                  *(undefined1 (*) [32])(local_730.ray + 0x100) = auVar218;
                }
                auVar296 = auVar163._0_32_;
                if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar126 >> 0x7f,0) != '\0') ||
                      (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar126 >> 0xbf,0) != '\0') ||
                    (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar126[0x1f] < '\0') {
                  pRVar106 = (RTCIntersectArguments *)0x1;
                  goto LAB_0079a428;
                }
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar113;
                uVar111 = CONCAT44(uStack_8fc,local_900) ^ 1L << (local_8a0 & 0x3f);
                local_900 = (undefined4)uVar111;
                uStack_8fc = (undefined4)(uVar111 >> 0x20);
                local_8a0 = 0;
                if (uVar111 != 0) {
                  for (; (uVar111 >> local_8a0 & 1) == 0; local_8a0 = local_8a0 + 1) {
                  }
                }
              }
              pRVar106 = (RTCIntersectArguments *)0x0;
            }
          }
        }
      }
    }
LAB_0079a428:
    auVar328 = ZEXT3264(auVar215);
    auVar163 = ZEXT1664(auVar265);
    auVar255 = ZEXT3264(_local_6e0);
    if (8 < (int)uVar11) {
      _local_680 = vpshufd_avx(ZEXT416(uVar11),0);
      auVar191 = vshufps_avx(auVar265,auVar265,0);
      local_4c0._16_16_ = auVar191;
      local_4c0._0_16_ = auVar191;
      auVar191 = vpermilps_avx(ZEXT416(uVar9),0);
      local_100._16_16_ = auVar191;
      local_100._0_16_ = auVar191;
      auVar122._0_4_ = 1.0 / (float)local_560._0_4_;
      auVar122._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar191 = vshufps_avx(auVar122,auVar122,0);
      register0x00001210 = auVar191;
      _local_140 = auVar191;
      auVar191 = vpshufd_avx(ZEXT416(uVar110),0);
      local_560._16_16_ = auVar191;
      local_560._0_16_ = auVar191;
      auVar191 = vpermilps_avx(local_700._0_16_,0);
      local_120._16_16_ = auVar191;
      local_120._0_16_ = auVar191;
      pRVar106 = (RTCIntersectArguments *)((ulong)pRVar106 & 0xffffffff);
      local_6c0 = auVar307._0_32_;
      auVar218 = auVar285._0_32_;
      _local_7a0 = auVar314._0_32_;
      _local_7c0 = auVar296;
      for (lVar114 = 8; lVar114 < local_5d0; lVar114 = lVar114 + 8) {
        pauVar1 = (undefined1 (*) [28])(bezier_basis0 + lVar114 * 4 + lVar115);
        fVar225 = *(float *)*pauVar1;
        fVar185 = *(float *)(*pauVar1 + 4);
        fVar269 = *(float *)(*pauVar1 + 8);
        fVar234 = *(float *)(*pauVar1 + 0xc);
        fVar199 = *(float *)(*pauVar1 + 0x10);
        fVar271 = *(float *)(*pauVar1 + 0x14);
        fVar235 = *(float *)(*pauVar1 + 0x18);
        auVar103 = *pauVar1;
        pauVar1 = (undefined1 (*) [28])(lVar115 + 0x21fb768 + lVar114 * 4);
        fVar201 = *(float *)*pauVar1;
        fVar273 = *(float *)(*pauVar1 + 4);
        fVar236 = *(float *)(*pauVar1 + 8);
        fVar203 = *(float *)(*pauVar1 + 0xc);
        fVar299 = *(float *)(*pauVar1 + 0x10);
        fVar298 = *(float *)(*pauVar1 + 0x14);
        fVar262 = *(float *)(*pauVar1 + 0x18);
        auVar102 = *pauVar1;
        pauVar3 = (undefined1 (*) [28])(lVar115 + 0x21fbbec + lVar114 * 4);
        fVar205 = *(float *)*pauVar3;
        fVar257 = *(float *)(*pauVar3 + 4);
        fVar270 = *(float *)(*pauVar3 + 8);
        fVar272 = *(float *)(*pauVar3 + 0xc);
        fVar206 = *(float *)(*pauVar3 + 0x10);
        fVar258 = *(float *)(*pauVar3 + 0x14);
        fVar274 = *(float *)(*pauVar3 + 0x18);
        auVar101 = *pauVar3;
        pfVar4 = (float *)(lVar115 + 0x21fc070 + lVar114 * 4);
        fVar275 = *pfVar4;
        fVar207 = pfVar4[1];
        fVar259 = pfVar4[2];
        fVar276 = pfVar4[3];
        fVar277 = pfVar4[4];
        fVar208 = pfVar4[5];
        fVar170 = pfVar4[6];
        fVar261 = auVar198._28_4_;
        fVar290 = auVar268._28_4_;
        fVar224 = auVar328._0_4_;
        fVar237 = auVar328._4_4_;
        fVar245 = auVar328._8_4_;
        fVar246 = auVar328._12_4_;
        fVar247 = auVar328._16_4_;
        fVar249 = auVar328._20_4_;
        fVar256 = auVar328._24_4_;
        auVar268 = ZEXT3264(local_280);
        fVar140 = local_280._0_4_;
        fVar143 = local_280._4_4_;
        fVar146 = local_280._8_4_;
        fVar148 = local_280._12_4_;
        fVar149 = local_280._16_4_;
        fVar260 = local_280._20_4_;
        fVar164 = local_280._24_4_;
        local_600._0_4_ =
             fVar225 * (float)local_4a0._0_4_ +
             (float)local_540._0_4_ * fVar275 + (float)local_520._0_4_ * fVar205 + fVar140 * fVar201
        ;
        local_600._4_4_ =
             fVar185 * (float)local_4a0._4_4_ +
             (float)local_540._4_4_ * fVar207 + (float)local_520._4_4_ * fVar257 + fVar143 * fVar273
        ;
        local_600._8_4_ =
             fVar269 * fStack_498 + fStack_538 * fVar259 + fStack_518 * fVar270 + fVar146 * fVar236;
        local_600._12_4_ =
             fVar234 * fStack_494 + fStack_534 * fVar276 + fStack_514 * fVar272 + fVar148 * fVar203;
        local_600._16_4_ =
             fVar199 * fStack_490 + fStack_530 * fVar277 + fStack_510 * fVar206 + fVar149 * fVar299;
        local_600._20_4_ =
             fVar271 * fStack_48c + fStack_52c * fVar208 + fStack_50c * fVar258 + fVar260 * fVar298;
        local_600._24_4_ =
             fVar235 * fStack_488 + fStack_528 * fVar170 + fStack_508 * fVar274 + fVar164 * fVar262;
        local_600._28_4_ = fVar261 + pfVar4[7] + fVar290 + fVar261 + fVar261;
        auVar158._0_4_ =
             fVar225 * fVar186 +
             auVar314._0_4_ * fVar201 + fVar224 * fVar205 + auVar255._0_4_ * fVar275;
        auVar158._4_4_ =
             fVar185 * fVar200 +
             auVar314._4_4_ * fVar273 + fVar237 * fVar257 + auVar255._4_4_ * fVar207;
        auVar158._8_4_ =
             fVar269 * fVar202 +
             auVar314._8_4_ * fVar236 + fVar245 * fVar270 + auVar255._8_4_ * fVar259;
        auVar158._12_4_ =
             fVar234 * fVar204 +
             auVar314._12_4_ * fVar203 + fVar246 * fVar272 + auVar255._12_4_ * fVar276;
        auVar158._16_4_ =
             fVar199 * fVar186 +
             auVar314._16_4_ * fVar299 + fVar247 * fVar206 + auVar255._16_4_ * fVar277;
        auVar158._20_4_ =
             fVar271 * fVar200 +
             auVar314._20_4_ * fVar298 + fVar249 * fVar258 + auVar255._20_4_ * fVar208;
        auVar158._24_4_ =
             fVar235 * fVar202 +
             auVar314._24_4_ * fVar262 + fVar256 * fVar274 + auVar255._24_4_ * fVar170;
        auVar158._28_4_ = *(float *)pauVar1[1] + fVar261 + fVar261 + auVar163._28_4_;
        auVar163 = ZEXT3264(auVar158);
        fVar117 = (float)local_a0._0_4_ * fVar201 +
                  (float)local_80._0_4_ * fVar205 + fVar275 * (float)local_2a0._0_4_ +
                  fVar225 * (float)local_c0._0_4_;
        fVar133 = (float)local_a0._4_4_ * fVar273 +
                  (float)local_80._4_4_ * fVar257 + fVar207 * (float)local_2a0._4_4_ +
                  fVar185 * (float)local_c0._4_4_;
        fVar136 = fStack_98 * fVar236 + fStack_78 * fVar270 + fVar259 * fStack_298 +
                  fVar269 * fStack_b8;
        fVar139 = fStack_94 * fVar203 + fStack_74 * fVar272 + fVar276 * fStack_294 +
                  fVar234 * fStack_b4;
        fVar142 = fStack_90 * fVar299 + fStack_70 * fVar206 + fVar277 * fStack_290 +
                  fVar199 * fStack_b0;
        fVar145 = fStack_8c * fVar298 + fStack_6c * fVar258 + fVar208 * fStack_28c +
                  fVar271 * fStack_ac;
        fVar147 = fStack_88 * fVar262 + fStack_68 * fVar274 + fVar170 * fStack_288 +
                  fVar235 * fStack_a8;
        fVar116 = fVar261 + fVar261 + pfVar4[7] + *(float *)pauVar1[1];
        pfVar4 = (float *)(bezier_basis1 + lVar114 * 4 + lVar115);
        fVar235 = *pfVar4;
        fVar201 = pfVar4[1];
        fVar273 = pfVar4[2];
        fVar236 = pfVar4[3];
        fVar203 = pfVar4[4];
        fVar299 = pfVar4[5];
        fVar298 = pfVar4[6];
        pfVar5 = (float *)(lVar115 + 0x21fdb88 + lVar114 * 4);
        fVar262 = *pfVar5;
        fVar205 = pfVar5[1];
        fVar257 = pfVar5[2];
        fVar270 = pfVar5[3];
        fVar272 = pfVar5[4];
        fVar206 = pfVar5[5];
        fVar258 = pfVar5[6];
        pfVar6 = (float *)(lVar115 + 0x21fe00c + lVar114 * 4);
        fVar274 = *pfVar6;
        fVar290 = pfVar6[1];
        fVar132 = pfVar6[2];
        fVar135 = pfVar6[3];
        fVar138 = pfVar6[4];
        fVar141 = pfVar6[5];
        fVar144 = pfVar6[6];
        pauVar1 = (undefined1 (*) [28])(lVar115 + 0x21fe490 + lVar114 * 4);
        fVar261 = *(float *)*pauVar1;
        fVar225 = *(float *)(*pauVar1 + 4);
        fVar185 = *(float *)(*pauVar1 + 8);
        fVar269 = *(float *)(*pauVar1 + 0xc);
        fVar234 = *(float *)(*pauVar1 + 0x10);
        fVar199 = *(float *)(*pauVar1 + 0x14);
        fVar271 = *(float *)(*pauVar1 + 0x18);
        auVar104 = *pauVar1;
        fVar137 = auVar255._28_4_;
        fVar134 = fVar137 + *(float *)pauVar1[1];
        fVar131 = fVar137 + fVar137 + fStack_524;
        local_700._0_4_ =
             (float)local_4a0._0_4_ * fVar235 +
             fVar140 * fVar262 + (float)local_520._0_4_ * fVar274 + (float)local_540._0_4_ * fVar261
        ;
        local_700._4_4_ =
             (float)local_4a0._4_4_ * fVar201 +
             fVar143 * fVar205 + (float)local_520._4_4_ * fVar290 + (float)local_540._4_4_ * fVar225
        ;
        local_700._8_4_ =
             fStack_498 * fVar273 + fVar146 * fVar257 + fStack_518 * fVar132 + fStack_538 * fVar185;
        local_700._12_4_ =
             fStack_494 * fVar236 + fVar148 * fVar270 + fStack_514 * fVar135 + fStack_534 * fVar269;
        local_700._16_4_ =
             fStack_490 * fVar203 + fVar149 * fVar272 + fStack_510 * fVar138 + fStack_530 * fVar234;
        local_700._20_4_ =
             fStack_48c * fVar299 + fVar260 * fVar206 + fStack_50c * fVar141 + fStack_52c * fVar199;
        local_700._24_4_ =
             fStack_488 * fVar298 + fVar164 * fVar258 + fStack_508 * fVar144 + fStack_528 * fVar271;
        local_700._28_4_ = fVar134 + fVar131;
        auVar232._0_4_ =
             fVar186 * fVar235 +
             auVar314._0_4_ * fVar262 + fVar274 * fVar224 + auVar255._0_4_ * fVar261;
        auVar232._4_4_ =
             fVar200 * fVar201 +
             auVar314._4_4_ * fVar205 + fVar290 * fVar237 + auVar255._4_4_ * fVar225;
        auVar232._8_4_ =
             fVar202 * fVar273 +
             auVar314._8_4_ * fVar257 + fVar132 * fVar245 + auVar255._8_4_ * fVar185;
        auVar232._12_4_ =
             fVar204 * fVar236 +
             auVar314._12_4_ * fVar270 + fVar135 * fVar246 + auVar255._12_4_ * fVar269;
        auVar232._16_4_ =
             fVar186 * fVar203 +
             auVar314._16_4_ * fVar272 + fVar138 * fVar247 + auVar255._16_4_ * fVar234;
        auVar232._20_4_ =
             fVar200 * fVar299 +
             auVar314._20_4_ * fVar206 + fVar141 * fVar249 + auVar255._20_4_ * fVar199;
        auVar232._24_4_ =
             fVar202 * fVar298 +
             auVar314._24_4_ * fVar258 + fVar144 * fVar256 + auVar255._24_4_ * fVar271;
        auVar232._28_4_ = fVar131 + fVar137 + fVar137 + fVar204;
        auVar182._0_4_ =
             (float)local_a0._0_4_ * fVar262 +
             (float)local_80._0_4_ * fVar274 + fVar261 * (float)local_2a0._0_4_ +
             fVar235 * (float)local_c0._0_4_;
        auVar182._4_4_ =
             (float)local_a0._4_4_ * fVar205 +
             (float)local_80._4_4_ * fVar290 + fVar225 * (float)local_2a0._4_4_ +
             fVar201 * (float)local_c0._4_4_;
        auVar182._8_4_ =
             fStack_98 * fVar257 + fStack_78 * fVar132 + fVar185 * fStack_298 + fVar273 * fStack_b8;
        auVar182._12_4_ =
             fStack_94 * fVar270 + fStack_74 * fVar135 + fVar269 * fStack_294 + fVar236 * fStack_b4;
        auVar182._16_4_ =
             fStack_90 * fVar272 + fStack_70 * fVar138 + fVar234 * fStack_290 + fVar203 * fStack_b0;
        auVar182._20_4_ =
             fStack_8c * fVar206 + fStack_6c * fVar141 + fVar199 * fStack_28c + fVar299 * fStack_ac;
        auVar182._24_4_ =
             fStack_88 * fVar258 + fStack_68 * fVar144 + fVar271 * fStack_288 + fVar298 * fStack_a8;
        auVar182._28_4_ = fVar137 + fVar134 + fVar131;
        auVar282 = vsubps_avx(local_700,local_600);
        auVar18 = vsubps_avx(auVar232,auVar158);
        fVar261 = auVar282._0_4_;
        fVar225 = auVar282._4_4_;
        auVar53._4_4_ = auVar158._4_4_ * fVar225;
        auVar53._0_4_ = auVar158._0_4_ * fVar261;
        fVar185 = auVar282._8_4_;
        auVar53._8_4_ = auVar158._8_4_ * fVar185;
        fVar269 = auVar282._12_4_;
        auVar53._12_4_ = auVar158._12_4_ * fVar269;
        fVar234 = auVar282._16_4_;
        auVar53._16_4_ = auVar158._16_4_ * fVar234;
        fVar199 = auVar282._20_4_;
        auVar53._20_4_ = auVar158._20_4_ * fVar199;
        fVar271 = auVar282._24_4_;
        auVar53._24_4_ = auVar158._24_4_ * fVar271;
        auVar53._28_4_ = fVar131;
        fVar131 = auVar18._0_4_;
        fVar134 = auVar18._4_4_;
        auVar54._4_4_ = fVar134 * local_600._4_4_;
        auVar54._0_4_ = fVar131 * local_600._0_4_;
        fVar137 = auVar18._8_4_;
        auVar54._8_4_ = fVar137 * local_600._8_4_;
        fVar165 = auVar18._12_4_;
        auVar54._12_4_ = fVar165 * local_600._12_4_;
        fVar166 = auVar18._16_4_;
        auVar54._16_4_ = fVar166 * local_600._16_4_;
        fVar167 = auVar18._20_4_;
        auVar54._20_4_ = fVar167 * local_600._20_4_;
        fVar168 = auVar18._24_4_;
        auVar54._24_4_ = fVar168 * local_600._24_4_;
        auVar54._28_4_ = auVar232._28_4_;
        auVar16 = vsubps_avx(auVar53,auVar54);
        auVar98._4_4_ = fVar133;
        auVar98._0_4_ = fVar117;
        auVar98._8_4_ = fVar136;
        auVar98._12_4_ = fVar139;
        auVar98._16_4_ = fVar142;
        auVar98._20_4_ = fVar145;
        auVar98._24_4_ = fVar147;
        auVar98._28_4_ = fVar116;
        auVar198 = ZEXT3264(auVar98);
        auVar161 = vmaxps_avx(auVar98,auVar182);
        auVar55._4_4_ = auVar161._4_4_ * auVar161._4_4_ * (fVar225 * fVar225 + fVar134 * fVar134);
        auVar55._0_4_ = auVar161._0_4_ * auVar161._0_4_ * (fVar261 * fVar261 + fVar131 * fVar131);
        auVar55._8_4_ = auVar161._8_4_ * auVar161._8_4_ * (fVar185 * fVar185 + fVar137 * fVar137);
        auVar55._12_4_ = auVar161._12_4_ * auVar161._12_4_ * (fVar269 * fVar269 + fVar165 * fVar165)
        ;
        auVar55._16_4_ = auVar161._16_4_ * auVar161._16_4_ * (fVar234 * fVar234 + fVar166 * fVar166)
        ;
        auVar55._20_4_ = auVar161._20_4_ * auVar161._20_4_ * (fVar199 * fVar199 + fVar167 * fVar167)
        ;
        auVar55._24_4_ = auVar161._24_4_ * auVar161._24_4_ * (fVar271 * fVar271 + fVar168 * fVar168)
        ;
        auVar55._28_4_ = local_700._28_4_ + auVar232._28_4_;
        auVar56._4_4_ = auVar16._4_4_ * auVar16._4_4_;
        auVar56._0_4_ = auVar16._0_4_ * auVar16._0_4_;
        auVar56._8_4_ = auVar16._8_4_ * auVar16._8_4_;
        auVar56._12_4_ = auVar16._12_4_ * auVar16._12_4_;
        auVar56._16_4_ = auVar16._16_4_ * auVar16._16_4_;
        auVar56._20_4_ = auVar16._20_4_ * auVar16._20_4_;
        auVar56._24_4_ = auVar16._24_4_ * auVar16._24_4_;
        auVar56._28_4_ = auVar16._28_4_;
        _local_580 = vcmpps_avx(auVar56,auVar55,2);
        local_3e0 = (uint)lVar114;
        auVar174 = vpshufd_avx(ZEXT416(local_3e0),0);
        auVar191 = vpor_avx(auVar174,_DAT_01f4ad30);
        auVar174 = vpor_avx(auVar174,_DAT_01f7afa0);
        auVar191 = vpcmpgtd_avx(_local_680,auVar191);
        auVar174 = vpcmpgtd_avx(_local_680,auVar174);
        register0x00001290 = auVar174;
        _local_5a0 = auVar191;
        auVar161 = _local_5a0 & _local_580;
        if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar161 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar161 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar161 >> 0x7f,0) == '\0') &&
              (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar161 >> 0xbf,0) == '\0') &&
            (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar161[0x1f]) {
          auVar255 = ZEXT3264(_local_6e0);
          auVar328 = ZEXT3264(auVar328._0_32_);
          auVar314 = ZEXT3264(_local_7a0);
        }
        else {
          local_660._0_4_ = auVar104._0_4_;
          local_660._4_4_ = auVar104._4_4_;
          fStack_658 = auVar104._8_4_;
          fStack_654 = auVar104._12_4_;
          fStack_650 = auVar104._16_4_;
          fStack_64c = auVar104._20_4_;
          fStack_648 = auVar104._24_4_;
          local_660._0_4_ =
               fVar235 * (float)local_2c0._0_4_ +
               fVar262 * (float)local_e0._0_4_ +
               fVar274 * (float)local_480._0_4_ + (float)local_7c0._0_4_ * (float)local_660._0_4_;
          local_660._4_4_ =
               fVar201 * (float)local_2c0._4_4_ +
               fVar205 * (float)local_e0._4_4_ +
               fVar290 * (float)local_480._4_4_ + (float)local_7c0._4_4_ * (float)local_660._4_4_;
          fStack_658 = fVar273 * fStack_2b8 +
                       fVar257 * fStack_d8 + fVar132 * fStack_478 + fStack_7b8 * fStack_658;
          fStack_654 = fVar236 * fStack_2b4 +
                       fVar270 * fStack_d4 + fVar135 * fStack_474 + fStack_7b4 * fStack_654;
          fStack_650 = fVar203 * fStack_2b0 +
                       fVar272 * fStack_d0 + fVar138 * fStack_470 + fStack_7b0 * fStack_650;
          fStack_64c = fVar299 * fStack_2ac +
                       fVar206 * fStack_cc + fVar141 * fStack_46c + fStack_7ac * fStack_64c;
          fStack_648 = fVar298 * fStack_2a8 +
                       fVar258 * fStack_c8 + fVar144 * fStack_468 + fStack_7a8 * fStack_648;
          fStack_644 = pfVar4[7] + auVar328._28_4_ + auVar158._28_4_ + 0.0;
          local_780._0_4_ = auVar102._0_4_;
          local_780._4_4_ = auVar102._4_4_;
          uStack_778._0_4_ = auVar102._8_4_;
          uStack_778._4_4_ = auVar102._12_4_;
          uStack_770._0_4_ = auVar102._16_4_;
          uStack_770._4_4_ = auVar102._20_4_;
          uStack_768._0_4_ = auVar102._24_4_;
          local_620._0_4_ = auVar101._0_4_;
          local_620._4_4_ = auVar101._4_4_;
          fStack_618 = auVar101._8_4_;
          fStack_614 = auVar101._12_4_;
          fStack_610 = auVar101._16_4_;
          fStack_60c = auVar101._20_4_;
          fStack_608 = auVar101._24_4_;
          fVar134 = (float)local_480._0_4_ * (float)local_620._0_4_;
          fVar137 = (float)local_480._4_4_ * (float)local_620._4_4_;
          fVar165 = fStack_478 * fStack_618;
          fVar166 = fStack_474 * fStack_614;
          fVar167 = fStack_470 * fStack_610;
          fVar168 = fStack_46c * fStack_60c;
          fVar169 = fStack_468 * fStack_608;
          pfVar4 = (float *)(lVar115 + 0x21fcdfc + lVar114 * 4);
          fVar261 = *pfVar4;
          fVar225 = pfVar4[1];
          fVar185 = pfVar4[2];
          fVar269 = pfVar4[3];
          fVar234 = pfVar4[4];
          fVar199 = pfVar4[5];
          fVar271 = pfVar4[6];
          pfVar7 = (float *)(lVar115 + 0x21fd280 + lVar114 * 4);
          fVar235 = *pfVar7;
          fVar201 = pfVar7[1];
          fVar273 = pfVar7[2];
          fVar236 = pfVar7[3];
          fVar203 = pfVar7[4];
          fVar299 = pfVar7[5];
          fVar298 = pfVar7[6];
          fVar248 = pfVar5[7] + 0.0;
          pfVar8 = (float *)(lVar115 + 0x21fc978 + lVar114 * 4);
          fVar262 = *pfVar8;
          fVar205 = pfVar8[1];
          fVar257 = pfVar8[2];
          fVar270 = pfVar8[3];
          fVar272 = pfVar8[4];
          fVar206 = pfVar8[5];
          fVar258 = pfVar8[6];
          fVar131 = pfVar4[7] + pfVar7[7];
          fStack_624 = pfVar7[7] + fVar248;
          fVar248 = pfVar5[7] + pfVar6[7] + fVar248;
          pfVar4 = (float *)(lVar115 + 0x21fc4f4 + lVar114 * 4);
          fVar274 = *pfVar4;
          fVar290 = pfVar4[1];
          fVar132 = pfVar4[2];
          fVar135 = pfVar4[3];
          fVar138 = pfVar4[4];
          fVar141 = pfVar4[5];
          fVar144 = pfVar4[6];
          local_620._4_4_ =
               (float)local_4a0._4_4_ * fVar290 +
               fVar143 * fVar205 +
               (float)local_520._4_4_ * fVar225 + (float)local_540._4_4_ * fVar201;
          local_620._0_4_ =
               (float)local_4a0._0_4_ * fVar274 +
               fVar140 * fVar262 +
               (float)local_520._0_4_ * fVar261 + (float)local_540._0_4_ * fVar235;
          fStack_618 = fStack_498 * fVar132 +
                       fVar146 * fVar257 + fStack_518 * fVar185 + fStack_538 * fVar273;
          fStack_614 = fStack_494 * fVar135 +
                       fVar148 * fVar270 + fStack_514 * fVar269 + fStack_534 * fVar236;
          fStack_610 = fStack_490 * fVar138 +
                       fVar149 * fVar272 + fStack_510 * fVar234 + fStack_530 * fVar203;
          fStack_60c = fStack_48c * fVar141 +
                       fVar260 * fVar206 + fStack_50c * fVar199 + fStack_52c * fVar299;
          fStack_608 = fStack_488 * fVar144 +
                       fVar164 * fVar258 + fStack_508 * fVar271 + fStack_528 * fVar298;
          fStack_604 = fVar131 + fStack_624;
          local_640 = fVar186 * fVar274 +
                      fVar224 * fVar261 + fVar235 * (float)local_6e0._0_4_ +
                      fVar262 * (float)local_7a0._0_4_;
          fStack_63c = fVar200 * fVar290 +
                       fVar237 * fVar225 + fVar201 * (float)local_6e0._4_4_ +
                       fVar205 * (float)local_7a0._4_4_;
          fStack_638 = fVar202 * fVar132 +
                       fVar245 * fVar185 + fVar273 * fStack_6d8 + fVar257 * fStack_798;
          fStack_634 = fVar204 * fVar135 +
                       fVar246 * fVar269 + fVar236 * fStack_6d4 + fVar270 * fStack_794;
          fStack_630 = fVar186 * fVar138 +
                       fVar247 * fVar234 + fVar203 * fStack_6d0 + fVar272 * fStack_790;
          fStack_62c = fVar200 * fVar141 +
                       fVar249 * fVar199 + fVar299 * fStack_6cc + fVar206 * fStack_78c;
          fStack_628 = fVar202 * fVar144 +
                       fVar256 * fVar271 + fVar298 * fStack_6c8 + fVar258 * fStack_788;
          fStack_624 = fStack_624 + fVar248;
          auVar312._0_4_ =
               fVar262 * (float)local_e0._0_4_ +
               (float)local_480._0_4_ * fVar261 + (float)local_7c0._0_4_ * fVar235 +
               fVar274 * (float)local_2c0._0_4_;
          auVar312._4_4_ =
               fVar205 * (float)local_e0._4_4_ +
               (float)local_480._4_4_ * fVar225 + (float)local_7c0._4_4_ * fVar201 +
               fVar290 * (float)local_2c0._4_4_;
          auVar312._8_4_ =
               fVar257 * fStack_d8 + fStack_478 * fVar185 + fStack_7b8 * fVar273 +
               fVar132 * fStack_2b8;
          auVar312._12_4_ =
               fVar270 * fStack_d4 + fStack_474 * fVar269 + fStack_7b4 * fVar236 +
               fVar135 * fStack_2b4;
          auVar312._16_4_ =
               fVar272 * fStack_d0 + fStack_470 * fVar234 + fStack_7b0 * fVar203 +
               fVar138 * fStack_2b0;
          auVar312._20_4_ =
               fVar206 * fStack_cc + fStack_46c * fVar199 + fStack_7ac * fVar299 +
               fVar141 * fStack_2ac;
          auVar312._24_4_ =
               fVar258 * fStack_c8 + fStack_468 * fVar271 + fStack_7a8 * fVar298 +
               fVar144 * fStack_2a8;
          auVar312._28_4_ = pfVar8[7] + fVar131 + fVar248;
          pfVar4 = (float *)(lVar115 + 0x21ff21c + lVar114 * 4);
          fVar261 = *pfVar4;
          fVar225 = pfVar4[1];
          fVar185 = pfVar4[2];
          fVar269 = pfVar4[3];
          fVar234 = pfVar4[4];
          fVar199 = pfVar4[5];
          fVar271 = pfVar4[6];
          pfVar5 = (float *)(lVar115 + 0x21ff6a0 + lVar114 * 4);
          fVar235 = *pfVar5;
          fVar201 = pfVar5[1];
          fVar273 = pfVar5[2];
          fVar236 = pfVar5[3];
          fVar203 = pfVar5[4];
          fVar299 = pfVar5[5];
          fVar298 = pfVar5[6];
          pfVar6 = (float *)(lVar115 + 0x21fed98 + lVar114 * 4);
          fVar262 = *pfVar6;
          fVar205 = pfVar6[1];
          fVar257 = pfVar6[2];
          fVar270 = pfVar6[3];
          fVar272 = pfVar6[4];
          fVar206 = pfVar6[5];
          fVar258 = pfVar6[6];
          pfVar7 = (float *)(lVar115 + 0x21fe914 + lVar114 * 4);
          fVar274 = *pfVar7;
          fVar290 = pfVar7[1];
          fVar132 = pfVar7[2];
          fVar135 = pfVar7[3];
          fVar138 = pfVar7[4];
          fVar141 = pfVar7[5];
          fVar144 = pfVar7[6];
          auVar283._0_4_ =
               fVar274 * (float)local_4a0._0_4_ +
               fVar140 * fVar262 +
               (float)local_520._0_4_ * fVar261 + (float)local_540._0_4_ * fVar235;
          auVar283._4_4_ =
               fVar290 * (float)local_4a0._4_4_ +
               fVar143 * fVar205 +
               (float)local_520._4_4_ * fVar225 + (float)local_540._4_4_ * fVar201;
          auVar283._8_4_ =
               fVar132 * fStack_498 +
               fVar146 * fVar257 + fStack_518 * fVar185 + fStack_538 * fVar273;
          auVar283._12_4_ =
               fVar135 * fStack_494 +
               fVar148 * fVar270 + fStack_514 * fVar269 + fStack_534 * fVar236;
          auVar283._16_4_ =
               fVar138 * fStack_490 +
               fVar149 * fVar272 + fStack_510 * fVar234 + fStack_530 * fVar203;
          auVar283._20_4_ =
               fVar141 * fStack_48c +
               fVar260 * fVar206 + fStack_50c * fVar199 + fStack_52c * fVar299;
          auVar283._24_4_ =
               fVar144 * fStack_488 +
               fVar164 * fVar258 + fStack_508 * fVar271 + fStack_528 * fVar298;
          auVar283._28_4_ = fStack_484 + fStack_484 + fStack_524 + fStack_484;
          auVar304._0_4_ =
               fVar186 * fVar274 +
               fVar262 * (float)local_7a0._0_4_ +
               fVar261 * fVar209 + fVar235 * (float)local_6e0._0_4_;
          auVar304._4_4_ =
               fVar200 * fVar290 +
               fVar205 * (float)local_7a0._4_4_ +
               fVar225 * fVar221 + fVar201 * (float)local_6e0._4_4_;
          auVar304._8_4_ =
               fVar202 * fVar132 + fVar257 * fStack_798 + fVar185 * fVar222 + fVar273 * fStack_6d8;
          auVar304._12_4_ =
               fVar204 * fVar135 + fVar270 * fStack_794 + fVar269 * fVar223 + fVar236 * fStack_6d4;
          auVar304._16_4_ =
               fVar186 * fVar138 + fVar272 * fStack_790 + fVar234 * fVar209 + fVar203 * fStack_6d0;
          auVar304._20_4_ =
               fVar200 * fVar141 + fVar206 * fStack_78c + fVar199 * fVar221 + fVar299 * fStack_6cc;
          auVar304._24_4_ =
               fVar202 * fVar144 + fVar258 * fStack_788 + fVar271 * fVar222 + fVar298 * fStack_6c8;
          auVar304._28_4_ = fStack_484 + fStack_484 + fStack_504 + fStack_484;
          auVar233._8_4_ = 0x7fffffff;
          auVar233._0_8_ = 0x7fffffff7fffffff;
          auVar233._12_4_ = 0x7fffffff;
          auVar233._16_4_ = 0x7fffffff;
          auVar233._20_4_ = 0x7fffffff;
          auVar233._24_4_ = 0x7fffffff;
          auVar233._28_4_ = 0x7fffffff;
          auVar161 = vandps_avx(_local_620,auVar233);
          auVar100._4_4_ = fStack_63c;
          auVar100._0_4_ = local_640;
          auVar100._8_4_ = fStack_638;
          auVar100._12_4_ = fStack_634;
          auVar100._16_4_ = fStack_630;
          auVar100._20_4_ = fStack_62c;
          auVar100._24_4_ = fStack_628;
          auVar100._28_4_ = fStack_624;
          auVar16 = vandps_avx(auVar100,auVar233);
          auVar16 = vmaxps_avx(auVar161,auVar16);
          auVar161 = vandps_avx(auVar312,auVar233);
          auVar16 = vmaxps_avx(auVar16,auVar161);
          auVar16 = vcmpps_avx(auVar16,local_4c0,1);
          auVar17 = vblendvps_avx(_local_620,auVar282,auVar16);
          auVar127._0_4_ =
               fVar274 * (float)local_2c0._0_4_ +
               fVar262 * (float)local_e0._0_4_ +
               fVar235 * (float)local_7c0._0_4_ + (float)local_480._0_4_ * fVar261;
          auVar127._4_4_ =
               fVar290 * (float)local_2c0._4_4_ +
               fVar205 * (float)local_e0._4_4_ +
               fVar201 * (float)local_7c0._4_4_ + (float)local_480._4_4_ * fVar225;
          auVar127._8_4_ =
               fVar132 * fStack_2b8 +
               fVar257 * fStack_d8 + fVar273 * fStack_7b8 + fStack_478 * fVar185;
          auVar127._12_4_ =
               fVar135 * fStack_2b4 +
               fVar270 * fStack_d4 + fVar236 * fStack_7b4 + fStack_474 * fVar269;
          auVar127._16_4_ =
               fVar138 * fStack_2b0 +
               fVar272 * fStack_d0 + fVar203 * fStack_7b0 + fStack_470 * fVar234;
          auVar127._20_4_ =
               fVar141 * fStack_2ac +
               fVar206 * fStack_cc + fVar299 * fStack_7ac + fStack_46c * fVar199;
          auVar127._24_4_ =
               fVar144 * fStack_2a8 +
               fVar258 * fStack_c8 + fVar298 * fStack_7a8 + fStack_468 * fVar271;
          auVar127._28_4_ = auVar161._28_4_ + pfVar6[7] + pfVar5[7] + pfVar4[7];
          auVar23 = vblendvps_avx(auVar100,auVar18,auVar16);
          auVar161 = vandps_avx(auVar283,auVar233);
          auVar16 = vandps_avx(auVar304,auVar233);
          auVar14 = vmaxps_avx(auVar161,auVar16);
          auVar161 = vandps_avx(auVar127,auVar233);
          auVar161 = vmaxps_avx(auVar14,auVar161);
          local_840._0_4_ = auVar103._0_4_;
          local_840._4_4_ = auVar103._4_4_;
          fStack_838 = auVar103._8_4_;
          fStack_834 = auVar103._12_4_;
          fStack_830 = auVar103._16_4_;
          fStack_82c = auVar103._20_4_;
          fStack_828 = auVar103._24_4_;
          auVar16 = vcmpps_avx(auVar161,local_4c0,1);
          auVar161 = vblendvps_avx(auVar283,auVar282,auVar16);
          auVar128._0_4_ =
               (float)local_2c0._0_4_ * (float)local_840._0_4_ +
               (float)local_e0._0_4_ * (float)local_780._0_4_ +
               fVar134 + (float)local_7c0._0_4_ * fVar275;
          auVar128._4_4_ =
               (float)local_2c0._4_4_ * (float)local_840._4_4_ +
               (float)local_e0._4_4_ * (float)local_780._4_4_ +
               fVar137 + (float)local_7c0._4_4_ * fVar207;
          auVar128._8_4_ =
               fStack_2b8 * fStack_838 +
               fStack_d8 * (float)uStack_778 + fVar165 + fStack_7b8 * fVar259;
          auVar128._12_4_ =
               fStack_2b4 * fStack_834 +
               fStack_d4 * uStack_778._4_4_ + fVar166 + fStack_7b4 * fVar276;
          auVar128._16_4_ =
               fStack_2b0 * fStack_830 +
               fStack_d0 * (float)uStack_770 + fVar167 + fStack_7b0 * fVar277;
          auVar128._20_4_ =
               fStack_2ac * fStack_82c +
               fStack_cc * uStack_770._4_4_ + fVar168 + fStack_7ac * fVar208;
          auVar128._24_4_ =
               fStack_2a8 * fStack_828 +
               fStack_c8 * (float)uStack_768 + fVar169 + fStack_7a8 * fVar170;
          auVar128._28_4_ = auVar14._28_4_ + fStack_644 + auVar158._28_4_ + 0.0;
          auVar282 = vblendvps_avx(auVar304,auVar18,auVar16);
          fVar131 = auVar17._0_4_;
          fVar134 = auVar17._4_4_;
          fVar137 = auVar17._8_4_;
          fVar140 = auVar17._12_4_;
          fVar143 = auVar17._16_4_;
          fVar146 = auVar17._20_4_;
          fVar148 = auVar17._24_4_;
          fVar149 = auVar17._28_4_;
          fVar262 = auVar161._0_4_;
          fVar257 = auVar161._4_4_;
          fVar272 = auVar161._8_4_;
          fVar258 = auVar161._12_4_;
          fVar275 = auVar161._16_4_;
          fVar259 = auVar161._20_4_;
          fVar277 = auVar161._24_4_;
          fVar261 = auVar23._0_4_;
          fVar185 = auVar23._4_4_;
          fVar234 = auVar23._8_4_;
          fVar271 = auVar23._12_4_;
          fVar201 = auVar23._16_4_;
          fVar236 = auVar23._20_4_;
          fVar299 = auVar23._24_4_;
          auVar292._0_4_ = fVar261 * fVar261 + fVar131 * fVar131;
          auVar292._4_4_ = fVar185 * fVar185 + fVar134 * fVar134;
          auVar292._8_4_ = fVar234 * fVar234 + fVar137 * fVar137;
          auVar292._12_4_ = fVar271 * fVar271 + fVar140 * fVar140;
          auVar292._16_4_ = fVar201 * fVar201 + fVar143 * fVar143;
          auVar292._20_4_ = fVar236 * fVar236 + fVar146 * fVar146;
          auVar292._24_4_ = fVar299 * fVar299 + fVar148 * fVar148;
          auVar292._28_4_ = fVar204 + auVar18._28_4_;
          auVar18 = vrsqrtps_avx(auVar292);
          fVar225 = auVar18._0_4_;
          fVar269 = auVar18._4_4_;
          auVar57._4_4_ = fVar269 * 1.5;
          auVar57._0_4_ = fVar225 * 1.5;
          fVar199 = auVar18._8_4_;
          auVar57._8_4_ = fVar199 * 1.5;
          fVar235 = auVar18._12_4_;
          auVar57._12_4_ = fVar235 * 1.5;
          fVar273 = auVar18._16_4_;
          auVar57._16_4_ = fVar273 * 1.5;
          fVar203 = auVar18._20_4_;
          auVar57._20_4_ = fVar203 * 1.5;
          fVar298 = auVar18._24_4_;
          auVar57._24_4_ = fVar298 * 1.5;
          auVar57._28_4_ = auVar304._28_4_;
          auVar58._4_4_ = fVar269 * fVar269 * fVar269 * auVar292._4_4_ * 0.5;
          auVar58._0_4_ = fVar225 * fVar225 * fVar225 * auVar292._0_4_ * 0.5;
          auVar58._8_4_ = fVar199 * fVar199 * fVar199 * auVar292._8_4_ * 0.5;
          auVar58._12_4_ = fVar235 * fVar235 * fVar235 * auVar292._12_4_ * 0.5;
          auVar58._16_4_ = fVar273 * fVar273 * fVar273 * auVar292._16_4_ * 0.5;
          auVar58._20_4_ = fVar203 * fVar203 * fVar203 * auVar292._20_4_ * 0.5;
          auVar58._24_4_ = fVar298 * fVar298 * fVar298 * auVar292._24_4_ * 0.5;
          auVar58._28_4_ = auVar292._28_4_;
          auVar16 = vsubps_avx(auVar57,auVar58);
          fVar170 = auVar16._0_4_;
          fVar290 = auVar16._4_4_;
          fVar132 = auVar16._8_4_;
          fVar135 = auVar16._12_4_;
          fVar138 = auVar16._16_4_;
          fVar141 = auVar16._20_4_;
          fVar144 = auVar16._24_4_;
          fVar225 = auVar282._0_4_;
          fVar269 = auVar282._4_4_;
          fVar199 = auVar282._8_4_;
          fVar235 = auVar282._12_4_;
          fVar273 = auVar282._16_4_;
          fVar203 = auVar282._20_4_;
          fVar298 = auVar282._24_4_;
          auVar267._0_4_ = fVar225 * fVar225 + fVar262 * fVar262;
          auVar267._4_4_ = fVar269 * fVar269 + fVar257 * fVar257;
          auVar267._8_4_ = fVar199 * fVar199 + fVar272 * fVar272;
          auVar267._12_4_ = fVar235 * fVar235 + fVar258 * fVar258;
          auVar267._16_4_ = fVar273 * fVar273 + fVar275 * fVar275;
          auVar267._20_4_ = fVar203 * fVar203 + fVar259 * fVar259;
          auVar267._24_4_ = fVar298 * fVar298 + fVar277 * fVar277;
          auVar267._28_4_ = auVar18._28_4_ + auVar161._28_4_;
          auVar161 = vrsqrtps_avx(auVar267);
          fVar205 = auVar161._0_4_;
          fVar270 = auVar161._4_4_;
          auVar59._4_4_ = fVar270 * 1.5;
          auVar59._0_4_ = fVar205 * 1.5;
          fVar206 = auVar161._8_4_;
          auVar59._8_4_ = fVar206 * 1.5;
          fVar274 = auVar161._12_4_;
          auVar59._12_4_ = fVar274 * 1.5;
          fVar207 = auVar161._16_4_;
          auVar59._16_4_ = fVar207 * 1.5;
          fVar276 = auVar161._20_4_;
          auVar59._20_4_ = fVar276 * 1.5;
          fVar208 = auVar161._24_4_;
          auVar59._24_4_ = fVar208 * 1.5;
          auVar59._28_4_ = auVar304._28_4_;
          auVar60._4_4_ = fVar270 * fVar270 * fVar270 * auVar267._4_4_ * 0.5;
          auVar60._0_4_ = fVar205 * fVar205 * fVar205 * auVar267._0_4_ * 0.5;
          auVar60._8_4_ = fVar206 * fVar206 * fVar206 * auVar267._8_4_ * 0.5;
          auVar60._12_4_ = fVar274 * fVar274 * fVar274 * auVar267._12_4_ * 0.5;
          auVar60._16_4_ = fVar207 * fVar207 * fVar207 * auVar267._16_4_ * 0.5;
          auVar60._20_4_ = fVar276 * fVar276 * fVar276 * auVar267._20_4_ * 0.5;
          auVar60._24_4_ = fVar208 * fVar208 * fVar208 * auVar267._24_4_ * 0.5;
          auVar60._28_4_ = auVar267._28_4_;
          auVar282 = vsubps_avx(auVar59,auVar60);
          fVar205 = auVar282._0_4_;
          fVar270 = auVar282._4_4_;
          fVar206 = auVar282._8_4_;
          fVar274 = auVar282._12_4_;
          fVar207 = auVar282._16_4_;
          fVar276 = auVar282._20_4_;
          fVar208 = auVar282._24_4_;
          fVar261 = fVar117 * fVar170 * fVar261;
          fVar185 = fVar133 * fVar290 * fVar185;
          auVar61._4_4_ = fVar185;
          auVar61._0_4_ = fVar261;
          fVar234 = fVar136 * fVar132 * fVar234;
          auVar61._8_4_ = fVar234;
          fVar271 = fVar139 * fVar135 * fVar271;
          auVar61._12_4_ = fVar271;
          fVar201 = fVar142 * fVar138 * fVar201;
          auVar61._16_4_ = fVar201;
          fVar236 = fVar145 * fVar141 * fVar236;
          auVar61._20_4_ = fVar236;
          fVar299 = fVar147 * fVar144 * fVar299;
          auVar61._24_4_ = fVar299;
          auVar61._28_4_ = auVar161._28_4_;
          local_840._4_4_ = fVar185 + local_600._4_4_;
          local_840._0_4_ = fVar261 + local_600._0_4_;
          fStack_838 = fVar234 + local_600._8_4_;
          fStack_834 = fVar271 + local_600._12_4_;
          fStack_830 = fVar201 + local_600._16_4_;
          fStack_82c = fVar236 + local_600._20_4_;
          fStack_828 = fVar299 + local_600._24_4_;
          fStack_824 = auVar161._28_4_ + local_600._28_4_;
          fVar261 = fVar117 * fVar170 * -fVar131;
          fVar185 = fVar133 * fVar290 * -fVar134;
          auVar62._4_4_ = fVar185;
          auVar62._0_4_ = fVar261;
          fVar234 = fVar136 * fVar132 * -fVar137;
          auVar62._8_4_ = fVar234;
          fVar271 = fVar139 * fVar135 * -fVar140;
          auVar62._12_4_ = fVar271;
          fVar201 = fVar142 * fVar138 * -fVar143;
          auVar62._16_4_ = fVar201;
          fVar236 = fVar145 * fVar141 * -fVar146;
          auVar62._20_4_ = fVar236;
          fVar299 = fVar147 * fVar144 * -fVar148;
          auVar62._24_4_ = fVar299;
          auVar62._28_4_ = -fVar149;
          local_780._4_4_ = auVar158._4_4_ + fVar185;
          local_780._0_4_ = auVar158._0_4_ + fVar261;
          uStack_778._0_4_ = auVar158._8_4_ + fVar234;
          uStack_778._4_4_ = auVar158._12_4_ + fVar271;
          uStack_770._0_4_ = auVar158._16_4_ + fVar201;
          uStack_770._4_4_ = auVar158._20_4_ + fVar236;
          uStack_768._0_4_ = auVar158._24_4_ + fVar299;
          uStack_768._4_4_ = auVar158._28_4_ + -fVar149;
          fVar261 = fVar170 * 0.0 * fVar117;
          fVar185 = fVar290 * 0.0 * fVar133;
          auVar63._4_4_ = fVar185;
          auVar63._0_4_ = fVar261;
          fVar234 = fVar132 * 0.0 * fVar136;
          auVar63._8_4_ = fVar234;
          fVar271 = fVar135 * 0.0 * fVar139;
          auVar63._12_4_ = fVar271;
          fVar201 = fVar138 * 0.0 * fVar142;
          auVar63._16_4_ = fVar201;
          fVar236 = fVar141 * 0.0 * fVar145;
          auVar63._20_4_ = fVar236;
          fVar299 = fVar144 * 0.0 * fVar147;
          auVar63._24_4_ = fVar299;
          auVar63._28_4_ = fVar149;
          auVar161 = vsubps_avx(local_600,auVar61);
          auVar327._0_4_ = fVar261 + auVar128._0_4_;
          auVar327._4_4_ = fVar185 + auVar128._4_4_;
          auVar327._8_4_ = fVar234 + auVar128._8_4_;
          auVar327._12_4_ = fVar271 + auVar128._12_4_;
          auVar327._16_4_ = fVar201 + auVar128._16_4_;
          auVar327._20_4_ = fVar236 + auVar128._20_4_;
          auVar327._24_4_ = fVar299 + auVar128._24_4_;
          auVar327._28_4_ = fVar149 + auVar128._28_4_;
          fVar261 = auVar182._0_4_ * fVar205 * fVar225;
          fVar225 = auVar182._4_4_ * fVar270 * fVar269;
          auVar64._4_4_ = fVar225;
          auVar64._0_4_ = fVar261;
          fVar185 = auVar182._8_4_ * fVar206 * fVar199;
          auVar64._8_4_ = fVar185;
          fVar269 = auVar182._12_4_ * fVar274 * fVar235;
          auVar64._12_4_ = fVar269;
          fVar234 = auVar182._16_4_ * fVar207 * fVar273;
          auVar64._16_4_ = fVar234;
          fVar199 = auVar182._20_4_ * fVar276 * fVar203;
          auVar64._20_4_ = fVar199;
          fVar271 = auVar182._24_4_ * fVar208 * fVar298;
          auVar64._24_4_ = fVar271;
          auVar64._28_4_ = local_600._28_4_;
          auVar266 = vsubps_avx(auVar158,auVar62);
          auVar313._0_4_ = (float)local_700._0_4_ + fVar261;
          auVar313._4_4_ = local_700._4_4_ + fVar225;
          auVar313._8_4_ = local_700._8_4_ + fVar185;
          auVar313._12_4_ = local_700._12_4_ + fVar269;
          auVar313._16_4_ = local_700._16_4_ + fVar234;
          auVar313._20_4_ = local_700._20_4_ + fVar199;
          auVar313._24_4_ = local_700._24_4_ + fVar271;
          auVar313._28_4_ = local_700._28_4_ + local_600._28_4_;
          fVar261 = fVar205 * -fVar262 * auVar182._0_4_;
          fVar225 = fVar270 * -fVar257 * auVar182._4_4_;
          auVar65._4_4_ = fVar225;
          auVar65._0_4_ = fVar261;
          fVar185 = fVar206 * -fVar272 * auVar182._8_4_;
          auVar65._8_4_ = fVar185;
          fVar269 = fVar274 * -fVar258 * auVar182._12_4_;
          auVar65._12_4_ = fVar269;
          fVar234 = fVar207 * -fVar275 * auVar182._16_4_;
          auVar65._16_4_ = fVar234;
          fVar199 = fVar276 * -fVar259 * auVar182._20_4_;
          auVar65._20_4_ = fVar199;
          fVar271 = fVar208 * -fVar277 * auVar182._24_4_;
          auVar65._24_4_ = fVar271;
          auVar65._28_4_ = fVar116;
          auVar295 = vsubps_avx(auVar128,auVar63);
          auVar219._0_4_ = auVar232._0_4_ + fVar261;
          auVar219._4_4_ = auVar232._4_4_ + fVar225;
          auVar219._8_4_ = auVar232._8_4_ + fVar185;
          auVar219._12_4_ = auVar232._12_4_ + fVar269;
          auVar219._16_4_ = auVar232._16_4_ + fVar234;
          auVar219._20_4_ = auVar232._20_4_ + fVar199;
          auVar219._24_4_ = auVar232._24_4_ + fVar271;
          auVar219._28_4_ = auVar232._28_4_ + fVar116;
          fVar261 = fVar205 * 0.0 * auVar182._0_4_;
          fVar225 = fVar270 * 0.0 * auVar182._4_4_;
          auVar66._4_4_ = fVar225;
          auVar66._0_4_ = fVar261;
          fVar185 = fVar206 * 0.0 * auVar182._8_4_;
          auVar66._8_4_ = fVar185;
          fVar269 = fVar274 * 0.0 * auVar182._12_4_;
          auVar66._12_4_ = fVar269;
          fVar234 = fVar207 * 0.0 * auVar182._16_4_;
          auVar66._16_4_ = fVar234;
          fVar199 = fVar276 * 0.0 * auVar182._20_4_;
          auVar66._20_4_ = fVar199;
          fVar271 = fVar208 * 0.0 * auVar182._24_4_;
          auVar66._24_4_ = fVar271;
          auVar66._28_4_ = auVar128._28_4_;
          auVar18 = vsubps_avx(local_700,auVar64);
          auVar284._0_4_ = (float)local_660._0_4_ + fVar261;
          auVar284._4_4_ = (float)local_660._4_4_ + fVar225;
          auVar284._8_4_ = fStack_658 + fVar185;
          auVar284._12_4_ = fStack_654 + fVar269;
          auVar284._16_4_ = fStack_650 + fVar234;
          auVar284._20_4_ = fStack_64c + fVar199;
          auVar284._24_4_ = fStack_648 + fVar271;
          auVar284._28_4_ = fStack_644 + auVar128._28_4_;
          auVar16 = vsubps_avx(auVar232,auVar65);
          auVar17 = vsubps_avx(_local_660,auVar66);
          auVar23 = vsubps_avx(auVar219,auVar266);
          auVar14 = vsubps_avx(auVar284,auVar295);
          auVar67._4_4_ = auVar295._4_4_ * auVar23._4_4_;
          auVar67._0_4_ = auVar295._0_4_ * auVar23._0_4_;
          auVar67._8_4_ = auVar295._8_4_ * auVar23._8_4_;
          auVar67._12_4_ = auVar295._12_4_ * auVar23._12_4_;
          auVar67._16_4_ = auVar295._16_4_ * auVar23._16_4_;
          auVar67._20_4_ = auVar295._20_4_ * auVar23._20_4_;
          auVar67._24_4_ = auVar295._24_4_ * auVar23._24_4_;
          auVar67._28_4_ = auVar304._28_4_;
          auVar68._4_4_ = auVar266._4_4_ * auVar14._4_4_;
          auVar68._0_4_ = auVar266._0_4_ * auVar14._0_4_;
          auVar68._8_4_ = auVar266._8_4_ * auVar14._8_4_;
          auVar68._12_4_ = auVar266._12_4_ * auVar14._12_4_;
          auVar68._16_4_ = auVar266._16_4_ * auVar14._16_4_;
          auVar68._20_4_ = auVar266._20_4_ * auVar14._20_4_;
          auVar68._24_4_ = auVar266._24_4_ * auVar14._24_4_;
          auVar68._28_4_ = fStack_644;
          auVar21 = vsubps_avx(auVar68,auVar67);
          auVar69._4_4_ = auVar161._4_4_ * auVar14._4_4_;
          auVar69._0_4_ = auVar161._0_4_ * auVar14._0_4_;
          auVar69._8_4_ = auVar161._8_4_ * auVar14._8_4_;
          auVar69._12_4_ = auVar161._12_4_ * auVar14._12_4_;
          auVar69._16_4_ = auVar161._16_4_ * auVar14._16_4_;
          auVar69._20_4_ = auVar161._20_4_ * auVar14._20_4_;
          auVar69._24_4_ = auVar161._24_4_ * auVar14._24_4_;
          auVar69._28_4_ = auVar14._28_4_;
          auVar14 = vsubps_avx(auVar313,auVar161);
          auVar70._4_4_ = auVar295._4_4_ * auVar14._4_4_;
          auVar70._0_4_ = auVar295._0_4_ * auVar14._0_4_;
          auVar70._8_4_ = auVar295._8_4_ * auVar14._8_4_;
          auVar70._12_4_ = auVar295._12_4_ * auVar14._12_4_;
          auVar70._16_4_ = auVar295._16_4_ * auVar14._16_4_;
          auVar70._20_4_ = auVar295._20_4_ * auVar14._20_4_;
          auVar70._24_4_ = auVar295._24_4_ * auVar14._24_4_;
          auVar70._28_4_ = auVar282._28_4_;
          auVar193 = vsubps_avx(auVar70,auVar69);
          auVar71._4_4_ = auVar266._4_4_ * auVar14._4_4_;
          auVar71._0_4_ = auVar266._0_4_ * auVar14._0_4_;
          auVar71._8_4_ = auVar266._8_4_ * auVar14._8_4_;
          auVar71._12_4_ = auVar266._12_4_ * auVar14._12_4_;
          auVar71._16_4_ = auVar266._16_4_ * auVar14._16_4_;
          auVar71._20_4_ = auVar266._20_4_ * auVar14._20_4_;
          auVar71._24_4_ = auVar266._24_4_ * auVar14._24_4_;
          auVar71._28_4_ = auVar282._28_4_;
          auVar72._4_4_ = auVar161._4_4_ * auVar23._4_4_;
          auVar72._0_4_ = auVar161._0_4_ * auVar23._0_4_;
          auVar72._8_4_ = auVar161._8_4_ * auVar23._8_4_;
          auVar72._12_4_ = auVar161._12_4_ * auVar23._12_4_;
          auVar72._16_4_ = auVar161._16_4_ * auVar23._16_4_;
          auVar72._20_4_ = auVar161._20_4_ * auVar23._20_4_;
          auVar72._24_4_ = auVar161._24_4_ * auVar23._24_4_;
          auVar72._28_4_ = auVar23._28_4_;
          auVar282 = vsubps_avx(auVar72,auVar71);
          auVar159._0_4_ = auVar21._0_4_ * 0.0 + auVar282._0_4_ + auVar193._0_4_ * 0.0;
          auVar159._4_4_ = auVar21._4_4_ * 0.0 + auVar282._4_4_ + auVar193._4_4_ * 0.0;
          auVar159._8_4_ = auVar21._8_4_ * 0.0 + auVar282._8_4_ + auVar193._8_4_ * 0.0;
          auVar159._12_4_ = auVar21._12_4_ * 0.0 + auVar282._12_4_ + auVar193._12_4_ * 0.0;
          auVar159._16_4_ = auVar21._16_4_ * 0.0 + auVar282._16_4_ + auVar193._16_4_ * 0.0;
          auVar159._20_4_ = auVar21._20_4_ * 0.0 + auVar282._20_4_ + auVar193._20_4_ * 0.0;
          auVar159._24_4_ = auVar21._24_4_ * 0.0 + auVar282._24_4_ + auVar193._24_4_ * 0.0;
          auVar159._28_4_ = auVar21._28_4_ + auVar282._28_4_ + auVar193._28_4_;
          auVar228 = vcmpps_avx(auVar159,ZEXT832(0) << 0x20,2);
          auVar282 = vblendvps_avx(auVar18,_local_840,auVar228);
          auVar198 = ZEXT3264(auVar282);
          auVar18 = vblendvps_avx(auVar16,_local_780,auVar228);
          auVar16 = vblendvps_avx(auVar17,auVar327,auVar228);
          auVar17 = vblendvps_avx(auVar161,auVar313,auVar228);
          auVar23 = vblendvps_avx(auVar266,auVar219,auVar228);
          auVar14 = vblendvps_avx(auVar295,auVar284,auVar228);
          auVar21 = vblendvps_avx(auVar313,auVar161,auVar228);
          auVar193 = vblendvps_avx(auVar219,auVar266,auVar228);
          auVar194 = vblendvps_avx(auVar284,auVar295,auVar228);
          auVar161 = vandps_avx(_local_5a0,_local_580);
          auVar21 = vsubps_avx(auVar21,auVar282);
          auVar296 = vsubps_avx(auVar193,auVar18);
          auVar194 = vsubps_avx(auVar194,auVar16);
          auVar301 = vsubps_avx(auVar18,auVar23);
          auVar268 = ZEXT3264(auVar301);
          fVar261 = auVar296._0_4_;
          fVar224 = auVar16._0_4_;
          fVar235 = auVar296._4_4_;
          fVar237 = auVar16._4_4_;
          auVar73._4_4_ = fVar237 * fVar235;
          auVar73._0_4_ = fVar224 * fVar261;
          fVar262 = auVar296._8_4_;
          fVar245 = auVar16._8_4_;
          auVar73._8_4_ = fVar245 * fVar262;
          fVar274 = auVar296._12_4_;
          fVar246 = auVar16._12_4_;
          auVar73._12_4_ = fVar246 * fVar274;
          fVar170 = auVar296._16_4_;
          fVar247 = auVar16._16_4_;
          auVar73._16_4_ = fVar247 * fVar170;
          fVar131 = auVar296._20_4_;
          fVar249 = auVar16._20_4_;
          auVar73._20_4_ = fVar249 * fVar131;
          fVar149 = auVar296._24_4_;
          fVar256 = auVar16._24_4_;
          auVar73._24_4_ = fVar256 * fVar149;
          auVar73._28_4_ = auVar193._28_4_;
          fVar225 = auVar18._0_4_;
          fVar169 = auVar194._0_4_;
          fVar201 = auVar18._4_4_;
          fVar248 = auVar194._4_4_;
          auVar74._4_4_ = fVar248 * fVar201;
          auVar74._0_4_ = fVar169 * fVar225;
          fVar205 = auVar18._8_4_;
          fVar278 = auVar194._8_4_;
          auVar74._8_4_ = fVar278 * fVar205;
          fVar275 = auVar18._12_4_;
          fVar286 = auVar194._12_4_;
          auVar74._12_4_ = fVar286 * fVar275;
          fVar290 = auVar18._16_4_;
          fVar287 = auVar194._16_4_;
          auVar74._16_4_ = fVar287 * fVar290;
          fVar134 = auVar18._20_4_;
          fVar288 = auVar194._20_4_;
          auVar74._20_4_ = fVar288 * fVar134;
          fVar260 = auVar18._24_4_;
          fVar289 = auVar194._24_4_;
          uVar113 = auVar266._28_4_;
          auVar74._24_4_ = fVar289 * fVar260;
          auVar74._28_4_ = uVar113;
          auVar193 = vsubps_avx(auVar74,auVar73);
          fVar185 = auVar282._0_4_;
          fVar273 = auVar282._4_4_;
          auVar75._4_4_ = fVar248 * fVar273;
          auVar75._0_4_ = fVar169 * fVar185;
          fVar257 = auVar282._8_4_;
          auVar75._8_4_ = fVar278 * fVar257;
          fVar207 = auVar282._12_4_;
          auVar75._12_4_ = fVar286 * fVar207;
          fVar132 = auVar282._16_4_;
          auVar75._16_4_ = fVar287 * fVar132;
          fVar137 = auVar282._20_4_;
          auVar75._20_4_ = fVar288 * fVar137;
          fVar164 = auVar282._24_4_;
          auVar75._24_4_ = fVar289 * fVar164;
          auVar75._28_4_ = uVar113;
          fVar269 = auVar21._0_4_;
          fVar236 = auVar21._4_4_;
          auVar76._4_4_ = fVar237 * fVar236;
          auVar76._0_4_ = fVar224 * fVar269;
          fVar270 = auVar21._8_4_;
          auVar76._8_4_ = fVar245 * fVar270;
          fVar259 = auVar21._12_4_;
          auVar76._12_4_ = fVar246 * fVar259;
          fVar135 = auVar21._16_4_;
          auVar76._16_4_ = fVar247 * fVar135;
          fVar140 = auVar21._20_4_;
          auVar76._20_4_ = fVar249 * fVar140;
          fVar165 = auVar21._24_4_;
          auVar76._24_4_ = fVar256 * fVar165;
          auVar76._28_4_ = auVar313._28_4_;
          auVar266 = vsubps_avx(auVar76,auVar75);
          auVar77._4_4_ = fVar201 * fVar236;
          auVar77._0_4_ = fVar225 * fVar269;
          auVar77._8_4_ = fVar205 * fVar270;
          auVar77._12_4_ = fVar275 * fVar259;
          auVar77._16_4_ = fVar290 * fVar135;
          auVar77._20_4_ = fVar134 * fVar140;
          auVar77._24_4_ = fVar260 * fVar165;
          auVar77._28_4_ = uVar113;
          auVar78._4_4_ = fVar273 * fVar235;
          auVar78._0_4_ = fVar185 * fVar261;
          auVar78._8_4_ = fVar257 * fVar262;
          auVar78._12_4_ = fVar207 * fVar274;
          auVar78._16_4_ = fVar132 * fVar170;
          auVar78._20_4_ = fVar137 * fVar131;
          auVar78._24_4_ = fVar164 * fVar149;
          auVar78._28_4_ = auVar295._28_4_;
          auVar295 = vsubps_avx(auVar78,auVar77);
          auVar22 = vsubps_avx(auVar16,auVar14);
          fVar199 = auVar295._28_4_ + auVar266._28_4_;
          local_700._0_4_ = auVar295._0_4_ + auVar266._0_4_ * 0.0 + auVar193._0_4_ * 0.0;
          local_700._4_4_ = auVar295._4_4_ + auVar266._4_4_ * 0.0 + auVar193._4_4_ * 0.0;
          local_700._8_4_ = auVar295._8_4_ + auVar266._8_4_ * 0.0 + auVar193._8_4_ * 0.0;
          local_700._12_4_ = auVar295._12_4_ + auVar266._12_4_ * 0.0 + auVar193._12_4_ * 0.0;
          local_700._16_4_ = auVar295._16_4_ + auVar266._16_4_ * 0.0 + auVar193._16_4_ * 0.0;
          local_700._20_4_ = auVar295._20_4_ + auVar266._20_4_ * 0.0 + auVar193._20_4_ * 0.0;
          local_700._24_4_ = auVar295._24_4_ + auVar266._24_4_ * 0.0 + auVar193._24_4_ * 0.0;
          local_700._28_4_ = fVar199 + auVar193._28_4_;
          fVar234 = auVar301._0_4_;
          fVar203 = auVar301._4_4_;
          auVar79._4_4_ = auVar14._4_4_ * fVar203;
          auVar79._0_4_ = auVar14._0_4_ * fVar234;
          fVar272 = auVar301._8_4_;
          auVar79._8_4_ = auVar14._8_4_ * fVar272;
          fVar276 = auVar301._12_4_;
          auVar79._12_4_ = auVar14._12_4_ * fVar276;
          fVar138 = auVar301._16_4_;
          auVar79._16_4_ = auVar14._16_4_ * fVar138;
          fVar143 = auVar301._20_4_;
          auVar79._20_4_ = auVar14._20_4_ * fVar143;
          fVar166 = auVar301._24_4_;
          auVar79._24_4_ = auVar14._24_4_ * fVar166;
          auVar79._28_4_ = fVar199;
          fVar199 = auVar22._0_4_;
          fVar299 = auVar22._4_4_;
          auVar80._4_4_ = auVar23._4_4_ * fVar299;
          auVar80._0_4_ = auVar23._0_4_ * fVar199;
          fVar206 = auVar22._8_4_;
          auVar80._8_4_ = auVar23._8_4_ * fVar206;
          fVar277 = auVar22._12_4_;
          auVar80._12_4_ = auVar23._12_4_ * fVar277;
          fVar141 = auVar22._16_4_;
          auVar80._16_4_ = auVar23._16_4_ * fVar141;
          fVar146 = auVar22._20_4_;
          auVar80._20_4_ = auVar23._20_4_ * fVar146;
          fVar167 = auVar22._24_4_;
          auVar80._24_4_ = auVar23._24_4_ * fVar167;
          auVar80._28_4_ = auVar295._28_4_;
          auVar266 = vsubps_avx(auVar80,auVar79);
          auVar295 = vsubps_avx(auVar282,auVar17);
          fVar271 = auVar295._0_4_;
          fVar298 = auVar295._4_4_;
          auVar81._4_4_ = auVar14._4_4_ * fVar298;
          auVar81._0_4_ = auVar14._0_4_ * fVar271;
          fVar258 = auVar295._8_4_;
          auVar81._8_4_ = auVar14._8_4_ * fVar258;
          fVar208 = auVar295._12_4_;
          auVar81._12_4_ = auVar14._12_4_ * fVar208;
          fVar144 = auVar295._16_4_;
          auVar81._16_4_ = auVar14._16_4_ * fVar144;
          fVar148 = auVar295._20_4_;
          auVar81._20_4_ = auVar14._20_4_ * fVar148;
          fVar168 = auVar295._24_4_;
          auVar81._24_4_ = auVar14._24_4_ * fVar168;
          auVar81._28_4_ = auVar14._28_4_;
          auVar82._4_4_ = fVar299 * auVar17._4_4_;
          auVar82._0_4_ = fVar199 * auVar17._0_4_;
          auVar82._8_4_ = fVar206 * auVar17._8_4_;
          auVar82._12_4_ = fVar277 * auVar17._12_4_;
          auVar82._16_4_ = fVar141 * auVar17._16_4_;
          auVar82._20_4_ = fVar146 * auVar17._20_4_;
          auVar82._24_4_ = fVar167 * auVar17._24_4_;
          auVar82._28_4_ = auVar193._28_4_;
          auVar14 = vsubps_avx(auVar81,auVar82);
          auVar83._4_4_ = auVar23._4_4_ * fVar298;
          auVar83._0_4_ = auVar23._0_4_ * fVar271;
          auVar83._8_4_ = auVar23._8_4_ * fVar258;
          auVar83._12_4_ = auVar23._12_4_ * fVar208;
          auVar83._16_4_ = auVar23._16_4_ * fVar144;
          auVar83._20_4_ = auVar23._20_4_ * fVar148;
          auVar83._24_4_ = auVar23._24_4_ * fVar168;
          auVar83._28_4_ = auVar23._28_4_;
          auVar84._4_4_ = fVar203 * auVar17._4_4_;
          auVar84._0_4_ = fVar234 * auVar17._0_4_;
          auVar84._8_4_ = fVar272 * auVar17._8_4_;
          auVar84._12_4_ = fVar276 * auVar17._12_4_;
          auVar84._16_4_ = fVar138 * auVar17._16_4_;
          auVar84._20_4_ = fVar143 * auVar17._20_4_;
          auVar84._24_4_ = fVar166 * auVar17._24_4_;
          auVar84._28_4_ = auVar17._28_4_;
          auVar17 = vsubps_avx(auVar84,auVar83);
          auVar129._0_4_ = auVar266._0_4_ * 0.0 + auVar17._0_4_ + auVar14._0_4_ * 0.0;
          auVar129._4_4_ = auVar266._4_4_ * 0.0 + auVar17._4_4_ + auVar14._4_4_ * 0.0;
          auVar129._8_4_ = auVar266._8_4_ * 0.0 + auVar17._8_4_ + auVar14._8_4_ * 0.0;
          auVar129._12_4_ = auVar266._12_4_ * 0.0 + auVar17._12_4_ + auVar14._12_4_ * 0.0;
          auVar129._16_4_ = auVar266._16_4_ * 0.0 + auVar17._16_4_ + auVar14._16_4_ * 0.0;
          auVar129._20_4_ = auVar266._20_4_ * 0.0 + auVar17._20_4_ + auVar14._20_4_ * 0.0;
          auVar129._24_4_ = auVar266._24_4_ * 0.0 + auVar17._24_4_ + auVar14._24_4_ * 0.0;
          auVar129._28_4_ = auVar14._28_4_ + auVar17._28_4_ + auVar14._28_4_;
          auVar17 = vmaxps_avx(local_700,auVar129);
          auVar17 = vcmpps_avx(auVar17,ZEXT432(0) << 0x20,2);
          auVar23 = auVar161 & auVar17;
          if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar23 >> 0x7f,0) == '\0') &&
                (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar23 >> 0xbf,0) == '\0') &&
              (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar23[0x1f]) {
LAB_0079b328:
            auVar163 = ZEXT3264(CONCAT824(uStack_5a8,
                                          CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
            auVar306._4_4_ = fVar133;
            auVar306._0_4_ = fVar117;
            auVar306._8_4_ = fVar136;
            auVar306._12_4_ = fVar139;
            auVar306._16_4_ = fVar142;
            auVar306._20_4_ = fVar145;
            auVar306._24_4_ = fVar147;
            auVar306._28_4_ = fVar116;
          }
          else {
            auVar23 = vandps_avx(auVar17,auVar161);
            auVar85._4_4_ = fVar299 * fVar235;
            auVar85._0_4_ = fVar199 * fVar261;
            auVar85._8_4_ = fVar206 * fVar262;
            auVar85._12_4_ = fVar277 * fVar274;
            auVar85._16_4_ = fVar141 * fVar170;
            auVar85._20_4_ = fVar146 * fVar131;
            auVar85._24_4_ = fVar167 * fVar149;
            auVar85._28_4_ = auVar161._28_4_;
            auVar86._4_4_ = fVar203 * fVar248;
            auVar86._0_4_ = fVar234 * fVar169;
            auVar86._8_4_ = fVar272 * fVar278;
            auVar86._12_4_ = fVar276 * fVar286;
            auVar86._16_4_ = fVar138 * fVar287;
            auVar86._20_4_ = fVar143 * fVar288;
            auVar86._24_4_ = fVar166 * fVar289;
            auVar86._28_4_ = auVar17._28_4_;
            auVar17 = vsubps_avx(auVar86,auVar85);
            auVar87._4_4_ = fVar298 * fVar248;
            auVar87._0_4_ = fVar271 * fVar169;
            auVar87._8_4_ = fVar258 * fVar278;
            auVar87._12_4_ = fVar208 * fVar286;
            auVar87._16_4_ = fVar144 * fVar287;
            auVar87._20_4_ = fVar148 * fVar288;
            auVar87._24_4_ = fVar168 * fVar289;
            auVar87._28_4_ = auVar194._28_4_;
            auVar88._4_4_ = fVar299 * fVar236;
            auVar88._0_4_ = fVar199 * fVar269;
            auVar88._8_4_ = fVar206 * fVar270;
            auVar88._12_4_ = fVar277 * fVar259;
            auVar88._16_4_ = fVar141 * fVar135;
            auVar88._20_4_ = fVar146 * fVar140;
            auVar88._24_4_ = fVar167 * fVar165;
            auVar88._28_4_ = auVar22._28_4_;
            auVar14 = vsubps_avx(auVar88,auVar87);
            auVar89._4_4_ = fVar203 * fVar236;
            auVar89._0_4_ = fVar234 * fVar269;
            auVar89._8_4_ = fVar272 * fVar270;
            auVar89._12_4_ = fVar276 * fVar259;
            auVar89._16_4_ = fVar138 * fVar135;
            auVar89._20_4_ = fVar143 * fVar140;
            auVar89._24_4_ = fVar166 * fVar165;
            auVar89._28_4_ = auVar21._28_4_;
            auVar90._4_4_ = fVar298 * fVar235;
            auVar90._0_4_ = fVar271 * fVar261;
            auVar90._8_4_ = fVar258 * fVar262;
            auVar90._12_4_ = fVar208 * fVar274;
            auVar90._16_4_ = fVar144 * fVar170;
            auVar90._20_4_ = fVar148 * fVar131;
            auVar90._24_4_ = fVar168 * fVar149;
            auVar90._28_4_ = auVar296._28_4_;
            auVar193 = vsubps_avx(auVar90,auVar89);
            auVar268 = ZEXT3264(auVar193);
            auVar160._0_4_ = auVar17._0_4_ * 0.0 + auVar193._0_4_ + auVar14._0_4_ * 0.0;
            auVar160._4_4_ = auVar17._4_4_ * 0.0 + auVar193._4_4_ + auVar14._4_4_ * 0.0;
            auVar160._8_4_ = auVar17._8_4_ * 0.0 + auVar193._8_4_ + auVar14._8_4_ * 0.0;
            auVar160._12_4_ = auVar17._12_4_ * 0.0 + auVar193._12_4_ + auVar14._12_4_ * 0.0;
            auVar160._16_4_ = auVar17._16_4_ * 0.0 + auVar193._16_4_ + auVar14._16_4_ * 0.0;
            auVar160._20_4_ = auVar17._20_4_ * 0.0 + auVar193._20_4_ + auVar14._20_4_ * 0.0;
            auVar160._24_4_ = auVar17._24_4_ * 0.0 + auVar193._24_4_ + auVar14._24_4_ * 0.0;
            auVar160._28_4_ = auVar296._28_4_ + auVar193._28_4_ + auVar21._28_4_;
            auVar161 = vrcpps_avx(auVar160);
            fVar261 = auVar161._0_4_;
            fVar269 = auVar161._4_4_;
            auVar91._4_4_ = auVar160._4_4_ * fVar269;
            auVar91._0_4_ = auVar160._0_4_ * fVar261;
            fVar234 = auVar161._8_4_;
            auVar91._8_4_ = auVar160._8_4_ * fVar234;
            fVar199 = auVar161._12_4_;
            auVar91._12_4_ = auVar160._12_4_ * fVar199;
            fVar271 = auVar161._16_4_;
            auVar91._16_4_ = auVar160._16_4_ * fVar271;
            fVar235 = auVar161._20_4_;
            auVar91._20_4_ = auVar160._20_4_ * fVar235;
            fVar236 = auVar161._24_4_;
            auVar91._24_4_ = auVar160._24_4_ * fVar236;
            auVar91._28_4_ = auVar22._28_4_;
            auVar305._8_4_ = 0x3f800000;
            auVar305._0_8_ = 0x3f8000003f800000;
            auVar305._12_4_ = 0x3f800000;
            auVar305._16_4_ = 0x3f800000;
            auVar305._20_4_ = 0x3f800000;
            auVar305._24_4_ = 0x3f800000;
            auVar305._28_4_ = 0x3f800000;
            auVar161 = vsubps_avx(auVar305,auVar91);
            fVar261 = auVar161._0_4_ * fVar261 + fVar261;
            fVar269 = auVar161._4_4_ * fVar269 + fVar269;
            fVar234 = auVar161._8_4_ * fVar234 + fVar234;
            fVar199 = auVar161._12_4_ * fVar199 + fVar199;
            fVar271 = auVar161._16_4_ * fVar271 + fVar271;
            fVar235 = auVar161._20_4_ * fVar235 + fVar235;
            fVar236 = auVar161._24_4_ * fVar236 + fVar236;
            auVar92._4_4_ =
                 (fVar273 * auVar17._4_4_ + auVar14._4_4_ * fVar201 + auVar193._4_4_ * fVar237) *
                 fVar269;
            auVar92._0_4_ =
                 (fVar185 * auVar17._0_4_ + auVar14._0_4_ * fVar225 + auVar193._0_4_ * fVar224) *
                 fVar261;
            auVar92._8_4_ =
                 (fVar257 * auVar17._8_4_ + auVar14._8_4_ * fVar205 + auVar193._8_4_ * fVar245) *
                 fVar234;
            auVar92._12_4_ =
                 (fVar207 * auVar17._12_4_ + auVar14._12_4_ * fVar275 + auVar193._12_4_ * fVar246) *
                 fVar199;
            auVar92._16_4_ =
                 (fVar132 * auVar17._16_4_ + auVar14._16_4_ * fVar290 + auVar193._16_4_ * fVar247) *
                 fVar271;
            auVar92._20_4_ =
                 (fVar137 * auVar17._20_4_ + auVar14._20_4_ * fVar134 + auVar193._20_4_ * fVar249) *
                 fVar235;
            auVar92._24_4_ =
                 (fVar164 * auVar17._24_4_ + auVar14._24_4_ * fVar260 + auVar193._24_4_ * fVar256) *
                 fVar236;
            auVar92._28_4_ = auVar282._28_4_ + auVar18._28_4_ + auVar16._28_4_;
            auVar198 = ZEXT3264(auVar92);
            uVar113 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar220._4_4_ = uVar113;
            auVar220._0_4_ = uVar113;
            auVar220._8_4_ = uVar113;
            auVar220._12_4_ = uVar113;
            auVar220._16_4_ = uVar113;
            auVar220._20_4_ = uVar113;
            auVar220._24_4_ = uVar113;
            auVar220._28_4_ = uVar113;
            auVar161 = vcmpps_avx(local_100,auVar92,2);
            auVar282 = vcmpps_avx(auVar92,auVar220,2);
            auVar161 = vandps_avx(auVar161,auVar282);
            auVar18 = auVar23 & auVar161;
            if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar18 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar18 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar18 >> 0x7f,0) == '\0') &&
                  (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar18 >> 0xbf,0) == '\0') &&
                (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar18[0x1f]) goto LAB_0079b328;
            auVar161 = vandps_avx(auVar23,auVar161);
            auVar18 = vcmpps_avx(ZEXT432(0) << 0x20,auVar160,4);
            auVar16 = auVar161 & auVar18;
            auVar163 = ZEXT3264(CONCAT824(uStack_5a8,
                                          CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
            auVar306._4_4_ = fVar133;
            auVar306._0_4_ = fVar117;
            auVar306._8_4_ = fVar136;
            auVar306._12_4_ = fVar139;
            auVar306._16_4_ = fVar142;
            auVar306._20_4_ = fVar145;
            auVar306._24_4_ = fVar147;
            auVar306._28_4_ = fVar116;
            if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar16 >> 0x7f,0) != '\0') ||
                  (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar16 >> 0xbf,0) != '\0') ||
                (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar16[0x1f] < '\0') {
              auVar161 = vandps_avx(auVar18,auVar161);
              auVar163 = ZEXT3264(auVar161);
              auVar93._4_4_ = fVar269 * local_700._4_4_;
              auVar93._0_4_ = fVar261 * (float)local_700._0_4_;
              auVar93._8_4_ = fVar234 * local_700._8_4_;
              auVar93._12_4_ = fVar199 * local_700._12_4_;
              auVar93._16_4_ = fVar271 * local_700._16_4_;
              auVar93._20_4_ = fVar235 * local_700._20_4_;
              auVar93._24_4_ = fVar236 * local_700._24_4_;
              auVar93._28_4_ = auVar282._28_4_;
              auVar94._4_4_ = auVar129._4_4_ * fVar269;
              auVar94._0_4_ = auVar129._0_4_ * fVar261;
              auVar94._8_4_ = auVar129._8_4_ * fVar234;
              auVar94._12_4_ = auVar129._12_4_ * fVar199;
              auVar94._16_4_ = auVar129._16_4_ * fVar271;
              auVar94._20_4_ = auVar129._20_4_ * fVar235;
              auVar94._24_4_ = auVar129._24_4_ * fVar236;
              auVar94._28_4_ = auVar129._28_4_;
              auVar244._8_4_ = 0x3f800000;
              auVar244._0_8_ = 0x3f8000003f800000;
              auVar244._12_4_ = 0x3f800000;
              auVar244._16_4_ = 0x3f800000;
              auVar244._20_4_ = 0x3f800000;
              auVar244._24_4_ = 0x3f800000;
              auVar244._28_4_ = 0x3f800000;
              auVar161 = vsubps_avx(auVar244,auVar93);
              local_2e0 = vblendvps_avx(auVar161,auVar93,auVar228);
              auVar161 = vsubps_avx(auVar244,auVar94);
              _local_500 = vblendvps_avx(auVar161,auVar94,auVar228);
              local_300 = auVar92;
            }
          }
          auVar328 = ZEXT3264(auVar215);
          auVar161 = auVar163._0_32_;
          auVar314 = ZEXT3264(_local_7a0);
          if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar161 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar161 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar161 >> 0x7f,0) == '\0') &&
                (auVar163 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar161 >> 0xbf,0) == '\0') &&
              (auVar163 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar163[0x1f]) {
            auVar255 = ZEXT3264(_local_6e0);
          }
          else {
            auVar282 = vsubps_avx(auVar182,auVar306);
            auVar198 = ZEXT3264(local_2e0);
            fVar225 = auVar306._0_4_ + auVar282._0_4_ * local_2e0._0_4_;
            fVar185 = auVar306._4_4_ + auVar282._4_4_ * local_2e0._4_4_;
            fVar269 = auVar306._8_4_ + auVar282._8_4_ * local_2e0._8_4_;
            fVar234 = auVar306._12_4_ + auVar282._12_4_ * local_2e0._12_4_;
            fVar199 = auVar306._16_4_ + auVar282._16_4_ * local_2e0._16_4_;
            fVar271 = auVar306._20_4_ + auVar282._20_4_ * local_2e0._20_4_;
            fVar235 = auVar306._24_4_ + auVar282._24_4_ * local_2e0._24_4_;
            fVar201 = auVar306._28_4_ + auVar282._28_4_;
            fVar261 = *(float *)((long)local_738->ray_space + k * 4 + -0x20);
            auVar95._4_4_ = (fVar185 + fVar185) * fVar261;
            auVar95._0_4_ = (fVar225 + fVar225) * fVar261;
            auVar95._8_4_ = (fVar269 + fVar269) * fVar261;
            auVar95._12_4_ = (fVar234 + fVar234) * fVar261;
            auVar95._16_4_ = (fVar199 + fVar199) * fVar261;
            auVar95._20_4_ = (fVar271 + fVar271) * fVar261;
            auVar95._24_4_ = (fVar235 + fVar235) * fVar261;
            auVar95._28_4_ = fVar201 + fVar201;
            auVar282 = vcmpps_avx(local_300,auVar95,6);
            auVar18 = auVar161 & auVar282;
            auVar255 = ZEXT3264(_local_6e0);
            if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar18 >> 0x7f,0) != '\0') ||
                  (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar18 >> 0xbf,0) != '\0') ||
                (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar18[0x1f] < '\0') {
              local_380 = vandps_avx(auVar282,auVar161);
              auVar153._0_8_ =
                   CONCAT44((float)local_500._4_4_ + (float)local_500._4_4_ + -1.0,
                            (float)local_500._0_4_ + (float)local_500._0_4_ + -1.0);
              auVar153._8_4_ = (float)uStack_4f8 + (float)uStack_4f8 + -1.0;
              auVar153._12_4_ = uStack_4f8._4_4_ + uStack_4f8._4_4_ + -1.0;
              auVar154._16_4_ = (float)uStack_4f0 + (float)uStack_4f0 + -1.0;
              auVar154._0_16_ = auVar153;
              auVar154._20_4_ = uStack_4f0._4_4_ + uStack_4f0._4_4_ + -1.0;
              fStack_408 = (float)uStack_4e8 + (float)uStack_4e8 + -1.0;
              _local_420 = auVar154;
              fStack_404 = uStack_4e8._4_4_ + uStack_4e8._4_4_ + -1.0;
              auVar163 = ZEXT3264(_local_420);
              local_440 = local_2e0;
              local_400 = local_300;
              local_3d0 = local_930;
              fStack_3cc = fStack_92c;
              fStack_3c8 = fStack_928;
              fStack_3c4 = fStack_924;
              local_3c0 = local_760;
              uStack_3b8 = uStack_758;
              local_3b0 = local_690;
              uStack_3a8 = uStack_688;
              local_3a0 = local_6a0;
              uStack_398 = uStack_698;
              pGVar12 = (context->scene->geometries).items[uVar110].ptr;
              _local_500 = _local_420;
              if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                pRVar107 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar107 = context->args;
                if ((pRVar107->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar107 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar107 >> 8),1),
                   pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar176._0_4_ = (float)(int)local_3e0;
                  auVar176._4_12_ = auVar268._4_12_;
                  auVar191 = vshufps_avx(auVar176,auVar176,0);
                  local_360[0] = (auVar191._0_4_ + local_2e0._0_4_ + 0.0) * (float)local_140._0_4_;
                  local_360[1] = (auVar191._4_4_ + local_2e0._4_4_ + 1.0) * (float)local_140._4_4_;
                  local_360[2] = (auVar191._8_4_ + local_2e0._8_4_ + 2.0) * fStack_138;
                  local_360[3] = (auVar191._12_4_ + local_2e0._12_4_ + 3.0) * fStack_134;
                  fStack_350 = (auVar191._0_4_ + local_2e0._16_4_ + 4.0) * fStack_130;
                  fStack_34c = (auVar191._4_4_ + local_2e0._20_4_ + 5.0) * fStack_12c;
                  fStack_348 = (auVar191._8_4_ + local_2e0._24_4_ + 6.0) * fStack_128;
                  fStack_344 = auVar191._12_4_ + (float)local_2e0._28_4_ + 7.0;
                  uStack_4f8 = auVar153._8_8_;
                  uStack_4f0 = auVar154._16_8_;
                  uStack_4e8 = local_420._24_8_;
                  local_340 = auVar153._0_8_;
                  uStack_338 = uStack_4f8;
                  uStack_330 = uStack_4f0;
                  uStack_328 = uStack_4e8;
                  auVar163 = ZEXT3264(local_300);
                  local_320 = local_300;
                  uVar113 = vmovmskps_avx(local_380);
                  uVar108 = CONCAT44((int)((ulong)pRVar107 >> 0x20),uVar113);
                  uVar111 = 0;
                  if (uVar108 != 0) {
                    for (; (uVar108 >> uVar111 & 1) == 0; uVar111 = uVar111 + 1) {
                    }
                  }
                  auVar161 = vcmpps_avx(_local_6e0,_local_6e0,0xf);
                  local_3dc = uVar11;
                  while (uVar108 != 0) {
                    local_700._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                    local_200 = local_360[uVar111];
                    local_1e0 = *(undefined4 *)((long)&local_340 + uVar111 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar111 * 4);
                    fVar225 = 1.0 - local_200;
                    fVar261 = local_200 * fVar225 + local_200 * fVar225;
                    auVar191 = ZEXT416((uint)(local_200 * local_200 * 3.0));
                    auVar191 = vshufps_avx(auVar191,auVar191,0);
                    auVar174 = ZEXT416((uint)((fVar261 - local_200 * local_200) * 3.0));
                    auVar174 = vshufps_avx(auVar174,auVar174,0);
                    auVar192 = ZEXT416((uint)((fVar225 * fVar225 - fVar261) * 3.0));
                    auVar192 = vshufps_avx(auVar192,auVar192,0);
                    local_730.context = context->user;
                    auVar177 = ZEXT416((uint)(fVar225 * fVar225 * -3.0));
                    auVar177 = vshufps_avx(auVar177,auVar177,0);
                    auVar178._0_4_ =
                         local_930 * auVar177._0_4_ +
                         auVar192._0_4_ * (float)local_760._0_4_ +
                         auVar191._0_4_ * (float)local_6a0._0_4_ +
                         auVar174._0_4_ * (float)local_690._0_4_;
                    auVar178._4_4_ =
                         fStack_92c * auVar177._4_4_ +
                         auVar192._4_4_ * (float)local_760._4_4_ +
                         auVar191._4_4_ * (float)local_6a0._4_4_ +
                         auVar174._4_4_ * (float)local_690._4_4_;
                    auVar178._8_4_ =
                         fStack_928 * auVar177._8_4_ +
                         auVar192._8_4_ * (float)uStack_758 +
                         auVar191._8_4_ * (float)uStack_698 + auVar174._8_4_ * (float)uStack_688;
                    auVar178._12_4_ =
                         fStack_924 * auVar177._12_4_ +
                         auVar192._12_4_ * uStack_758._4_4_ +
                         auVar191._12_4_ * uStack_698._4_4_ + auVar174._12_4_ * uStack_688._4_4_;
                    local_250 = vshufps_avx(auVar178,auVar178,0);
                    local_260[0] = (RTCHitN)local_250[0];
                    local_260[1] = (RTCHitN)local_250[1];
                    local_260[2] = (RTCHitN)local_250[2];
                    local_260[3] = (RTCHitN)local_250[3];
                    local_260[4] = (RTCHitN)local_250[4];
                    local_260[5] = (RTCHitN)local_250[5];
                    local_260[6] = (RTCHitN)local_250[6];
                    local_260[7] = (RTCHitN)local_250[7];
                    local_260[8] = (RTCHitN)local_250[8];
                    local_260[9] = (RTCHitN)local_250[9];
                    local_260[10] = (RTCHitN)local_250[10];
                    local_260[0xb] = (RTCHitN)local_250[0xb];
                    local_260[0xc] = (RTCHitN)local_250[0xc];
                    local_260[0xd] = (RTCHitN)local_250[0xd];
                    local_260[0xe] = (RTCHitN)local_250[0xe];
                    local_260[0xf] = (RTCHitN)local_250[0xf];
                    local_230 = vshufps_avx(auVar178,auVar178,0x55);
                    local_240 = local_230;
                    local_210 = vshufps_avx(auVar178,auVar178,0xaa);
                    local_220 = local_210;
                    fStack_1fc = local_200;
                    fStack_1f8 = local_200;
                    fStack_1f4 = local_200;
                    fStack_1f0 = local_200;
                    fStack_1ec = local_200;
                    fStack_1e8 = local_200;
                    fStack_1e4 = local_200;
                    uStack_1dc = local_1e0;
                    uStack_1d8 = local_1e0;
                    uStack_1d4 = local_1e0;
                    uStack_1d0 = local_1e0;
                    uStack_1cc = local_1e0;
                    uStack_1c8 = local_1e0;
                    uStack_1c4 = local_1e0;
                    local_1c0 = local_120._0_8_;
                    uStack_1b8 = local_120._8_8_;
                    uStack_1b0 = local_120._16_8_;
                    uStack_1a8 = local_120._24_8_;
                    local_1a0 = local_560._0_8_;
                    uStack_198 = local_560._8_8_;
                    uStack_190 = local_560._16_8_;
                    uStack_188 = local_560._24_8_;
                    local_740[1] = auVar161;
                    *local_740 = auVar161;
                    local_180 = (local_730.context)->instID[0];
                    uStack_17c = local_180;
                    uStack_178 = local_180;
                    uStack_174 = local_180;
                    uStack_170 = local_180;
                    uStack_16c = local_180;
                    uStack_168 = local_180;
                    uStack_164 = local_180;
                    local_160 = (local_730.context)->instPrimID[0];
                    uStack_15c = local_160;
                    uStack_158 = local_160;
                    uStack_154 = local_160;
                    uStack_150 = local_160;
                    uStack_14c = local_160;
                    uStack_148 = local_160;
                    uStack_144 = local_160;
                    local_7e0 = *local_748;
                    local_7d0 = *local_750;
                    local_730.valid = (int *)local_7e0;
                    local_730.geometryUserPtr = pGVar12->userPtr;
                    local_730.hit = local_260;
                    local_730.N = 8;
                    local_730.ray = (RTCRayN *)ray;
                    if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar161 = ZEXT1632(auVar161._0_16_);
                      auVar268 = ZEXT1664(auVar268._0_16_);
                      (*pGVar12->occlusionFilterN)(&local_730);
                    }
                    auVar163 = ZEXT1664(local_7d0);
                    auVar191 = vpcmpeqd_avx(local_7e0,ZEXT816(0) << 0x40);
                    auVar174 = vpcmpeqd_avx(local_7d0,ZEXT816(0) << 0x40);
                    auVar198 = ZEXT1664(auVar174);
                    auVar183._16_16_ = auVar174;
                    auVar183._0_16_ = auVar191;
                    auVar161 = vcmpps_avx(auVar161,auVar161,0xf);
                    auVar282 = auVar161 & ~auVar183;
                    if ((((((((auVar282 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar282 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar282 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar282 >> 0x7f,0) == '\0') &&
                          (auVar282 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar282 >> 0xbf,0) == '\0') &&
                        (auVar282 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar282[0x1f]) {
                      auVar130._0_4_ = auVar191._0_4_ ^ auVar161._0_4_;
                      auVar130._4_4_ = auVar191._4_4_ ^ auVar161._4_4_;
                      auVar130._8_4_ = auVar191._8_4_ ^ auVar161._8_4_;
                      auVar130._12_4_ = auVar191._12_4_ ^ auVar161._12_4_;
                      auVar130._16_4_ = auVar174._0_4_ ^ auVar161._16_4_;
                      auVar130._20_4_ = auVar174._4_4_ ^ auVar161._20_4_;
                      auVar130._24_4_ = auVar174._8_4_ ^ auVar161._24_4_;
                      auVar130._28_4_ = auVar174._12_4_ ^ auVar161._28_4_;
                    }
                    else {
                      p_Var13 = context->args->filter;
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar198 = ZEXT1664(auVar174);
                        auVar161 = ZEXT1632(auVar161._0_16_);
                        auVar268 = ZEXT1664(auVar268._0_16_);
                        (*p_Var13)(&local_730);
                      }
                      auVar191 = vpcmpeqd_avx(local_7e0,ZEXT816(0) << 0x40);
                      auVar174 = vpcmpeqd_avx(local_7d0,ZEXT816(0) << 0x40);
                      auVar162._16_16_ = auVar174;
                      auVar162._0_16_ = auVar191;
                      auVar161 = vcmpps_avx(auVar161,auVar161,0xf);
                      auVar130._0_4_ = auVar191._0_4_ ^ auVar161._0_4_;
                      auVar130._4_4_ = auVar191._4_4_ ^ auVar161._4_4_;
                      auVar130._8_4_ = auVar191._8_4_ ^ auVar161._8_4_;
                      auVar130._12_4_ = auVar191._12_4_ ^ auVar161._12_4_;
                      auVar130._16_4_ = auVar174._0_4_ ^ auVar161._16_4_;
                      auVar130._20_4_ = auVar174._4_4_ ^ auVar161._20_4_;
                      auVar130._24_4_ = auVar174._8_4_ ^ auVar161._24_4_;
                      auVar130._28_4_ = auVar174._12_4_ ^ auVar161._28_4_;
                      auVar184._8_4_ = 0xff800000;
                      auVar184._0_8_ = 0xff800000ff800000;
                      auVar184._12_4_ = 0xff800000;
                      auVar184._16_4_ = 0xff800000;
                      auVar184._20_4_ = 0xff800000;
                      auVar184._24_4_ = 0xff800000;
                      auVar184._28_4_ = 0xff800000;
                      auVar282 = vblendvps_avx(auVar184,*(undefined1 (*) [32])
                                                         (local_730.ray + 0x100),auVar162);
                      auVar163 = ZEXT3264(auVar282);
                      *(undefined1 (*) [32])(local_730.ray + 0x100) = auVar282;
                    }
                    if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar130 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar130 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar130 >> 0x7f,0) != '\0') ||
                          (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar130 >> 0xbf,0) != '\0') ||
                        (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar130[0x1f] < '\0') {
                      pRVar107 = (RTCIntersectArguments *)0x1;
                      goto LAB_0079b34f;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_700._0_4_;
                    uVar108 = uVar108 ^ 1L << (uVar111 & 0x3f);
                    uVar111 = 0;
                    if (uVar108 != 0) {
                      for (; (uVar108 >> uVar111 & 1) == 0; uVar111 = uVar111 + 1) {
                      }
                    }
                  }
                  pRVar107 = (RTCIntersectArguments *)0x0;
LAB_0079b34f:
                  auVar255 = ZEXT3264(_local_6e0);
                  auVar314 = ZEXT3264(_local_7a0);
                }
              }
              pRVar106 = (RTCIntersectArguments *)(ulong)(byte)((byte)pRVar106 | (byte)pRVar107);
            }
            auVar328 = ZEXT3264(auVar215);
          }
        }
        auVar285 = ZEXT3264(auVar218);
        auVar307 = ZEXT3264(local_6c0);
      }
    }
    if (((ulong)pRVar106 & 1) != 0) break;
    uVar113 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar121._4_4_ = uVar113;
    auVar121._0_4_ = uVar113;
    auVar121._8_4_ = uVar113;
    auVar121._12_4_ = uVar113;
    auVar191 = vcmpps_avx(local_450,auVar121,2);
    uVar110 = vmovmskps_avx(auVar191);
    local_5c8 = (ulong)((uint)uVar112 & uVar110);
  }
  return local_5c8 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }